

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx::CurveNiIntersectorK<4,8>::
     occluded_t<embree::avx::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,8,8>,embree::avx::Occluded1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  undefined1 (*pauVar1) [28];
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  undefined4 uVar6;
  uint uVar7;
  undefined4 uVar8;
  Primitive PVar9;
  uint uVar10;
  Geometry *pGVar11;
  RTCFilterFunctionN p_Var12;
  long lVar13;
  long lVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined8 uVar100;
  undefined8 uVar101;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [32];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [28];
  undefined1 auVar118 [28];
  undefined1 auVar119 [28];
  undefined1 auVar120 [28];
  undefined1 auVar121 [24];
  undefined1 auVar122 [28];
  undefined4 uVar123;
  undefined4 uVar124;
  undefined4 uVar125;
  uint uVar126;
  int iVar127;
  RTCIntersectArguments *pRVar128;
  uint uVar129;
  ulong uVar130;
  bool bVar131;
  Geometry *geometry;
  long lVar132;
  ulong uVar133;
  bool bVar134;
  float fVar135;
  float fVar152;
  float fVar153;
  vint4 bi_1;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  float fVar155;
  float fVar157;
  float fVar159;
  float fVar161;
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  float fVar154;
  float fVar156;
  float fVar158;
  float fVar160;
  float fVar162;
  float fVar163;
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [64];
  float fVar164;
  float fVar176;
  float fVar177;
  vint4 bi_2;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  float fVar179;
  float fVar180;
  float fVar181;
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  float fVar178;
  float fVar182;
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  vint4 ai;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  float fVar194;
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  float fVar195;
  float fVar206;
  float fVar209;
  vint4 bi;
  undefined1 auVar197 [16];
  float fVar211;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  float fVar196;
  float fVar208;
  float fVar213;
  undefined1 auVar200 [16];
  float fVar214;
  float fVar216;
  float fVar217;
  float fVar218;
  float fVar219;
  undefined1 auVar201 [32];
  float fVar207;
  float fVar210;
  float fVar212;
  float fVar215;
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [64];
  float fVar220;
  float fVar221;
  float fVar232;
  float fVar234;
  vint4 ai_2;
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  float fVar236;
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  float fVar233;
  float fVar235;
  float fVar237;
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  float fVar238;
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [64];
  float fVar239;
  float fVar249;
  float fVar250;
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  float fVar251;
  undefined1 auVar243 [16];
  float fVar252;
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  float fVar253;
  float fVar260;
  float fVar261;
  undefined1 auVar254 [16];
  float fVar263;
  float fVar264;
  float fVar265;
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  float fVar262;
  float fVar266;
  float fVar267;
  undefined1 auVar259 [32];
  float fVar268;
  float fVar271;
  float fVar272;
  float fVar273;
  float fVar274;
  float fVar275;
  undefined1 auVar269 [32];
  float fVar276;
  undefined1 auVar270 [32];
  float fVar277;
  float fVar278;
  float fVar287;
  float fVar288;
  vint4 ai_1;
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  float fVar290;
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  float fVar289;
  undefined1 auVar286 [32];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  float fVar299;
  float fVar300;
  float fVar301;
  float fVar302;
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  float fVar307;
  float fVar310;
  float fVar311;
  float fVar312;
  float fVar313;
  float fVar314;
  float fVar315;
  float fVar316;
  undefined1 auVar308 [32];
  undefined1 auVar309 [64];
  undefined1 auVar317 [16];
  float fVar324;
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  float fVar328;
  undefined1 auVar325 [16];
  float fVar329;
  undefined1 auVar326 [32];
  undefined1 auVar327 [32];
  float fVar330;
  float fVar332;
  float fVar333;
  float fVar334;
  undefined1 auVar331 [32];
  float fVar335;
  float fVar338;
  float fVar339;
  float fVar340;
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_8> bhit;
  bool local_92d;
  float local_920;
  float fStack_91c;
  float fStack_918;
  float fStack_914;
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  uint local_8a0;
  undefined4 uStack_89c;
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined1 local_840 [8];
  undefined8 uStack_838;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  ulong local_820;
  ulong local_800;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 local_7d0;
  undefined8 uStack_7c8;
  undefined1 local_740 [8];
  undefined8 uStack_738;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [8];
  undefined8 uStack_6f8;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 *local_688;
  undefined1 (*local_680) [16];
  undefined1 (*local_678) [32];
  RTCFilterFunctionNArguments local_670;
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined4 local_620;
  undefined4 uStack_61c;
  undefined4 uStack_618;
  undefined4 uStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [16];
  LinearSpace3fa *local_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [8];
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined1 local_520 [8];
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined1 local_500 [32];
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_450 [16];
  undefined1 local_440 [32];
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [32];
  uint local_3e0;
  uint local_3dc;
  undefined1 local_3d0 [16];
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined1 local_380 [32];
  float local_360 [4];
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  RTCHitN local_240 [16];
  undefined1 local_230 [16];
  undefined1 local_220 [16];
  undefined1 local_210 [16];
  undefined1 local_200 [16];
  undefined1 local_1f0 [16];
  float local_1e0;
  float fStack_1dc;
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined4 local_1c0;
  undefined4 uStack_1bc;
  undefined4 uStack_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  uint local_160;
  uint uStack_15c;
  uint uStack_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  uint uStack_148;
  uint uStack_144;
  uint local_140;
  uint uStack_13c;
  uint uStack_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  uint uStack_128;
  uint uStack_124;
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [8];
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  
  PVar9 = prim[1];
  uVar130 = (ulong)(byte)PVar9;
  fVar195 = *(float *)(prim + uVar130 * 0x19 + 0x12);
  auVar16 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar16 = vinsertps_avx(auVar16,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar17 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar17 = vinsertps_avx(auVar17,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar16 = vsubps_avx(auVar16,*(undefined1 (*) [16])(prim + uVar130 * 0x19 + 6));
  auVar165._0_4_ = fVar195 * auVar16._0_4_;
  auVar165._4_4_ = fVar195 * auVar16._4_4_;
  auVar165._8_4_ = fVar195 * auVar16._8_4_;
  auVar165._12_4_ = fVar195 * auVar16._12_4_;
  auVar240._0_4_ = fVar195 * auVar17._0_4_;
  auVar240._4_4_ = fVar195 * auVar17._4_4_;
  auVar240._8_4_ = fVar195 * auVar17._8_4_;
  auVar240._12_4_ = fVar195 * auVar17._12_4_;
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar130 * 4 + 6)));
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar130 * 5 + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar188 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar130 * 6 + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar283 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar130 * 0xb + 6)));
  auVar188 = vcvtdq2ps_avx(auVar188);
  auVar186 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar9 * 0xc) + 6)));
  auVar283 = vcvtdq2ps_avx(auVar283);
  auVar200 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar9 * 0xc + uVar130 + 6)));
  auVar186 = vcvtdq2ps_avx(auVar186);
  auVar200 = vcvtdq2ps_avx(auVar200);
  uVar133 = (ulong)(uint)((int)(uVar130 * 9) * 2);
  auVar137 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar133 + 6)));
  auVar137 = vcvtdq2ps_avx(auVar137);
  auVar138 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar133 + uVar130 + 6)));
  auVar138 = vcvtdq2ps_avx(auVar138);
  uVar133 = (ulong)(uint)((int)(uVar130 * 5) << 2);
  auVar167 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar133 + 6)));
  auVar167 = vcvtdq2ps_avx(auVar167);
  auVar136 = vshufps_avx(auVar240,auVar240,0);
  auVar166 = vshufps_avx(auVar240,auVar240,0x55);
  auVar183 = vshufps_avx(auVar240,auVar240,0xaa);
  fVar195 = auVar183._0_4_;
  fVar220 = auVar183._4_4_;
  fVar239 = auVar183._8_4_;
  fVar206 = auVar183._12_4_;
  fVar250 = auVar166._0_4_;
  fVar211 = auVar166._4_4_;
  fVar236 = auVar166._8_4_;
  fVar251 = auVar166._12_4_;
  fVar232 = auVar136._0_4_;
  fVar249 = auVar136._4_4_;
  fVar209 = auVar136._8_4_;
  fVar234 = auVar136._12_4_;
  auVar317._0_4_ = fVar232 * auVar16._0_4_ + fVar250 * auVar17._0_4_ + fVar195 * auVar188._0_4_;
  auVar317._4_4_ = fVar249 * auVar16._4_4_ + fVar211 * auVar17._4_4_ + fVar220 * auVar188._4_4_;
  auVar317._8_4_ = fVar209 * auVar16._8_4_ + fVar236 * auVar17._8_4_ + fVar239 * auVar188._8_4_;
  auVar317._12_4_ = fVar234 * auVar16._12_4_ + fVar251 * auVar17._12_4_ + fVar206 * auVar188._12_4_;
  auVar325._0_4_ = fVar232 * auVar283._0_4_ + fVar250 * auVar186._0_4_ + auVar200._0_4_ * fVar195;
  auVar325._4_4_ = fVar249 * auVar283._4_4_ + fVar211 * auVar186._4_4_ + auVar200._4_4_ * fVar220;
  auVar325._8_4_ = fVar209 * auVar283._8_4_ + fVar236 * auVar186._8_4_ + auVar200._8_4_ * fVar239;
  auVar325._12_4_ =
       fVar234 * auVar283._12_4_ + fVar251 * auVar186._12_4_ + auVar200._12_4_ * fVar206;
  auVar241._0_4_ = fVar232 * auVar137._0_4_ + fVar250 * auVar138._0_4_ + auVar167._0_4_ * fVar195;
  auVar241._4_4_ = fVar249 * auVar137._4_4_ + fVar211 * auVar138._4_4_ + auVar167._4_4_ * fVar220;
  auVar241._8_4_ = fVar209 * auVar137._8_4_ + fVar236 * auVar138._8_4_ + auVar167._8_4_ * fVar239;
  auVar241._12_4_ =
       fVar234 * auVar137._12_4_ + fVar251 * auVar138._12_4_ + auVar167._12_4_ * fVar206;
  auVar136 = vshufps_avx(auVar165,auVar165,0);
  auVar166 = vshufps_avx(auVar165,auVar165,0x55);
  auVar183 = vshufps_avx(auVar165,auVar165,0xaa);
  fVar195 = auVar183._0_4_;
  fVar220 = auVar183._4_4_;
  fVar239 = auVar183._8_4_;
  fVar206 = auVar183._12_4_;
  fVar250 = auVar166._0_4_;
  fVar211 = auVar166._4_4_;
  fVar236 = auVar166._8_4_;
  fVar251 = auVar166._12_4_;
  fVar232 = auVar136._0_4_;
  fVar249 = auVar136._4_4_;
  fVar209 = auVar136._8_4_;
  fVar234 = auVar136._12_4_;
  auVar254._0_4_ = fVar232 * auVar16._0_4_ + fVar250 * auVar17._0_4_ + fVar195 * auVar188._0_4_;
  auVar254._4_4_ = fVar249 * auVar16._4_4_ + fVar211 * auVar17._4_4_ + fVar220 * auVar188._4_4_;
  auVar254._8_4_ = fVar209 * auVar16._8_4_ + fVar236 * auVar17._8_4_ + fVar239 * auVar188._8_4_;
  auVar254._12_4_ = fVar234 * auVar16._12_4_ + fVar251 * auVar17._12_4_ + fVar206 * auVar188._12_4_;
  auVar136._0_4_ = fVar232 * auVar283._0_4_ + auVar200._0_4_ * fVar195 + fVar250 * auVar186._0_4_;
  auVar136._4_4_ = fVar249 * auVar283._4_4_ + auVar200._4_4_ * fVar220 + fVar211 * auVar186._4_4_;
  auVar136._8_4_ = fVar209 * auVar283._8_4_ + auVar200._8_4_ * fVar239 + fVar236 * auVar186._8_4_;
  auVar136._12_4_ =
       fVar234 * auVar283._12_4_ + auVar200._12_4_ * fVar206 + fVar251 * auVar186._12_4_;
  auVar279._8_4_ = 0x7fffffff;
  auVar279._0_8_ = 0x7fffffff7fffffff;
  auVar279._12_4_ = 0x7fffffff;
  auVar16 = vandps_avx(auVar317,auVar279);
  auVar222._8_4_ = 0x219392ef;
  auVar222._0_8_ = 0x219392ef219392ef;
  auVar222._12_4_ = 0x219392ef;
  auVar16 = vcmpps_avx(auVar16,auVar222,1);
  auVar17 = vblendvps_avx(auVar317,auVar222,auVar16);
  auVar16 = vandps_avx(auVar325,auVar279);
  auVar16 = vcmpps_avx(auVar16,auVar222,1);
  auVar188 = vblendvps_avx(auVar325,auVar222,auVar16);
  auVar16 = vandps_avx(auVar279,auVar241);
  auVar16 = vcmpps_avx(auVar16,auVar222,1);
  auVar16 = vblendvps_avx(auVar241,auVar222,auVar16);
  auVar166._0_4_ = fVar232 * auVar137._0_4_ + fVar250 * auVar138._0_4_ + auVar167._0_4_ * fVar195;
  auVar166._4_4_ = fVar249 * auVar137._4_4_ + fVar211 * auVar138._4_4_ + auVar167._4_4_ * fVar220;
  auVar166._8_4_ = fVar209 * auVar137._8_4_ + fVar236 * auVar138._8_4_ + auVar167._8_4_ * fVar239;
  auVar166._12_4_ =
       fVar234 * auVar137._12_4_ + fVar251 * auVar138._12_4_ + auVar167._12_4_ * fVar206;
  auVar283 = vrcpps_avx(auVar17);
  fVar195 = auVar283._0_4_;
  auVar197._0_4_ = fVar195 * auVar17._0_4_;
  fVar206 = auVar283._4_4_;
  auVar197._4_4_ = fVar206 * auVar17._4_4_;
  fVar209 = auVar283._8_4_;
  auVar197._8_4_ = fVar209 * auVar17._8_4_;
  fVar211 = auVar283._12_4_;
  auVar197._12_4_ = fVar211 * auVar17._12_4_;
  auVar280._8_4_ = 0x3f800000;
  auVar280._0_8_ = &DAT_3f8000003f800000;
  auVar280._12_4_ = 0x3f800000;
  auVar17 = vsubps_avx(auVar280,auVar197);
  fVar195 = fVar195 + fVar195 * auVar17._0_4_;
  fVar206 = fVar206 + fVar206 * auVar17._4_4_;
  fVar209 = fVar209 + fVar209 * auVar17._8_4_;
  fVar211 = fVar211 + fVar211 * auVar17._12_4_;
  auVar17 = vrcpps_avx(auVar188);
  fVar220 = auVar17._0_4_;
  auVar223._0_4_ = fVar220 * auVar188._0_4_;
  fVar232 = auVar17._4_4_;
  auVar223._4_4_ = fVar232 * auVar188._4_4_;
  fVar234 = auVar17._8_4_;
  auVar223._8_4_ = fVar234 * auVar188._8_4_;
  fVar236 = auVar17._12_4_;
  auVar223._12_4_ = fVar236 * auVar188._12_4_;
  auVar17 = vsubps_avx(auVar280,auVar223);
  fVar220 = fVar220 + fVar220 * auVar17._0_4_;
  fVar232 = fVar232 + fVar232 * auVar17._4_4_;
  fVar234 = fVar234 + fVar234 * auVar17._8_4_;
  fVar236 = fVar236 + fVar236 * auVar17._12_4_;
  auVar17 = vrcpps_avx(auVar16);
  fVar239 = auVar17._0_4_;
  auVar242._0_4_ = fVar239 * auVar16._0_4_;
  fVar249 = auVar17._4_4_;
  auVar242._4_4_ = fVar249 * auVar16._4_4_;
  fVar250 = auVar17._8_4_;
  auVar242._8_4_ = fVar250 * auVar16._8_4_;
  fVar251 = auVar17._12_4_;
  auVar242._12_4_ = fVar251 * auVar16._12_4_;
  auVar17 = vsubps_avx(auVar280,auVar242);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar130 * 7 + 6);
  auVar16 = vpmovsxwd_avx(auVar16);
  fVar239 = fVar239 + fVar239 * auVar17._0_4_;
  fVar249 = fVar249 + fVar249 * auVar17._4_4_;
  fVar250 = fVar250 + fVar250 * auVar17._8_4_;
  fVar251 = fVar251 + fVar251 * auVar17._12_4_;
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar254);
  auVar183._0_4_ = fVar195 * auVar16._0_4_;
  auVar183._4_4_ = fVar206 * auVar16._4_4_;
  auVar183._8_4_ = fVar209 * auVar16._8_4_;
  auVar183._12_4_ = fVar211 * auVar16._12_4_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar130 * 9 + 6);
  auVar16 = vpmovsxwd_avx(auVar17);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar254);
  auVar198._0_4_ = fVar195 * auVar16._0_4_;
  auVar198._4_4_ = fVar206 * auVar16._4_4_;
  auVar198._8_4_ = fVar209 * auVar16._8_4_;
  auVar198._12_4_ = fVar211 * auVar16._12_4_;
  auVar188._8_8_ = 0;
  auVar188._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar9 * 0x10 + 6);
  auVar17 = vpmovsxwd_avx(auVar188);
  auVar283._8_8_ = 0;
  auVar283._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar9 * 0x10 + uVar130 * -2 + 6);
  auVar16 = vpmovsxwd_avx(auVar283);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar136);
  auVar281._0_4_ = auVar16._0_4_ * fVar220;
  auVar281._4_4_ = auVar16._4_4_ * fVar232;
  auVar281._8_4_ = auVar16._8_4_ * fVar234;
  auVar281._12_4_ = auVar16._12_4_ * fVar236;
  auVar16 = vcvtdq2ps_avx(auVar17);
  auVar16 = vsubps_avx(auVar16,auVar136);
  auVar137._0_4_ = fVar220 * auVar16._0_4_;
  auVar137._4_4_ = fVar232 * auVar16._4_4_;
  auVar137._8_4_ = fVar234 * auVar16._8_4_;
  auVar137._12_4_ = fVar236 * auVar16._12_4_;
  auVar186._8_8_ = 0;
  auVar186._0_8_ = *(ulong *)(prim + uVar133 + uVar130 + 6);
  auVar16 = vpmovsxwd_avx(auVar186);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar166);
  auVar224._0_4_ = auVar16._0_4_ * fVar239;
  auVar224._4_4_ = auVar16._4_4_ * fVar249;
  auVar224._8_4_ = auVar16._8_4_ * fVar250;
  auVar224._12_4_ = auVar16._12_4_ * fVar251;
  auVar200._8_8_ = 0;
  auVar200._0_8_ = *(ulong *)(prim + uVar130 * 0x17 + 6);
  auVar16 = vpmovsxwd_avx(auVar200);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar166);
  auVar167._0_4_ = auVar16._0_4_ * fVar239;
  auVar167._4_4_ = auVar16._4_4_ * fVar249;
  auVar167._8_4_ = auVar16._8_4_ * fVar250;
  auVar167._12_4_ = auVar16._12_4_ * fVar251;
  auVar16 = vpminsd_avx(auVar183,auVar198);
  auVar17 = vpminsd_avx(auVar281,auVar137);
  auVar16 = vmaxps_avx(auVar16,auVar17);
  auVar17 = vpminsd_avx(auVar224,auVar167);
  uVar6 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar291._4_4_ = uVar6;
  auVar291._0_4_ = uVar6;
  auVar291._8_4_ = uVar6;
  auVar291._12_4_ = uVar6;
  auVar17 = vmaxps_avx(auVar17,auVar291);
  auVar16 = vmaxps_avx(auVar16,auVar17);
  local_450._0_4_ = auVar16._0_4_ * 0.99999964;
  local_450._4_4_ = auVar16._4_4_ * 0.99999964;
  local_450._8_4_ = auVar16._8_4_ * 0.99999964;
  local_450._12_4_ = auVar16._12_4_ * 0.99999964;
  auVar16 = vpmaxsd_avx(auVar183,auVar198);
  auVar17 = vpmaxsd_avx(auVar281,auVar137);
  auVar16 = vminps_avx(auVar16,auVar17);
  auVar17 = vpmaxsd_avx(auVar224,auVar167);
  uVar6 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar184._4_4_ = uVar6;
  auVar184._0_4_ = uVar6;
  auVar184._8_4_ = uVar6;
  auVar184._12_4_ = uVar6;
  auVar17 = vminps_avx(auVar17,auVar184);
  auVar16 = vminps_avx(auVar16,auVar17);
  auVar138._0_4_ = auVar16._0_4_ * 1.0000004;
  auVar138._4_4_ = auVar16._4_4_ * 1.0000004;
  auVar138._8_4_ = auVar16._8_4_ * 1.0000004;
  auVar138._12_4_ = auVar16._12_4_ * 1.0000004;
  auVar16 = vpshufd_avx(ZEXT116((byte)PVar9),0);
  auVar17 = vpcmpgtd_avx(auVar16,_DAT_01ff0cf0);
  auVar16 = vcmpps_avx(local_450,auVar138,2);
  auVar16 = vandps_avx(auVar16,auVar17);
  uVar126 = vmovmskps_avx(auVar16);
  local_92d = uVar126 != 0;
  if (local_92d) {
    uVar126 = uVar126 & 0xff;
    local_5e8 = pre->ray_space + k;
    local_5e0 = mm_lookupmask_ps._16_8_;
    uStack_5d8 = mm_lookupmask_ps._24_8_;
    uStack_5d0 = mm_lookupmask_ps._16_8_;
    uStack_5c8 = mm_lookupmask_ps._24_8_;
    uVar129 = 1 << ((byte)k & 0x1f);
    local_678 = (undefined1 (*) [32])&local_160;
    local_680 = (undefined1 (*) [16])(mm_lookupmask_ps + ((uVar129 & 0xf) << 4));
    local_688 = (undefined8 *)(mm_lookupmask_ps + (long)((int)uVar129 >> 4) * 0x10);
    do {
      uVar133 = (ulong)uVar126;
      lVar13 = 0;
      if (uVar133 != 0) {
        for (; (uVar126 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
        }
      }
      uVar133 = uVar133 - 1 & uVar133;
      uVar126 = *(uint *)(prim + 2);
      uVar129 = *(uint *)(prim + lVar13 * 4 + 6);
      pGVar11 = (context->scene->geometries).items[uVar126].ptr;
      local_5a0._0_8_ = CONCAT44(0,uVar129);
      uVar130 = (ulong)*(uint *)(*(long *)&pGVar11->field_0x58 +
                                pGVar11[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i * CONCAT44(0,uVar129));
      p_Var12 = pGVar11[1].intersectionFilterN;
      lVar13 = *(long *)&pGVar11[1].time_range.upper;
      auVar16 = *(undefined1 (*) [16])(lVar13 + (long)p_Var12 * uVar130);
      auVar17 = *(undefined1 (*) [16])(lVar13 + (uVar130 + 1) * (long)p_Var12);
      auVar188 = *(undefined1 (*) [16])(lVar13 + (uVar130 + 2) * (long)p_Var12);
      lVar132 = 0;
      if (uVar133 != 0) {
        for (; (uVar133 >> lVar132 & 1) == 0; lVar132 = lVar132 + 1) {
        }
      }
      local_600 = *(undefined1 (*) [16])(lVar13 + (uVar130 + 3) * (long)p_Var12);
      if (((uVar133 != 0) && (uVar130 = uVar133 - 1 & uVar133, uVar130 != 0)) &&
         (lVar13 = 0, uVar130 != 0)) {
        for (; (uVar130 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
        }
      }
      uVar10 = (uint)pGVar11[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar283 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c);
      auVar137 = vinsertps_avx(auVar283,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar200 = vsubps_avx(auVar16,auVar137);
      auVar283 = vshufps_avx(auVar200,auVar200,0);
      auVar186 = vshufps_avx(auVar200,auVar200,0x55);
      auVar200 = vshufps_avx(auVar200,auVar200,0xaa);
      fVar195 = (local_5e8->vx).field_0.m128[0];
      fVar220 = (local_5e8->vx).field_0.m128[1];
      fVar239 = (local_5e8->vx).field_0.m128[2];
      fVar206 = (local_5e8->vx).field_0.m128[3];
      fVar232 = (local_5e8->vy).field_0.m128[0];
      fVar249 = (local_5e8->vy).field_0.m128[1];
      fVar209 = (local_5e8->vy).field_0.m128[2];
      fVar234 = (local_5e8->vy).field_0.m128[3];
      fVar250 = (local_5e8->vz).field_0.m128[0];
      fVar211 = (local_5e8->vz).field_0.m128[1];
      fVar236 = (local_5e8->vz).field_0.m128[2];
      fVar251 = (local_5e8->vz).field_0.m128[3];
      auVar168._0_8_ =
           CONCAT44(auVar283._4_4_ * fVar220 + auVar186._4_4_ * fVar249 + fVar211 * auVar200._4_4_,
                    auVar283._0_4_ * fVar195 + auVar186._0_4_ * fVar232 + fVar250 * auVar200._0_4_);
      auVar168._8_4_ =
           auVar283._8_4_ * fVar239 + auVar186._8_4_ * fVar209 + fVar236 * auVar200._8_4_;
      auVar168._12_4_ =
           auVar283._12_4_ * fVar206 + auVar186._12_4_ * fVar234 + fVar251 * auVar200._12_4_;
      auVar283 = vblendps_avx(auVar168,auVar16,8);
      auVar138 = vsubps_avx(auVar17,auVar137);
      auVar186 = vshufps_avx(auVar138,auVar138,0);
      auVar200 = vshufps_avx(auVar138,auVar138,0x55);
      auVar138 = vshufps_avx(auVar138,auVar138,0xaa);
      auVar243._0_4_ =
           auVar186._0_4_ * fVar195 + auVar200._0_4_ * fVar232 + fVar250 * auVar138._0_4_;
      auVar243._4_4_ =
           auVar186._4_4_ * fVar220 + auVar200._4_4_ * fVar249 + fVar211 * auVar138._4_4_;
      auVar243._8_4_ =
           auVar186._8_4_ * fVar239 + auVar200._8_4_ * fVar209 + fVar236 * auVar138._8_4_;
      auVar243._12_4_ =
           auVar186._12_4_ * fVar206 + auVar200._12_4_ * fVar234 + fVar251 * auVar138._12_4_;
      auVar186 = vblendps_avx(auVar243,auVar17,8);
      auVar167 = vsubps_avx(auVar188,auVar137);
      auVar200 = vshufps_avx(auVar167,auVar167,0);
      auVar138 = vshufps_avx(auVar167,auVar167,0x55);
      auVar167 = vshufps_avx(auVar167,auVar167,0xaa);
      auVar282._0_4_ =
           auVar200._0_4_ * fVar195 + auVar138._0_4_ * fVar232 + fVar250 * auVar167._0_4_;
      auVar282._4_4_ =
           auVar200._4_4_ * fVar220 + auVar138._4_4_ * fVar249 + fVar211 * auVar167._4_4_;
      auVar282._8_4_ =
           auVar200._8_4_ * fVar239 + auVar138._8_4_ * fVar209 + fVar236 * auVar167._8_4_;
      auVar282._12_4_ =
           auVar200._12_4_ * fVar206 + auVar138._12_4_ * fVar234 + fVar251 * auVar167._12_4_;
      auVar167 = vshufps_avx(auVar188,auVar188,0xff);
      auVar200 = vblendps_avx(auVar282,auVar188,8);
      auVar136 = vsubps_avx(local_600,auVar137);
      auVar137 = vshufps_avx(auVar136,auVar136,0);
      auVar138 = vshufps_avx(auVar136,auVar136,0x55);
      auVar136 = vshufps_avx(auVar136,auVar136,0xaa);
      auVar292._0_4_ =
           auVar137._0_4_ * fVar195 + auVar138._0_4_ * fVar232 + fVar250 * auVar136._0_4_;
      auVar292._4_4_ =
           auVar137._4_4_ * fVar220 + auVar138._4_4_ * fVar249 + fVar211 * auVar136._4_4_;
      auVar292._8_4_ =
           auVar137._8_4_ * fVar239 + auVar138._8_4_ * fVar209 + fVar236 * auVar136._8_4_;
      auVar292._12_4_ =
           auVar137._12_4_ * fVar206 + auVar138._12_4_ * fVar234 + fVar251 * auVar136._12_4_;
      auVar136 = vshufps_avx(local_600,local_600,0xff);
      auVar137 = vblendps_avx(auVar292,local_600,8);
      auVar225._8_4_ = 0x7fffffff;
      auVar225._0_8_ = 0x7fffffff7fffffff;
      auVar225._12_4_ = 0x7fffffff;
      auVar283 = vandps_avx(auVar283,auVar225);
      auVar186 = vandps_avx(auVar186,auVar225);
      auVar138 = vmaxps_avx(auVar283,auVar186);
      auVar283 = vandps_avx(auVar200,auVar225);
      auVar186 = vandps_avx(auVar137,auVar225);
      auVar283 = vmaxps_avx(auVar283,auVar186);
      auVar283 = vmaxps_avx(auVar138,auVar283);
      auVar186 = vmovshdup_avx(auVar283);
      auVar186 = vmaxss_avx(auVar186,auVar283);
      auVar283 = vshufpd_avx(auVar283,auVar283,1);
      auVar283 = vmaxss_avx(auVar283,auVar186);
      lVar13 = (long)(int)uVar10 * 0x44;
      fVar195 = *(float *)*(undefined1 (*) [28])(catmullrom_basis0 + lVar13 + 0x908);
      fVar220 = *(float *)(catmullrom_basis0 + lVar13 + 0x90c);
      fVar239 = *(float *)(catmullrom_basis0 + lVar13 + 0x910);
      fVar206 = *(float *)(catmullrom_basis0 + lVar13 + 0x914);
      fVar232 = *(float *)(catmullrom_basis0 + lVar13 + 0x918);
      fVar249 = *(float *)(catmullrom_basis0 + lVar13 + 0x91c);
      fVar209 = *(float *)(catmullrom_basis0 + lVar13 + 0x920);
      auVar118 = *(undefined1 (*) [28])(catmullrom_basis0 + lVar13 + 0x908);
      auVar186 = vshufps_avx(auVar282,auVar282,0);
      auVar303._16_16_ = auVar186;
      auVar303._0_16_ = auVar186;
      auVar200 = vshufps_avx(auVar282,auVar282,0x55);
      register0x00001410 = auVar167;
      _local_480 = auVar167;
      fVar234 = *(float *)*(undefined1 (*) [28])(catmullrom_basis0 + lVar13 + 0xd8c);
      fVar250 = *(float *)(catmullrom_basis0 + lVar13 + 0xd90);
      fVar211 = *(float *)(catmullrom_basis0 + lVar13 + 0xd94);
      fVar236 = *(float *)(catmullrom_basis0 + lVar13 + 0xd98);
      fVar251 = *(float *)(catmullrom_basis0 + lVar13 + 0xd9c);
      fVar307 = *(float *)(catmullrom_basis0 + lVar13 + 0xda0);
      fVar208 = *(float *)(catmullrom_basis0 + lVar13 + 0xda4);
      auVar117 = *(undefined1 (*) [28])(catmullrom_basis0 + lVar13 + 0xd8c);
      auVar137 = vshufps_avx(auVar292,auVar292,0);
      register0x000014d0 = auVar137;
      _local_560 = auVar137;
      auVar138 = vshufps_avx(auVar292,auVar292,0x55);
      register0x000013d0 = auVar136;
      _local_260 = auVar136;
      fVar262 = auVar137._0_4_;
      fVar263 = auVar137._4_4_;
      fVar264 = auVar137._8_4_;
      fVar265 = auVar137._12_4_;
      fVar335 = auVar138._0_4_;
      fVar338 = auVar138._4_4_;
      fVar339 = auVar138._8_4_;
      fVar340 = auVar138._12_4_;
      fVar178 = auVar186._0_4_;
      fVar180 = auVar186._4_4_;
      fVar182 = auVar186._8_4_;
      fVar260 = auVar186._12_4_;
      fVar221 = auVar200._0_4_;
      fVar233 = auVar200._4_4_;
      fVar235 = auVar200._8_4_;
      fVar237 = auVar200._12_4_;
      fVar268 = auVar136._0_4_;
      fVar271 = auVar136._4_4_;
      fVar272 = auVar136._8_4_;
      fVar273 = auVar136._12_4_;
      fVar277 = auVar167._0_4_;
      fVar163 = auVar167._4_4_;
      fVar288 = auVar167._8_4_;
      auVar186 = vshufps_avx(auVar243,auVar243,0);
      register0x00001550 = auVar186;
      _local_2a0 = auVar186;
      fVar310 = *(float *)(catmullrom_basis0 + lVar13 + 0x484);
      fVar213 = *(float *)(catmullrom_basis0 + lVar13 + 0x488);
      fVar311 = *(float *)(catmullrom_basis0 + lVar13 + 0x48c);
      fVar217 = *(float *)(catmullrom_basis0 + lVar13 + 0x490);
      fVar312 = *(float *)(catmullrom_basis0 + lVar13 + 0x494);
      fVar252 = *(float *)(catmullrom_basis0 + lVar13 + 0x498);
      fVar313 = *(float *)(catmullrom_basis0 + lVar13 + 0x49c);
      fVar324 = *(float *)(catmullrom_basis0 + lVar13 + 0x4a0);
      fVar267 = auVar186._0_4_;
      fVar299 = auVar186._4_4_;
      fVar300 = auVar186._8_4_;
      fVar301 = auVar186._12_4_;
      auVar186 = vshufps_avx(auVar243,auVar243,0x55);
      register0x00001490 = auVar186;
      _local_80 = auVar186;
      fVar179 = auVar186._0_4_;
      fVar181 = auVar186._4_4_;
      fVar253 = auVar186._8_4_;
      fVar261 = auVar186._12_4_;
      auVar200 = vshufps_avx(auVar17,auVar17,0xff);
      register0x00001590 = auVar200;
      _local_a0 = auVar200;
      fVar302 = auVar200._0_4_;
      fVar328 = auVar200._4_4_;
      fVar329 = auVar200._8_4_;
      fVar330 = auVar200._12_4_;
      auVar102._8_4_ = auVar168._8_4_;
      auVar102._0_8_ = auVar168._0_8_;
      auVar102._12_4_ = auVar168._12_4_;
      auVar200 = vshufps_avx(auVar102,auVar102,0);
      local_4c0._16_16_ = auVar200;
      local_4c0._0_16_ = auVar200;
      fVar314 = *(float *)(catmullrom_basis0 + lVar13);
      fVar210 = *(float *)(catmullrom_basis0 + lVar13 + 4);
      fVar316 = *(float *)(catmullrom_basis0 + lVar13 + 8);
      fVar315 = *(float *)(catmullrom_basis0 + lVar13 + 0xc);
      fStack_610 = *(float *)(catmullrom_basis0 + lVar13 + 0x10);
      fStack_60c = *(float *)(catmullrom_basis0 + lVar13 + 0x14);
      fStack_608 = *(float *)(catmullrom_basis0 + lVar13 + 0x18);
      fStack_604 = *(float *)(catmullrom_basis0 + lVar13 + 0x1c);
      fVar196 = auVar200._0_4_;
      fVar207 = auVar200._4_4_;
      fVar266 = auVar200._8_4_;
      fVar238 = auVar200._12_4_;
      auVar284._0_4_ = fVar196 * fVar314 + fVar267 * fVar310 + fVar178 * fVar195 + fVar262 * fVar234
      ;
      auVar284._4_4_ = fVar207 * fVar210 + fVar299 * fVar213 + fVar180 * fVar220 + fVar263 * fVar250
      ;
      auVar284._8_4_ = fVar266 * fVar316 + fVar300 * fVar311 + fVar182 * fVar239 + fVar264 * fVar211
      ;
      auVar284._12_4_ =
           fVar238 * fVar315 + fVar301 * fVar217 + fVar260 * fVar206 + fVar265 * fVar236;
      auVar284._16_4_ =
           fVar196 * fStack_610 + fVar267 * fVar312 + fVar178 * fVar232 + fVar262 * fVar251;
      auVar284._20_4_ =
           fVar207 * fStack_60c + fVar299 * fVar252 + fVar180 * fVar249 + fVar263 * fVar307;
      auVar284._24_4_ =
           fVar266 * fStack_608 + fVar300 * fVar313 + fVar182 * fVar209 + fVar264 * fVar208;
      auVar284._28_4_ = fVar324 + 0.0;
      auVar200 = vshufps_avx(auVar102,auVar102,0x55);
      register0x00001350 = auVar200;
      _local_4e0 = auVar200;
      fVar214 = auVar200._0_4_;
      fVar216 = auVar200._4_4_;
      fVar218 = auVar200._8_4_;
      fVar276 = auVar200._12_4_;
      auVar318._0_4_ = fVar214 * fVar314 + fVar179 * fVar310 + fVar221 * fVar195 + fVar335 * fVar234
      ;
      auVar318._4_4_ = fVar216 * fVar210 + fVar181 * fVar213 + fVar233 * fVar220 + fVar338 * fVar250
      ;
      auVar318._8_4_ = fVar218 * fVar316 + fVar253 * fVar311 + fVar235 * fVar239 + fVar339 * fVar211
      ;
      auVar318._12_4_ =
           fVar276 * fVar315 + fVar261 * fVar217 + fVar237 * fVar206 + fVar340 * fVar236;
      auVar318._16_4_ =
           fVar214 * fStack_610 + fVar179 * fVar312 + fVar221 * fVar232 + fVar335 * fVar251;
      auVar318._20_4_ =
           fVar216 * fStack_60c + fVar181 * fVar252 + fVar233 * fVar249 + fVar338 * fVar307;
      auVar318._24_4_ =
           fVar218 * fStack_608 + fVar253 * fVar313 + fVar235 * fVar209 + fVar339 * fVar208;
      auVar318._28_4_ = 0;
      auVar200 = vpermilps_avx(auVar16,0xff);
      register0x00001450 = auVar200;
      _local_280 = auVar200;
      fVar164 = auVar200._0_4_;
      fVar176 = auVar200._4_4_;
      fVar177 = auVar200._8_4_;
      local_900._0_4_ =
           fVar164 * fVar314 + fVar302 * fVar310 + fVar277 * fVar195 + fVar268 * fVar234;
      local_900._4_4_ =
           fVar176 * fVar210 + fVar328 * fVar213 + fVar163 * fVar220 + fVar271 * fVar250;
      fStack_8f8 = fVar177 * fVar316 + fVar329 * fVar311 + fVar288 * fVar239 + fVar272 * fVar211;
      fStack_8f4 = auVar200._12_4_ * fVar315 +
                   fVar330 * fVar217 + auVar167._12_4_ * fVar206 + fVar273 * fVar236;
      fStack_8f0 = fVar164 * fStack_610 + fVar302 * fVar312 + fVar277 * fVar232 + fVar268 * fVar251;
      fStack_8ec = fVar176 * fStack_60c + fVar328 * fVar252 + fVar163 * fVar249 + fVar271 * fVar307;
      fStack_8e8 = fVar177 * fStack_608 + fVar329 * fVar313 + fVar288 * fVar209 + fVar272 * fVar208;
      fStack_8e4 = *(float *)(catmullrom_basis0 + lVar13 + 0x924) + 0.0 + 0.0 + 0.0;
      fVar278 = *(float *)(catmullrom_basis1 + lVar13 + 0x908);
      fVar212 = *(float *)(catmullrom_basis1 + lVar13 + 0x90c);
      fVar274 = *(float *)(catmullrom_basis1 + lVar13 + 0x910);
      fVar287 = *(float *)(catmullrom_basis1 + lVar13 + 0x914);
      fVar289 = *(float *)(catmullrom_basis1 + lVar13 + 0x918);
      fVar215 = *(float *)(catmullrom_basis1 + lVar13 + 0x91c);
      fVar275 = *(float *)(catmullrom_basis1 + lVar13 + 0x920);
      fVar195 = *(float *)*(undefined1 (*) [28])(catmullrom_basis1 + lVar13 + 0xd8c);
      fVar220 = *(float *)(catmullrom_basis1 + lVar13 + 0xd90);
      fVar239 = *(float *)(catmullrom_basis1 + lVar13 + 0xd94);
      fVar206 = *(float *)(catmullrom_basis1 + lVar13 + 0xd98);
      fVar232 = *(float *)(catmullrom_basis1 + lVar13 + 0xd9c);
      fVar249 = *(float *)(catmullrom_basis1 + lVar13 + 0xda0);
      fVar209 = *(float *)(catmullrom_basis1 + lVar13 + 0xda4);
      auVar119 = *(undefined1 (*) [28])(catmullrom_basis1 + lVar13 + 0xd8c);
      fVar290 = *(float *)(catmullrom_basis1 + lVar13 + 0x484);
      fVar135 = *(float *)(catmullrom_basis1 + lVar13 + 0x488);
      fVar152 = *(float *)(catmullrom_basis1 + lVar13 + 0x48c);
      fVar154 = *(float *)(catmullrom_basis1 + lVar13 + 0x490);
      fVar156 = *(float *)(catmullrom_basis1 + lVar13 + 0x494);
      fVar158 = *(float *)(catmullrom_basis1 + lVar13 + 0x498);
      fVar160 = *(float *)(catmullrom_basis1 + lVar13 + 0x49c);
      fVar234 = fVar301 + fVar324 + 0.0;
      fVar219 = fVar301 + fVar324 + 0.0;
      fVar161 = *(float *)(catmullrom_basis1 + lVar13);
      fVar162 = *(float *)(catmullrom_basis1 + lVar13 + 4);
      fVar194 = *(float *)(catmullrom_basis1 + lVar13 + 8);
      fVar153 = *(float *)(catmullrom_basis1 + lVar13 + 0xc);
      fVar155 = *(float *)(catmullrom_basis1 + lVar13 + 0x10);
      fVar157 = *(float *)(catmullrom_basis1 + lVar13 + 0x14);
      fVar159 = *(float *)(catmullrom_basis1 + lVar13 + 0x18);
      auVar226._0_4_ = fVar196 * fVar161 + fVar267 * fVar290 + fVar278 * fVar178 + fVar262 * fVar195
      ;
      auVar226._4_4_ = fVar207 * fVar162 + fVar299 * fVar135 + fVar212 * fVar180 + fVar263 * fVar220
      ;
      auVar226._8_4_ = fVar266 * fVar194 + fVar300 * fVar152 + fVar274 * fVar182 + fVar264 * fVar239
      ;
      auVar226._12_4_ =
           fVar238 * fVar153 + fVar301 * fVar154 + fVar287 * fVar260 + fVar265 * fVar206;
      auVar226._16_4_ =
           fVar196 * fVar155 + fVar267 * fVar156 + fVar289 * fVar178 + fVar262 * fVar232;
      auVar226._20_4_ =
           fVar207 * fVar157 + fVar299 * fVar158 + fVar215 * fVar180 + fVar263 * fVar249;
      auVar226._24_4_ =
           fVar266 * fVar159 + fVar300 * fVar160 + fVar275 * fVar182 + fVar264 * fVar209;
      auVar226._28_4_ = fVar330 + fVar234;
      auVar308._0_4_ = fVar214 * fVar161 + fVar179 * fVar290 + fVar278 * fVar221 + fVar335 * fVar195
      ;
      auVar308._4_4_ = fVar216 * fVar162 + fVar181 * fVar135 + fVar212 * fVar233 + fVar338 * fVar220
      ;
      auVar308._8_4_ = fVar218 * fVar194 + fVar253 * fVar152 + fVar274 * fVar235 + fVar339 * fVar239
      ;
      auVar308._12_4_ =
           fVar276 * fVar153 + fVar261 * fVar154 + fVar287 * fVar237 + fVar340 * fVar206;
      auVar308._16_4_ =
           fVar214 * fVar155 + fVar179 * fVar156 + fVar289 * fVar221 + fVar335 * fVar232;
      auVar308._20_4_ =
           fVar216 * fVar157 + fVar181 * fVar158 + fVar215 * fVar233 + fVar338 * fVar249;
      auVar308._24_4_ =
           fVar218 * fVar159 + fVar253 * fVar160 + fVar275 * fVar235 + fVar339 * fVar209;
      auVar308._28_4_ = fVar234 + fVar219;
      auVar293._0_4_ = fVar302 * fVar290 + fVar278 * fVar277 + fVar268 * fVar195 + fVar164 * fVar161
      ;
      auVar293._4_4_ = fVar328 * fVar135 + fVar212 * fVar163 + fVar271 * fVar220 + fVar176 * fVar162
      ;
      auVar293._8_4_ = fVar329 * fVar152 + fVar274 * fVar288 + fVar272 * fVar239 + fVar177 * fVar194
      ;
      auVar293._12_4_ =
           fVar330 * fVar154 + fVar287 * auVar167._12_4_ + fVar273 * fVar206 +
           auVar200._12_4_ * fVar153;
      auVar293._16_4_ =
           fVar302 * fVar156 + fVar289 * fVar277 + fVar268 * fVar232 + fVar164 * fVar155;
      auVar293._20_4_ =
           fVar328 * fVar158 + fVar215 * fVar163 + fVar271 * fVar249 + fVar176 * fVar157;
      auVar293._24_4_ =
           fVar329 * fVar160 + fVar275 * fVar288 + fVar272 * fVar209 + fVar177 * fVar159;
      auVar293._28_4_ = fVar301 + fVar273 + fVar324 + fVar234;
      auVar19 = vsubps_avx(auVar226,auVar284);
      auVar20 = vsubps_avx(auVar308,auVar318);
      fVar195 = auVar19._0_4_;
      fVar239 = auVar19._4_4_;
      auVar18._4_4_ = auVar318._4_4_ * fVar239;
      auVar18._0_4_ = auVar318._0_4_ * fVar195;
      fVar232 = auVar19._8_4_;
      auVar18._8_4_ = auVar318._8_4_ * fVar232;
      fVar209 = auVar19._12_4_;
      auVar18._12_4_ = auVar318._12_4_ * fVar209;
      fVar250 = auVar19._16_4_;
      auVar18._16_4_ = auVar318._16_4_ * fVar250;
      fVar236 = auVar19._20_4_;
      auVar18._20_4_ = auVar318._20_4_ * fVar236;
      fVar307 = auVar19._24_4_;
      auVar18._24_4_ = auVar318._24_4_ * fVar307;
      auVar18._28_4_ = fVar234;
      fVar220 = auVar20._0_4_;
      fVar206 = auVar20._4_4_;
      auVar21._4_4_ = auVar284._4_4_ * fVar206;
      auVar21._0_4_ = auVar284._0_4_ * fVar220;
      fVar249 = auVar20._8_4_;
      auVar21._8_4_ = auVar284._8_4_ * fVar249;
      fVar234 = auVar20._12_4_;
      auVar21._12_4_ = auVar284._12_4_ * fVar234;
      fVar211 = auVar20._16_4_;
      auVar21._16_4_ = auVar284._16_4_ * fVar211;
      fVar251 = auVar20._20_4_;
      auVar21._20_4_ = auVar284._20_4_ * fVar251;
      fVar208 = auVar20._24_4_;
      auVar21._24_4_ = auVar284._24_4_ * fVar208;
      auVar21._28_4_ = fVar219;
      auVar21 = vsubps_avx(auVar18,auVar21);
      auVar18 = vmaxps_avx(_local_900,auVar293);
      auVar26._4_4_ = auVar18._4_4_ * auVar18._4_4_ * (fVar239 * fVar239 + fVar206 * fVar206);
      auVar26._0_4_ = auVar18._0_4_ * auVar18._0_4_ * (fVar195 * fVar195 + fVar220 * fVar220);
      auVar26._8_4_ = auVar18._8_4_ * auVar18._8_4_ * (fVar232 * fVar232 + fVar249 * fVar249);
      auVar26._12_4_ = auVar18._12_4_ * auVar18._12_4_ * (fVar209 * fVar209 + fVar234 * fVar234);
      auVar26._16_4_ = auVar18._16_4_ * auVar18._16_4_ * (fVar250 * fVar250 + fVar211 * fVar211);
      auVar26._20_4_ = auVar18._20_4_ * auVar18._20_4_ * (fVar236 * fVar236 + fVar251 * fVar251);
      auVar26._24_4_ = auVar18._24_4_ * auVar18._24_4_ * (fVar307 * fVar307 + fVar208 * fVar208);
      auVar26._28_4_ = auVar19._28_4_ + fVar219;
      auVar15._4_4_ = auVar21._4_4_ * auVar21._4_4_;
      auVar15._0_4_ = auVar21._0_4_ * auVar21._0_4_;
      auVar15._8_4_ = auVar21._8_4_ * auVar21._8_4_;
      auVar15._12_4_ = auVar21._12_4_ * auVar21._12_4_;
      auVar15._16_4_ = auVar21._16_4_ * auVar21._16_4_;
      auVar15._20_4_ = auVar21._20_4_ * auVar21._20_4_;
      auVar15._24_4_ = auVar21._24_4_ * auVar21._24_4_;
      auVar15._28_4_ = auVar21._28_4_;
      auVar18 = vcmpps_avx(auVar15,auVar26,2);
      auVar199._0_4_ = (float)(int)uVar10;
      auVar199._4_12_ = auVar186._4_12_;
      local_580._0_16_ = auVar199;
      auVar186 = vshufps_avx(auVar199,auVar199,0);
      auVar201._16_16_ = auVar186;
      auVar201._0_16_ = auVar186;
      auVar21 = vcmpps_avx(_DAT_02020f40,auVar201,1);
      auVar205 = ZEXT3264(auVar21);
      auVar103._8_4_ = auVar168._8_4_;
      auVar103._0_8_ = auVar168._0_8_;
      auVar103._12_4_ = auVar168._12_4_;
      auVar186 = vpermilps_avx(auVar103,0xaa);
      auVar200 = vpermilps_avx(auVar243,0xaa);
      register0x00001550 = auVar200;
      _local_4a0 = auVar200;
      auVar137 = vpermilps_avx(auVar282,0xaa);
      register0x00001590 = auVar137;
      _local_c0 = auVar137;
      auVar138 = vpermilps_avx(auVar292,0xaa);
      auVar26 = auVar21 & auVar18;
      uVar7 = *(uint *)(ray + k * 4 + 0x60);
      auVar283 = ZEXT416((uint)(auVar283._0_4_ * 4.7683716e-07));
      local_7d0 = auVar17._0_8_;
      uStack_7c8 = auVar17._8_8_;
      local_7e0 = auVar188._0_8_;
      uStack_7d8 = auVar188._8_8_;
      local_920 = auVar16._0_4_;
      fStack_918 = auVar16._8_4_;
      fStack_914 = auVar16._12_4_;
      fStack_91c = auVar16._4_4_;
      fVar232 = auVar138._0_4_;
      fVar249 = auVar138._4_4_;
      fVar209 = auVar138._8_4_;
      fVar234 = auVar138._12_4_;
      local_700._0_4_ = auVar188._0_4_;
      uVar124 = local_700._0_4_;
      local_700._4_4_ = auVar188._4_4_;
      uVar125 = local_700._4_4_;
      uStack_6f8._0_4_ = auVar188._8_4_;
      fVar239 = (float)uStack_6f8;
      uStack_6f8._4_4_ = auVar188._12_4_;
      fVar206 = uStack_6f8._4_4_;
      local_840._0_4_ = auVar17._0_4_;
      uVar6 = local_840._0_4_;
      local_840._4_4_ = auVar17._4_4_;
      uVar123 = local_840._4_4_;
      uStack_838._0_4_ = auVar17._8_4_;
      fVar195 = (float)uStack_838;
      uStack_838._4_4_ = auVar17._12_4_;
      fVar220 = uStack_838._4_4_;
      fVar250 = auVar186._0_4_;
      fVar211 = auVar186._4_4_;
      fVar236 = auVar186._8_4_;
      fVar251 = auVar186._12_4_;
      if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar26 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar26 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar26 >> 0x7f,0) == '\0') &&
            (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar26 >> 0xbf,0) == '\0') &&
          (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar26[0x1f])
      {
        bVar131 = false;
      }
      else {
        local_500 = vandps_avx(auVar18,auVar21);
        fVar177 = auVar200._0_4_;
        fVar302 = auVar200._4_4_;
        fVar328 = auVar200._8_4_;
        fVar329 = auVar200._12_4_;
        fVar330 = auVar137._0_4_;
        fVar332 = auVar137._4_4_;
        fVar333 = auVar137._8_4_;
        fVar334 = auVar137._12_4_;
        local_5c0._0_4_ = auVar119._0_4_;
        local_5c0._4_4_ = auVar119._4_4_;
        fStack_5b8 = auVar119._8_4_;
        fStack_5b4 = auVar119._12_4_;
        fStack_5b0 = auVar119._16_4_;
        fStack_5ac = auVar119._20_4_;
        fStack_5a8 = auVar119._24_4_;
        local_5c0._0_4_ =
             fVar250 * fVar161 +
             fVar177 * fVar290 + fVar330 * fVar278 + fVar232 * (float)local_5c0._0_4_;
        local_5c0._4_4_ =
             fVar211 * fVar162 +
             fVar302 * fVar135 + fVar332 * fVar212 + fVar249 * (float)local_5c0._4_4_;
        fStack_5b8 = fVar236 * fVar194 +
                     fVar328 * fVar152 + fVar333 * fVar274 + fVar209 * fStack_5b8;
        fStack_5b4 = fVar251 * fVar153 +
                     fVar329 * fVar154 + fVar334 * fVar287 + fVar234 * fStack_5b4;
        fStack_5b0 = fVar250 * fVar155 +
                     fVar177 * fVar156 + fVar330 * fVar289 + fVar232 * fStack_5b0;
        fStack_5ac = fVar211 * fVar157 +
                     fVar302 * fVar158 + fVar332 * fVar215 + fVar249 * fStack_5ac;
        fStack_5a8 = fVar236 * fVar159 +
                     fVar328 * fVar160 + fVar333 * fVar275 + fVar209 * fStack_5a8;
        fStack_5a4 = local_500._28_4_ +
                     auVar21._28_4_ + *(float *)(catmullrom_basis1 + lVar13 + 0x924) + 0.0;
        local_840._0_4_ = auVar118._0_4_;
        local_840._4_4_ = auVar118._4_4_;
        uStack_838._0_4_ = auVar118._8_4_;
        uStack_838._4_4_ = auVar118._12_4_;
        fStack_830 = auVar118._16_4_;
        fStack_82c = auVar118._20_4_;
        fStack_828 = auVar118._24_4_;
        local_700._0_4_ = auVar117._0_4_;
        local_700._4_4_ = auVar117._4_4_;
        uStack_6f8._0_4_ = auVar117._8_4_;
        uStack_6f8._4_4_ = auVar117._12_4_;
        fStack_6f0 = auVar117._16_4_;
        fStack_6ec = auVar117._20_4_;
        fStack_6e8 = auVar117._24_4_;
        local_700._0_4_ =
             fVar250 * fVar314 +
             fVar177 * fVar310 + fVar330 * (float)local_840._0_4_ + fVar232 * (float)local_700._0_4_
        ;
        local_700._4_4_ =
             fVar211 * fVar210 +
             fVar302 * fVar213 + fVar332 * (float)local_840._4_4_ + fVar249 * (float)local_700._4_4_
        ;
        uStack_6f8._0_4_ =
             fVar236 * fVar316 +
             fVar328 * fVar311 + fVar333 * (float)uStack_838 + fVar209 * (float)uStack_6f8;
        uStack_6f8._4_4_ =
             fVar251 * fVar315 +
             fVar329 * fVar217 + fVar334 * uStack_838._4_4_ + fVar234 * uStack_6f8._4_4_;
        fStack_6f0 = fVar250 * fStack_610 +
                     fVar177 * fVar312 + fVar330 * fStack_830 + fVar232 * fStack_6f0;
        fStack_6ec = fVar211 * fStack_60c +
                     fVar302 * fVar252 + fVar332 * fStack_82c + fVar249 * fStack_6ec;
        fStack_6e8 = fVar236 * fStack_608 +
                     fVar328 * fVar313 + fVar333 * fStack_828 + fVar209 * fStack_6e8;
        fStack_6e4 = fVar276 + fStack_5a4 + local_500._28_4_ + auVar21._28_4_;
        fVar307 = *(float *)(catmullrom_basis0 + lVar13 + 0x1210);
        fVar208 = *(float *)(catmullrom_basis0 + lVar13 + 0x1214);
        fVar310 = *(float *)(catmullrom_basis0 + lVar13 + 0x1218);
        fVar213 = *(float *)(catmullrom_basis0 + lVar13 + 0x121c);
        fVar311 = *(float *)(catmullrom_basis0 + lVar13 + 0x1220);
        fVar217 = *(float *)(catmullrom_basis0 + lVar13 + 0x1224);
        fVar312 = *(float *)(catmullrom_basis0 + lVar13 + 0x1228);
        fVar252 = *(float *)(catmullrom_basis0 + lVar13 + 0x1694);
        fVar313 = *(float *)(catmullrom_basis0 + lVar13 + 0x1698);
        fVar324 = *(float *)(catmullrom_basis0 + lVar13 + 0x169c);
        fVar314 = *(float *)(catmullrom_basis0 + lVar13 + 0x16a0);
        fVar210 = *(float *)(catmullrom_basis0 + lVar13 + 0x16a4);
        fVar316 = *(float *)(catmullrom_basis0 + lVar13 + 0x16a8);
        fVar315 = *(float *)(catmullrom_basis0 + lVar13 + 0x16ac);
        fVar278 = *(float *)(catmullrom_basis0 + lVar13 + 0x1b18);
        fVar212 = *(float *)(catmullrom_basis0 + lVar13 + 0x1b1c);
        fVar274 = *(float *)(catmullrom_basis0 + lVar13 + 0x1b20);
        fVar287 = *(float *)(catmullrom_basis0 + lVar13 + 0x1b24);
        fVar289 = *(float *)(catmullrom_basis0 + lVar13 + 0x1b28);
        fVar215 = *(float *)(catmullrom_basis0 + lVar13 + 0x1b2c);
        fVar275 = *(float *)(catmullrom_basis0 + lVar13 + 0x1b30);
        fVar290 = *(float *)(catmullrom_basis0 + lVar13 + 0x1f9c);
        fVar135 = *(float *)(catmullrom_basis0 + lVar13 + 0x1fa0);
        fVar152 = *(float *)(catmullrom_basis0 + lVar13 + 0x1fa4);
        fVar154 = *(float *)(catmullrom_basis0 + lVar13 + 0x1fa8);
        fVar156 = *(float *)(catmullrom_basis0 + lVar13 + 0x1fac);
        fVar158 = *(float *)(catmullrom_basis0 + lVar13 + 0x1fb0);
        fVar160 = *(float *)(catmullrom_basis0 + lVar13 + 0x1fb4);
        fVar161 = *(float *)(catmullrom_basis0 + lVar13 + 0x1b34) +
                  *(float *)(catmullrom_basis0 + lVar13 + 0x1fb8);
        fVar176 = *(float *)(catmullrom_basis0 + lVar13 + 0x16b0) + fVar161;
        fStack_630 = fVar196 * fVar311 + fVar267 * fVar210 + fVar178 * fVar289 + fVar262 * fVar156;
        fStack_62c = fVar207 * fVar217 + fVar299 * fVar316 + fVar180 * fVar215 + fVar263 * fVar158;
        fStack_628 = fVar266 * fVar312 + fVar300 * fVar315 + fVar182 * fVar275 + fVar264 * fVar160;
        fStack_624 = *(float *)(catmullrom_basis0 + lVar13 + 0x16b0) +
                     *(float *)(catmullrom_basis0 + lVar13 + 0x1fb8) +
                     fVar251 + *(float *)(catmullrom_basis1 + lVar13 + 0x4a0);
        auVar255._0_4_ =
             fVar214 * fVar307 + fVar179 * fVar252 + fVar221 * fVar278 + fVar335 * fVar290;
        auVar255._4_4_ =
             fVar216 * fVar208 + fVar181 * fVar313 + fVar233 * fVar212 + fVar338 * fVar135;
        auVar255._8_4_ =
             fVar218 * fVar310 + fVar253 * fVar324 + fVar235 * fVar274 + fVar339 * fVar152;
        auVar255._12_4_ =
             fVar276 * fVar213 + fVar261 * fVar314 + fVar237 * fVar287 + fVar340 * fVar154;
        auVar255._16_4_ =
             fVar214 * fVar311 + fVar179 * fVar210 + fVar221 * fVar289 + fVar335 * fVar156;
        auVar255._20_4_ =
             fVar216 * fVar217 + fVar181 * fVar316 + fVar233 * fVar215 + fVar338 * fVar158;
        auVar255._24_4_ =
             fVar218 * fVar312 + fVar253 * fVar315 + fVar235 * fVar275 + fVar339 * fVar160;
        auVar255._28_4_ =
             fVar161 + fVar251 + *(float *)(catmullrom_basis1 + lVar13 + 0x4a0) +
                       fVar251 + *(float *)(catmullrom_basis1 + lVar13 + 0x1c);
        fStack_610 = fVar250 * fVar311 + fVar177 * fVar210 + fVar330 * fVar289 + fVar232 * fVar156;
        fStack_60c = fVar211 * fVar217 + fVar302 * fVar316 + fVar332 * fVar215 + fVar249 * fVar158;
        fStack_608 = fVar236 * fVar312 + fVar328 * fVar315 + fVar333 * fVar275 + fVar209 * fVar160;
        fStack_604 = *(float *)(catmullrom_basis0 + lVar13 + 0x122c) + fVar176;
        fVar311 = *(float *)(catmullrom_basis1 + lVar13 + 0x1b18);
        fVar217 = *(float *)(catmullrom_basis1 + lVar13 + 0x1b1c);
        fVar312 = *(float *)(catmullrom_basis1 + lVar13 + 0x1b20);
        fVar210 = *(float *)(catmullrom_basis1 + lVar13 + 0x1b24);
        fVar316 = *(float *)(catmullrom_basis1 + lVar13 + 0x1b28);
        fVar315 = *(float *)(catmullrom_basis1 + lVar13 + 0x1b2c);
        fVar289 = *(float *)(catmullrom_basis1 + lVar13 + 0x1b30);
        fVar215 = *(float *)(catmullrom_basis1 + lVar13 + 0x1f9c);
        fVar275 = *(float *)(catmullrom_basis1 + lVar13 + 0x1fa0);
        fVar156 = *(float *)(catmullrom_basis1 + lVar13 + 0x1fa4);
        fVar158 = *(float *)(catmullrom_basis1 + lVar13 + 0x1fa8);
        fVar160 = *(float *)(catmullrom_basis1 + lVar13 + 0x1fac);
        fVar161 = *(float *)(catmullrom_basis1 + lVar13 + 0x1fb0);
        fVar162 = *(float *)(catmullrom_basis1 + lVar13 + 0x1fb4);
        fVar194 = *(float *)(catmullrom_basis1 + lVar13 + 0x1694);
        fVar153 = *(float *)(catmullrom_basis1 + lVar13 + 0x1698);
        fVar155 = *(float *)(catmullrom_basis1 + lVar13 + 0x169c);
        fVar157 = *(float *)(catmullrom_basis1 + lVar13 + 0x16a0);
        fVar159 = *(float *)(catmullrom_basis1 + lVar13 + 0x16a4);
        fVar219 = *(float *)(catmullrom_basis1 + lVar13 + 0x16a8);
        fVar268 = *(float *)(catmullrom_basis1 + lVar13 + 0x16ac);
        fVar271 = *(float *)(catmullrom_basis1 + lVar13 + 0x1210);
        fVar272 = *(float *)(catmullrom_basis1 + lVar13 + 0x1214);
        fVar273 = *(float *)(catmullrom_basis1 + lVar13 + 0x1218);
        fVar277 = *(float *)(catmullrom_basis1 + lVar13 + 0x121c);
        fVar163 = *(float *)(catmullrom_basis1 + lVar13 + 0x1220);
        fVar288 = *(float *)(catmullrom_basis1 + lVar13 + 0x1224);
        fVar164 = *(float *)(catmullrom_basis1 + lVar13 + 0x1228);
        auVar269._0_4_ =
             fVar196 * fVar271 + fVar267 * fVar194 + fVar178 * fVar311 + fVar262 * fVar215;
        auVar269._4_4_ =
             fVar207 * fVar272 + fVar299 * fVar153 + fVar180 * fVar217 + fVar263 * fVar275;
        auVar269._8_4_ =
             fVar266 * fVar273 + fVar300 * fVar155 + fVar182 * fVar312 + fVar264 * fVar156;
        auVar269._12_4_ =
             fVar238 * fVar277 + fVar301 * fVar157 + fVar260 * fVar210 + fVar265 * fVar158;
        auVar269._16_4_ =
             fVar196 * fVar163 + fVar267 * fVar159 + fVar178 * fVar316 + fVar262 * fVar160;
        auVar269._20_4_ =
             fVar207 * fVar288 + fVar299 * fVar219 + fVar180 * fVar315 + fVar263 * fVar161;
        auVar269._24_4_ =
             fVar266 * fVar164 + fVar300 * fVar268 + fVar182 * fVar289 + fVar264 * fVar162;
        auVar269._28_4_ = fVar260 + fVar260 + fVar251 + fVar176;
        auVar294._0_4_ =
             fVar214 * fVar271 + fVar179 * fVar194 + fVar221 * fVar311 + fVar335 * fVar215;
        auVar294._4_4_ =
             fVar216 * fVar272 + fVar181 * fVar153 + fVar233 * fVar217 + fVar338 * fVar275;
        auVar294._8_4_ =
             fVar218 * fVar273 + fVar253 * fVar155 + fVar235 * fVar312 + fVar339 * fVar156;
        auVar294._12_4_ =
             fVar276 * fVar277 + fVar261 * fVar157 + fVar237 * fVar210 + fVar340 * fVar158;
        auVar294._16_4_ =
             fVar214 * fVar163 + fVar179 * fVar159 + fVar221 * fVar316 + fVar335 * fVar160;
        auVar294._20_4_ =
             fVar216 * fVar288 + fVar181 * fVar219 + fVar233 * fVar315 + fVar338 * fVar161;
        auVar294._24_4_ =
             fVar218 * fVar164 + fVar253 * fVar268 + fVar235 * fVar289 + fVar339 * fVar162;
        auVar294._28_4_ = fVar260 + fVar260 + fVar260 + fVar251;
        auVar190._0_4_ =
             fVar250 * fVar271 + fVar177 * fVar194 + fVar330 * fVar311 + fVar215 * fVar232;
        auVar190._4_4_ =
             fVar211 * fVar272 + fVar302 * fVar153 + fVar332 * fVar217 + fVar275 * fVar249;
        auVar190._8_4_ =
             fVar236 * fVar273 + fVar328 * fVar155 + fVar333 * fVar312 + fVar156 * fVar209;
        auVar190._12_4_ =
             fVar251 * fVar277 + fVar329 * fVar157 + fVar334 * fVar210 + fVar158 * fVar234;
        auVar190._16_4_ =
             fVar250 * fVar163 + fVar177 * fVar159 + fVar330 * fVar316 + fVar160 * fVar232;
        auVar190._20_4_ =
             fVar211 * fVar288 + fVar302 * fVar219 + fVar332 * fVar315 + fVar161 * fVar249;
        auVar190._24_4_ =
             fVar236 * fVar164 + fVar328 * fVar268 + fVar333 * fVar289 + fVar162 * fVar209;
        auVar190._28_4_ =
             *(float *)(catmullrom_basis1 + lVar13 + 0x122c) +
             *(float *)(catmullrom_basis1 + lVar13 + 0x16b0) +
             *(float *)(catmullrom_basis1 + lVar13 + 0x1b34) +
             *(float *)(catmullrom_basis1 + lVar13 + 0x1fb8);
        auVar227._8_4_ = 0x7fffffff;
        auVar227._0_8_ = 0x7fffffff7fffffff;
        auVar227._12_4_ = 0x7fffffff;
        auVar227._16_4_ = 0x7fffffff;
        auVar227._20_4_ = 0x7fffffff;
        auVar227._24_4_ = 0x7fffffff;
        auVar227._28_4_ = 0x7fffffff;
        auVar113._4_4_ =
             fVar207 * fVar208 + fVar299 * fVar313 + fVar180 * fVar212 + fVar263 * fVar135;
        auVar113._0_4_ =
             fVar196 * fVar307 + fVar267 * fVar252 + fVar178 * fVar278 + fVar262 * fVar290;
        auVar113._8_4_ =
             fVar266 * fVar310 + fVar300 * fVar324 + fVar182 * fVar274 + fVar264 * fVar152;
        auVar113._12_4_ =
             fVar238 * fVar213 + fVar301 * fVar314 + fVar260 * fVar287 + fVar265 * fVar154;
        auVar113._16_4_ = fStack_630;
        auVar113._20_4_ = fStack_62c;
        auVar113._24_4_ = fStack_628;
        auVar113._28_4_ = fStack_624;
        auVar18 = vandps_avx(auVar113,auVar227);
        auVar21 = vandps_avx(auVar255,auVar227);
        auVar21 = vmaxps_avx(auVar18,auVar21);
        auVar116._4_4_ =
             fVar211 * fVar208 + fVar302 * fVar313 + fVar332 * fVar212 + fVar249 * fVar135;
        auVar116._0_4_ =
             fVar250 * fVar307 + fVar177 * fVar252 + fVar330 * fVar278 + fVar232 * fVar290;
        auVar116._8_4_ =
             fVar236 * fVar310 + fVar328 * fVar324 + fVar333 * fVar274 + fVar209 * fVar152;
        auVar116._12_4_ =
             fVar251 * fVar213 + fVar329 * fVar314 + fVar334 * fVar287 + fVar234 * fVar154;
        auVar116._16_4_ = fStack_610;
        auVar116._20_4_ = fStack_60c;
        auVar116._24_4_ = fStack_608;
        auVar116._28_4_ = fStack_604;
        auVar18 = vandps_avx(auVar227,auVar116);
        auVar18 = vmaxps_avx(auVar21,auVar18);
        auVar17 = vpermilps_avx(auVar283,0);
        auVar256._16_16_ = auVar17;
        auVar256._0_16_ = auVar17;
        auVar18 = vcmpps_avx(auVar18,auVar256,1);
        auVar26 = vblendvps_avx(auVar113,auVar19,auVar18);
        auVar15 = vblendvps_avx(auVar255,auVar20,auVar18);
        auVar18 = vandps_avx(auVar269,auVar227);
        auVar21 = vandps_avx(auVar294,auVar227);
        auVar201 = vmaxps_avx(auVar18,auVar21);
        auVar18 = vandps_avx(auVar190,auVar227);
        auVar18 = vmaxps_avx(auVar201,auVar18);
        auVar201 = vcmpps_avx(auVar18,auVar256,1);
        auVar18 = vblendvps_avx(auVar269,auVar19,auVar201);
        auVar19 = vblendvps_avx(auVar294,auVar20,auVar201);
        fVar162 = auVar26._0_4_;
        fVar194 = auVar26._4_4_;
        fVar153 = auVar26._8_4_;
        fVar155 = auVar26._12_4_;
        fVar157 = auVar26._16_4_;
        fVar159 = auVar26._20_4_;
        fVar219 = auVar26._24_4_;
        fVar196 = auVar18._0_4_;
        fVar207 = auVar18._4_4_;
        fVar266 = auVar18._8_4_;
        fVar238 = auVar18._12_4_;
        fVar214 = auVar18._16_4_;
        fVar216 = auVar18._20_4_;
        fVar218 = auVar18._24_4_;
        fVar276 = -auVar18._28_4_;
        fVar307 = auVar15._0_4_;
        fVar311 = auVar15._4_4_;
        fVar313 = auVar15._8_4_;
        fVar316 = auVar15._12_4_;
        fVar274 = auVar15._16_4_;
        fVar275 = auVar15._20_4_;
        fVar154 = auVar15._24_4_;
        auVar141._0_4_ = fVar307 * fVar307 + fVar162 * fVar162;
        auVar141._4_4_ = fVar311 * fVar311 + fVar194 * fVar194;
        auVar141._8_4_ = fVar313 * fVar313 + fVar153 * fVar153;
        auVar141._12_4_ = fVar316 * fVar316 + fVar155 * fVar155;
        auVar141._16_4_ = fVar274 * fVar274 + fVar157 * fVar157;
        auVar141._20_4_ = fVar275 * fVar275 + fVar159 * fVar159;
        auVar141._24_4_ = fVar154 * fVar154 + fVar219 * fVar219;
        auVar141._28_4_ = auVar294._28_4_ + auVar26._28_4_;
        auVar20 = vrsqrtps_avx(auVar141);
        fVar208 = auVar20._0_4_;
        fVar310 = auVar20._4_4_;
        auVar22._4_4_ = fVar310 * 1.5;
        auVar22._0_4_ = fVar208 * 1.5;
        fVar213 = auVar20._8_4_;
        auVar22._8_4_ = fVar213 * 1.5;
        fVar217 = auVar20._12_4_;
        auVar22._12_4_ = fVar217 * 1.5;
        fVar312 = auVar20._16_4_;
        auVar22._16_4_ = fVar312 * 1.5;
        fVar252 = auVar20._20_4_;
        auVar22._20_4_ = fVar252 * 1.5;
        fVar324 = auVar20._24_4_;
        fVar161 = auVar21._28_4_;
        auVar22._24_4_ = fVar324 * 1.5;
        auVar22._28_4_ = fVar161;
        auVar20._4_4_ = fVar310 * fVar310 * fVar310 * auVar141._4_4_ * 0.5;
        auVar20._0_4_ = fVar208 * fVar208 * fVar208 * auVar141._0_4_ * 0.5;
        auVar20._8_4_ = fVar213 * fVar213 * fVar213 * auVar141._8_4_ * 0.5;
        auVar20._12_4_ = fVar217 * fVar217 * fVar217 * auVar141._12_4_ * 0.5;
        auVar20._16_4_ = fVar312 * fVar312 * fVar312 * auVar141._16_4_ * 0.5;
        auVar20._20_4_ = fVar252 * fVar252 * fVar252 * auVar141._20_4_ * 0.5;
        auVar20._24_4_ = fVar324 * fVar324 * fVar324 * auVar141._24_4_ * 0.5;
        auVar20._28_4_ = auVar141._28_4_;
        auVar21 = vsubps_avx(auVar22,auVar20);
        fVar208 = auVar21._0_4_;
        fVar217 = auVar21._4_4_;
        fVar324 = auVar21._8_4_;
        fVar315 = auVar21._12_4_;
        fVar287 = auVar21._16_4_;
        fVar290 = auVar21._20_4_;
        fVar156 = auVar21._24_4_;
        fVar310 = auVar19._0_4_;
        fVar312 = auVar19._4_4_;
        fVar314 = auVar19._8_4_;
        fVar278 = auVar19._12_4_;
        fVar289 = auVar19._16_4_;
        fVar135 = auVar19._20_4_;
        fVar158 = auVar19._24_4_;
        auVar142._0_4_ = fVar310 * fVar310 + fVar196 * fVar196;
        auVar142._4_4_ = fVar312 * fVar312 + fVar207 * fVar207;
        auVar142._8_4_ = fVar314 * fVar314 + fVar266 * fVar266;
        auVar142._12_4_ = fVar278 * fVar278 + fVar238 * fVar238;
        auVar142._16_4_ = fVar289 * fVar289 + fVar214 * fVar214;
        auVar142._20_4_ = fVar135 * fVar135 + fVar216 * fVar216;
        auVar142._24_4_ = fVar158 * fVar158 + fVar218 * fVar218;
        auVar142._28_4_ = auVar18._28_4_ + auVar21._28_4_;
        auVar18 = vrsqrtps_avx(auVar142);
        fVar213 = auVar18._0_4_;
        fVar252 = auVar18._4_4_;
        auVar23._4_4_ = fVar252 * 1.5;
        auVar23._0_4_ = fVar213 * 1.5;
        fVar210 = auVar18._8_4_;
        auVar23._8_4_ = fVar210 * 1.5;
        fVar212 = auVar18._12_4_;
        auVar23._12_4_ = fVar212 * 1.5;
        fVar215 = auVar18._16_4_;
        auVar23._16_4_ = fVar215 * 1.5;
        fVar152 = auVar18._20_4_;
        auVar23._20_4_ = fVar152 * 1.5;
        fVar160 = auVar18._24_4_;
        auVar23._24_4_ = fVar160 * 1.5;
        auVar23._28_4_ = fVar161;
        auVar24._4_4_ = fVar252 * fVar252 * fVar252 * auVar142._4_4_ * 0.5;
        auVar24._0_4_ = fVar213 * fVar213 * fVar213 * auVar142._0_4_ * 0.5;
        auVar24._8_4_ = fVar210 * fVar210 * fVar210 * auVar142._8_4_ * 0.5;
        auVar24._12_4_ = fVar212 * fVar212 * fVar212 * auVar142._12_4_ * 0.5;
        auVar24._16_4_ = fVar215 * fVar215 * fVar215 * auVar142._16_4_ * 0.5;
        auVar24._20_4_ = fVar152 * fVar152 * fVar152 * auVar142._20_4_ * 0.5;
        auVar24._24_4_ = fVar160 * fVar160 * fVar160 * auVar142._24_4_ * 0.5;
        auVar24._28_4_ = auVar142._28_4_;
        auVar18 = vsubps_avx(auVar23,auVar24);
        fVar213 = auVar18._0_4_;
        fVar252 = auVar18._4_4_;
        fVar210 = auVar18._8_4_;
        fVar212 = auVar18._12_4_;
        fVar215 = auVar18._16_4_;
        fVar152 = auVar18._20_4_;
        fVar160 = auVar18._24_4_;
        fVar307 = (float)local_900._0_4_ * fVar307 * fVar208;
        fVar311 = (float)local_900._4_4_ * fVar311 * fVar217;
        auVar25._4_4_ = fVar311;
        auVar25._0_4_ = fVar307;
        fVar313 = fStack_8f8 * fVar313 * fVar324;
        auVar25._8_4_ = fVar313;
        fVar316 = fStack_8f4 * fVar316 * fVar315;
        auVar25._12_4_ = fVar316;
        fVar274 = fStack_8f0 * fVar274 * fVar287;
        auVar25._16_4_ = fVar274;
        fVar275 = fStack_8ec * fVar275 * fVar290;
        auVar25._20_4_ = fVar275;
        fVar154 = fStack_8e8 * fVar154 * fVar156;
        auVar25._24_4_ = fVar154;
        auVar25._28_4_ = fVar276;
        local_720._4_4_ = auVar284._4_4_ + fVar311;
        local_720._0_4_ = auVar284._0_4_ + fVar307;
        fStack_718 = auVar284._8_4_ + fVar313;
        fStack_714 = auVar284._12_4_ + fVar316;
        fStack_710 = auVar284._16_4_ + fVar274;
        fStack_70c = auVar284._20_4_ + fVar275;
        fStack_708 = auVar284._24_4_ + fVar154;
        fStack_704 = auVar284._28_4_ + fVar276;
        fVar307 = (float)local_900._0_4_ * fVar208 * -fVar162;
        fVar311 = (float)local_900._4_4_ * fVar217 * -fVar194;
        auVar27._4_4_ = fVar311;
        auVar27._0_4_ = fVar307;
        fVar313 = fStack_8f8 * fVar324 * -fVar153;
        auVar27._8_4_ = fVar313;
        fVar316 = fStack_8f4 * fVar315 * -fVar155;
        auVar27._12_4_ = fVar316;
        fVar274 = fStack_8f0 * fVar287 * -fVar157;
        auVar27._16_4_ = fVar274;
        fVar275 = fStack_8ec * fVar290 * -fVar159;
        auVar27._20_4_ = fVar275;
        fVar154 = fStack_8e8 * fVar156 * -fVar219;
        auVar27._24_4_ = fVar154;
        auVar27._28_4_ = fVar161;
        local_740._4_4_ = fVar311 + auVar318._4_4_;
        local_740._0_4_ = fVar307 + auVar318._0_4_;
        uStack_738._0_4_ = fVar313 + auVar318._8_4_;
        uStack_738._4_4_ = fVar316 + auVar318._12_4_;
        fStack_730 = fVar274 + auVar318._16_4_;
        fStack_72c = fVar275 + auVar318._20_4_;
        fStack_728 = fVar154 + auVar318._24_4_;
        fStack_724 = fVar161 + 0.0;
        fVar307 = fVar208 * 0.0 * (float)local_900._0_4_;
        fVar208 = fVar217 * 0.0 * (float)local_900._4_4_;
        auVar28._4_4_ = fVar208;
        auVar28._0_4_ = fVar307;
        fVar311 = fVar324 * 0.0 * fStack_8f8;
        auVar28._8_4_ = fVar311;
        fVar217 = fVar315 * 0.0 * fStack_8f4;
        auVar28._12_4_ = fVar217;
        fVar313 = fVar287 * 0.0 * fStack_8f0;
        auVar28._16_4_ = fVar313;
        fVar324 = fVar290 * 0.0 * fStack_8ec;
        auVar28._20_4_ = fVar324;
        fVar316 = fVar156 * 0.0 * fStack_8e8;
        auVar28._24_4_ = fVar316;
        auVar28._28_4_ = fVar301;
        auVar257._0_4_ = fVar307 + (float)local_700._0_4_;
        auVar257._4_4_ = fVar208 + (float)local_700._4_4_;
        auVar257._8_4_ = fVar311 + (float)uStack_6f8;
        auVar257._12_4_ = fVar217 + uStack_6f8._4_4_;
        auVar257._16_4_ = fVar313 + fStack_6f0;
        auVar257._20_4_ = fVar324 + fStack_6ec;
        auVar257._24_4_ = fVar316 + fStack_6e8;
        auVar257._28_4_ = fVar301 + fStack_6e4;
        fVar307 = auVar293._0_4_ * fVar310 * fVar213;
        fVar208 = auVar293._4_4_ * fVar312 * fVar252;
        auVar29._4_4_ = fVar208;
        auVar29._0_4_ = fVar307;
        fVar310 = auVar293._8_4_ * fVar314 * fVar210;
        auVar29._8_4_ = fVar310;
        fVar311 = auVar293._12_4_ * fVar278 * fVar212;
        auVar29._12_4_ = fVar311;
        fVar217 = auVar293._16_4_ * fVar289 * fVar215;
        auVar29._16_4_ = fVar217;
        fVar312 = auVar293._20_4_ * fVar135 * fVar152;
        auVar29._20_4_ = fVar312;
        fVar313 = auVar293._24_4_ * fVar158 * fVar160;
        auVar29._24_4_ = fVar313;
        auVar29._28_4_ = auVar19._28_4_;
        auVar201 = vsubps_avx(auVar284,auVar25);
        auVar295._0_4_ = auVar226._0_4_ + fVar307;
        auVar295._4_4_ = auVar226._4_4_ + fVar208;
        auVar295._8_4_ = auVar226._8_4_ + fVar310;
        auVar295._12_4_ = auVar226._12_4_ + fVar311;
        auVar295._16_4_ = auVar226._16_4_ + fVar217;
        auVar295._20_4_ = auVar226._20_4_ + fVar312;
        auVar295._24_4_ = auVar226._24_4_ + fVar313;
        auVar295._28_4_ = auVar226._28_4_ + auVar19._28_4_;
        fVar307 = auVar293._0_4_ * fVar213 * -fVar196;
        fVar208 = auVar293._4_4_ * fVar252 * -fVar207;
        auVar19._4_4_ = fVar208;
        auVar19._0_4_ = fVar307;
        fVar310 = auVar293._8_4_ * fVar210 * -fVar266;
        auVar19._8_4_ = fVar310;
        fVar311 = auVar293._12_4_ * fVar212 * -fVar238;
        auVar19._12_4_ = fVar311;
        fVar217 = auVar293._16_4_ * fVar215 * -fVar214;
        auVar19._16_4_ = fVar217;
        fVar312 = auVar293._20_4_ * fVar152 * -fVar216;
        auVar19._20_4_ = fVar312;
        fVar313 = auVar293._24_4_ * fVar160 * -fVar218;
        auVar19._24_4_ = fVar313;
        auVar19._28_4_ = fVar329;
        auVar284 = vsubps_avx(auVar318,auVar27);
        auVar304._0_4_ = auVar308._0_4_ + fVar307;
        auVar304._4_4_ = auVar308._4_4_ + fVar208;
        auVar304._8_4_ = auVar308._8_4_ + fVar310;
        auVar304._12_4_ = auVar308._12_4_ + fVar311;
        auVar304._16_4_ = auVar308._16_4_ + fVar217;
        auVar304._20_4_ = auVar308._20_4_ + fVar312;
        auVar304._24_4_ = auVar308._24_4_ + fVar313;
        auVar304._28_4_ = auVar308._28_4_ + fVar329;
        fVar307 = auVar293._0_4_ * fVar213 * 0.0;
        fVar208 = auVar293._4_4_ * fVar252 * 0.0;
        auVar30._4_4_ = fVar208;
        auVar30._0_4_ = fVar307;
        fVar310 = auVar293._8_4_ * fVar210 * 0.0;
        auVar30._8_4_ = fVar310;
        fVar213 = auVar293._12_4_ * fVar212 * 0.0;
        auVar30._12_4_ = fVar213;
        fVar311 = auVar293._16_4_ * fVar215 * 0.0;
        auVar30._16_4_ = fVar311;
        fVar217 = auVar293._20_4_ * fVar152 * 0.0;
        auVar30._20_4_ = fVar217;
        fVar312 = auVar293._24_4_ * fVar160 * 0.0;
        auVar30._24_4_ = fVar312;
        auVar30._28_4_ = 0x3f000000;
        auVar318 = vsubps_avx(_local_700,auVar28);
        auVar331._0_4_ = fVar307 + (float)local_5c0._0_4_;
        auVar331._4_4_ = fVar208 + (float)local_5c0._4_4_;
        auVar331._8_4_ = fVar310 + fStack_5b8;
        auVar331._12_4_ = fVar213 + fStack_5b4;
        auVar331._16_4_ = fVar311 + fStack_5b0;
        auVar331._20_4_ = fVar217 + fStack_5ac;
        auVar331._24_4_ = fVar312 + fStack_5a8;
        auVar331._28_4_ = fStack_5a4 + 0.5;
        auVar18 = vsubps_avx(auVar226,auVar29);
        auVar21 = vsubps_avx(auVar308,auVar19);
        auVar22 = vsubps_avx(_local_5c0,auVar30);
        auVar19 = vsubps_avx(auVar304,auVar284);
        auVar20 = vsubps_avx(auVar331,auVar318);
        auVar31._4_4_ = auVar318._4_4_ * auVar19._4_4_;
        auVar31._0_4_ = auVar318._0_4_ * auVar19._0_4_;
        auVar31._8_4_ = auVar318._8_4_ * auVar19._8_4_;
        auVar31._12_4_ = auVar318._12_4_ * auVar19._12_4_;
        auVar31._16_4_ = auVar318._16_4_ * auVar19._16_4_;
        auVar31._20_4_ = auVar318._20_4_ * auVar19._20_4_;
        auVar31._24_4_ = auVar318._24_4_ * auVar19._24_4_;
        auVar31._28_4_ = auVar308._28_4_;
        auVar32._4_4_ = auVar284._4_4_ * auVar20._4_4_;
        auVar32._0_4_ = auVar284._0_4_ * auVar20._0_4_;
        auVar32._8_4_ = auVar284._8_4_ * auVar20._8_4_;
        auVar32._12_4_ = auVar284._12_4_ * auVar20._12_4_;
        auVar32._16_4_ = auVar284._16_4_ * auVar20._16_4_;
        auVar32._20_4_ = auVar284._20_4_ * auVar20._20_4_;
        auVar32._24_4_ = auVar284._24_4_ * auVar20._24_4_;
        auVar32._28_4_ = fStack_5a4;
        auVar26 = vsubps_avx(auVar32,auVar31);
        auVar33._4_4_ = auVar201._4_4_ * auVar20._4_4_;
        auVar33._0_4_ = auVar201._0_4_ * auVar20._0_4_;
        auVar33._8_4_ = auVar201._8_4_ * auVar20._8_4_;
        auVar33._12_4_ = auVar201._12_4_ * auVar20._12_4_;
        auVar33._16_4_ = auVar201._16_4_ * auVar20._16_4_;
        auVar33._20_4_ = auVar201._20_4_ * auVar20._20_4_;
        auVar33._24_4_ = auVar201._24_4_ * auVar20._24_4_;
        auVar33._28_4_ = auVar20._28_4_;
        auVar15 = vsubps_avx(auVar295,auVar201);
        auVar34._4_4_ = auVar318._4_4_ * auVar15._4_4_;
        auVar34._0_4_ = auVar318._0_4_ * auVar15._0_4_;
        auVar34._8_4_ = auVar318._8_4_ * auVar15._8_4_;
        auVar34._12_4_ = auVar318._12_4_ * auVar15._12_4_;
        auVar34._16_4_ = auVar318._16_4_ * auVar15._16_4_;
        auVar34._20_4_ = auVar318._20_4_ * auVar15._20_4_;
        auVar34._24_4_ = auVar318._24_4_ * auVar15._24_4_;
        auVar34._28_4_ = auVar226._28_4_;
        auVar226 = vsubps_avx(auVar34,auVar33);
        auVar35._4_4_ = auVar15._4_4_ * auVar284._4_4_;
        auVar35._0_4_ = auVar15._0_4_ * auVar284._0_4_;
        auVar35._8_4_ = auVar15._8_4_ * auVar284._8_4_;
        auVar35._12_4_ = auVar15._12_4_ * auVar284._12_4_;
        auVar35._16_4_ = auVar15._16_4_ * auVar284._16_4_;
        auVar35._20_4_ = auVar15._20_4_ * auVar284._20_4_;
        auVar35._24_4_ = auVar15._24_4_ * auVar284._24_4_;
        auVar35._28_4_ = auVar20._28_4_;
        auVar36._4_4_ = auVar201._4_4_ * auVar19._4_4_;
        auVar36._0_4_ = auVar201._0_4_ * auVar19._0_4_;
        auVar36._8_4_ = auVar201._8_4_ * auVar19._8_4_;
        auVar36._12_4_ = auVar201._12_4_ * auVar19._12_4_;
        auVar36._16_4_ = auVar201._16_4_ * auVar19._16_4_;
        auVar36._20_4_ = auVar201._20_4_ * auVar19._20_4_;
        auVar36._24_4_ = auVar201._24_4_ * auVar19._24_4_;
        auVar36._28_4_ = auVar19._28_4_;
        auVar19 = vsubps_avx(auVar36,auVar35);
        auVar143._0_4_ = auVar26._0_4_ * 0.0 + auVar19._0_4_ + auVar226._0_4_ * 0.0;
        auVar143._4_4_ = auVar26._4_4_ * 0.0 + auVar19._4_4_ + auVar226._4_4_ * 0.0;
        auVar143._8_4_ = auVar26._8_4_ * 0.0 + auVar19._8_4_ + auVar226._8_4_ * 0.0;
        auVar143._12_4_ = auVar26._12_4_ * 0.0 + auVar19._12_4_ + auVar226._12_4_ * 0.0;
        auVar143._16_4_ = auVar26._16_4_ * 0.0 + auVar19._16_4_ + auVar226._16_4_ * 0.0;
        auVar143._20_4_ = auVar26._20_4_ * 0.0 + auVar19._20_4_ + auVar226._20_4_ * 0.0;
        auVar143._24_4_ = auVar26._24_4_ * 0.0 + auVar19._24_4_ + auVar226._24_4_ * 0.0;
        auVar143._28_4_ = auVar19._28_4_ + auVar19._28_4_ + auVar226._28_4_;
        auVar308 = vcmpps_avx(auVar143,ZEXT432(0) << 0x20,2);
        auVar18 = vblendvps_avx(auVar18,_local_720,auVar308);
        auVar21 = vblendvps_avx(auVar21,_local_740,auVar308);
        auVar19 = vblendvps_avx(auVar22,auVar257,auVar308);
        auVar20 = vblendvps_avx(auVar201,auVar295,auVar308);
        auVar26 = vblendvps_avx(auVar284,auVar304,auVar308);
        auVar15 = vblendvps_avx(auVar318,auVar331,auVar308);
        auVar201 = vblendvps_avx(auVar295,auVar201,auVar308);
        auVar226 = vblendvps_avx(auVar304,auVar284,auVar308);
        auVar17 = vpackssdw_avx(local_500._0_16_,local_500._16_16_);
        auVar284 = vblendvps_avx(auVar331,auVar318,auVar308);
        auVar201 = vsubps_avx(auVar201,auVar18);
        auVar318 = vsubps_avx(auVar226,auVar21);
        auVar284 = vsubps_avx(auVar284,auVar19);
        auVar23 = vsubps_avx(auVar21,auVar26);
        fVar307 = auVar318._0_4_;
        fVar219 = auVar19._0_4_;
        fVar217 = auVar318._4_4_;
        fVar196 = auVar19._4_4_;
        auVar37._4_4_ = fVar196 * fVar217;
        auVar37._0_4_ = fVar219 * fVar307;
        fVar314 = auVar318._8_4_;
        fVar207 = auVar19._8_4_;
        auVar37._8_4_ = fVar207 * fVar314;
        fVar212 = auVar318._12_4_;
        fVar266 = auVar19._12_4_;
        auVar37._12_4_ = fVar266 * fVar212;
        fVar275 = auVar318._16_4_;
        fVar238 = auVar19._16_4_;
        auVar37._16_4_ = fVar238 * fVar275;
        fVar156 = auVar318._20_4_;
        fVar214 = auVar19._20_4_;
        auVar37._20_4_ = fVar214 * fVar156;
        fVar194 = auVar318._24_4_;
        fVar216 = auVar19._24_4_;
        auVar37._24_4_ = fVar216 * fVar194;
        auVar37._28_4_ = auVar226._28_4_;
        fVar208 = auVar21._0_4_;
        fVar163 = auVar284._0_4_;
        fVar312 = auVar21._4_4_;
        fVar288 = auVar284._4_4_;
        auVar38._4_4_ = fVar288 * fVar312;
        auVar38._0_4_ = fVar163 * fVar208;
        fVar210 = auVar21._8_4_;
        fVar164 = auVar284._8_4_;
        auVar38._8_4_ = fVar164 * fVar210;
        fVar274 = auVar21._12_4_;
        fVar176 = auVar284._12_4_;
        auVar38._12_4_ = fVar176 * fVar274;
        fVar290 = auVar21._16_4_;
        fVar177 = auVar284._16_4_;
        auVar38._16_4_ = fVar177 * fVar290;
        fVar158 = auVar21._20_4_;
        fVar178 = auVar284._20_4_;
        auVar38._20_4_ = fVar178 * fVar158;
        fVar153 = auVar21._24_4_;
        fVar179 = auVar284._24_4_;
        uVar8 = auVar22._28_4_;
        auVar38._24_4_ = fVar179 * fVar153;
        auVar38._28_4_ = uVar8;
        auVar21 = vsubps_avx(auVar38,auVar37);
        fVar310 = auVar18._0_4_;
        fVar252 = auVar18._4_4_;
        auVar39._4_4_ = fVar288 * fVar252;
        auVar39._0_4_ = fVar163 * fVar310;
        fVar316 = auVar18._8_4_;
        auVar39._8_4_ = fVar164 * fVar316;
        fVar287 = auVar18._12_4_;
        auVar39._12_4_ = fVar176 * fVar287;
        fVar135 = auVar18._16_4_;
        auVar39._16_4_ = fVar177 * fVar135;
        fVar160 = auVar18._20_4_;
        auVar39._20_4_ = fVar178 * fVar160;
        fVar155 = auVar18._24_4_;
        auVar39._24_4_ = fVar179 * fVar155;
        auVar39._28_4_ = uVar8;
        fVar213 = auVar201._0_4_;
        fVar313 = auVar201._4_4_;
        auVar40._4_4_ = fVar196 * fVar313;
        auVar40._0_4_ = fVar219 * fVar213;
        fVar315 = auVar201._8_4_;
        auVar40._8_4_ = fVar207 * fVar315;
        fVar289 = auVar201._12_4_;
        auVar40._12_4_ = fVar266 * fVar289;
        fVar152 = auVar201._16_4_;
        auVar40._16_4_ = fVar238 * fVar152;
        fVar161 = auVar201._20_4_;
        auVar40._20_4_ = fVar214 * fVar161;
        fVar157 = auVar201._24_4_;
        auVar40._24_4_ = fVar216 * fVar157;
        auVar40._28_4_ = auVar331._28_4_;
        auVar226 = vsubps_avx(auVar40,auVar39);
        auVar41._4_4_ = fVar312 * fVar313;
        auVar41._0_4_ = fVar208 * fVar213;
        auVar41._8_4_ = fVar210 * fVar315;
        auVar41._12_4_ = fVar274 * fVar289;
        auVar41._16_4_ = fVar290 * fVar152;
        auVar41._20_4_ = fVar158 * fVar161;
        auVar41._24_4_ = fVar153 * fVar157;
        auVar41._28_4_ = uVar8;
        auVar336._0_4_ = fVar310 * fVar307;
        auVar336._4_4_ = fVar252 * fVar217;
        auVar336._8_4_ = fVar316 * fVar314;
        auVar336._12_4_ = fVar287 * fVar212;
        auVar336._16_4_ = fVar135 * fVar275;
        auVar336._20_4_ = fVar160 * fVar156;
        auVar336._24_4_ = fVar155 * fVar194;
        auVar336._28_4_ = 0;
        auVar22 = vsubps_avx(auVar336,auVar41);
        auVar24 = vsubps_avx(auVar19,auVar15);
        fVar311 = auVar22._28_4_ + auVar226._28_4_;
        auVar169._0_4_ = auVar22._0_4_ + auVar226._0_4_ * 0.0 + auVar21._0_4_ * 0.0;
        auVar169._4_4_ = auVar22._4_4_ + auVar226._4_4_ * 0.0 + auVar21._4_4_ * 0.0;
        auVar169._8_4_ = auVar22._8_4_ + auVar226._8_4_ * 0.0 + auVar21._8_4_ * 0.0;
        auVar169._12_4_ = auVar22._12_4_ + auVar226._12_4_ * 0.0 + auVar21._12_4_ * 0.0;
        auVar169._16_4_ = auVar22._16_4_ + auVar226._16_4_ * 0.0 + auVar21._16_4_ * 0.0;
        auVar169._20_4_ = auVar22._20_4_ + auVar226._20_4_ * 0.0 + auVar21._20_4_ * 0.0;
        auVar169._24_4_ = auVar22._24_4_ + auVar226._24_4_ * 0.0 + auVar21._24_4_ * 0.0;
        auVar169._28_4_ = fVar311 + auVar21._28_4_;
        fVar218 = auVar23._0_4_;
        fVar276 = auVar23._4_4_;
        auVar42._4_4_ = fVar276 * auVar15._4_4_;
        auVar42._0_4_ = fVar218 * auVar15._0_4_;
        fVar268 = auVar23._8_4_;
        auVar42._8_4_ = fVar268 * auVar15._8_4_;
        fVar271 = auVar23._12_4_;
        auVar42._12_4_ = fVar271 * auVar15._12_4_;
        fVar272 = auVar23._16_4_;
        auVar42._16_4_ = fVar272 * auVar15._16_4_;
        fVar273 = auVar23._20_4_;
        auVar42._20_4_ = fVar273 * auVar15._20_4_;
        fVar277 = auVar23._24_4_;
        auVar42._24_4_ = fVar277 * auVar15._24_4_;
        auVar42._28_4_ = fVar311;
        fVar311 = auVar24._0_4_;
        fVar324 = auVar24._4_4_;
        auVar43._4_4_ = auVar26._4_4_ * fVar324;
        auVar43._0_4_ = auVar26._0_4_ * fVar311;
        fVar278 = auVar24._8_4_;
        auVar43._8_4_ = auVar26._8_4_ * fVar278;
        fVar215 = auVar24._12_4_;
        auVar43._12_4_ = auVar26._12_4_ * fVar215;
        fVar154 = auVar24._16_4_;
        auVar43._16_4_ = auVar26._16_4_ * fVar154;
        fVar162 = auVar24._20_4_;
        auVar43._20_4_ = auVar26._20_4_ * fVar162;
        fVar159 = auVar24._24_4_;
        auVar43._24_4_ = auVar26._24_4_ * fVar159;
        auVar43._28_4_ = auVar22._28_4_;
        auVar226 = vsubps_avx(auVar43,auVar42);
        auVar22 = vsubps_avx(auVar18,auVar20);
        fVar180 = auVar22._0_4_;
        fVar181 = auVar22._4_4_;
        auVar44._4_4_ = fVar181 * auVar15._4_4_;
        auVar44._0_4_ = fVar180 * auVar15._0_4_;
        fVar182 = auVar22._8_4_;
        auVar44._8_4_ = fVar182 * auVar15._8_4_;
        fVar253 = auVar22._12_4_;
        auVar44._12_4_ = fVar253 * auVar15._12_4_;
        fVar260 = auVar22._16_4_;
        auVar44._16_4_ = fVar260 * auVar15._16_4_;
        fVar261 = auVar22._20_4_;
        auVar44._20_4_ = fVar261 * auVar15._20_4_;
        fVar262 = auVar22._24_4_;
        auVar44._24_4_ = fVar262 * auVar15._24_4_;
        auVar44._28_4_ = auVar15._28_4_;
        auVar45._4_4_ = auVar20._4_4_ * fVar324;
        auVar45._0_4_ = auVar20._0_4_ * fVar311;
        auVar45._8_4_ = auVar20._8_4_ * fVar278;
        auVar45._12_4_ = auVar20._12_4_ * fVar215;
        auVar45._16_4_ = auVar20._16_4_ * fVar154;
        auVar45._20_4_ = auVar20._20_4_ * fVar162;
        auVar45._24_4_ = auVar20._24_4_ * fVar159;
        auVar45._28_4_ = auVar21._28_4_;
        auVar21 = vsubps_avx(auVar44,auVar45);
        auVar46._4_4_ = auVar26._4_4_ * fVar181;
        auVar46._0_4_ = auVar26._0_4_ * fVar180;
        auVar46._8_4_ = auVar26._8_4_ * fVar182;
        auVar46._12_4_ = auVar26._12_4_ * fVar253;
        auVar46._16_4_ = auVar26._16_4_ * fVar260;
        auVar46._20_4_ = auVar26._20_4_ * fVar261;
        auVar46._24_4_ = auVar26._24_4_ * fVar262;
        auVar46._28_4_ = auVar15._28_4_;
        auVar47._4_4_ = auVar20._4_4_ * fVar276;
        auVar47._0_4_ = auVar20._0_4_ * fVar218;
        auVar47._8_4_ = auVar20._8_4_ * fVar268;
        auVar47._12_4_ = auVar20._12_4_ * fVar271;
        auVar47._16_4_ = auVar20._16_4_ * fVar272;
        auVar47._20_4_ = auVar20._20_4_ * fVar273;
        auVar47._24_4_ = auVar20._24_4_ * fVar277;
        auVar47._28_4_ = auVar20._28_4_;
        auVar20 = vsubps_avx(auVar47,auVar46);
        auVar231 = ZEXT864(0) << 0x20;
        auVar228._0_4_ = auVar226._0_4_ * 0.0 + auVar20._0_4_ + auVar21._0_4_ * 0.0;
        auVar228._4_4_ = auVar226._4_4_ * 0.0 + auVar20._4_4_ + auVar21._4_4_ * 0.0;
        auVar228._8_4_ = auVar226._8_4_ * 0.0 + auVar20._8_4_ + auVar21._8_4_ * 0.0;
        auVar228._12_4_ = auVar226._12_4_ * 0.0 + auVar20._12_4_ + auVar21._12_4_ * 0.0;
        auVar228._16_4_ = auVar226._16_4_ * 0.0 + auVar20._16_4_ + auVar21._16_4_ * 0.0;
        auVar228._20_4_ = auVar226._20_4_ * 0.0 + auVar20._20_4_ + auVar21._20_4_ * 0.0;
        auVar228._24_4_ = auVar226._24_4_ * 0.0 + auVar20._24_4_ + auVar21._24_4_ * 0.0;
        auVar228._28_4_ = auVar20._28_4_ + auVar20._28_4_ + auVar21._28_4_;
        auVar21 = vmaxps_avx(auVar169,auVar228);
        auVar21 = vcmpps_avx(auVar21,ZEXT832(0) << 0x20,2);
        auVar188 = vpackssdw_avx(auVar21._0_16_,auVar21._16_16_);
        auVar17 = vpand_avx(auVar188,auVar17);
        auVar188 = vpmovsxwd_avx(auVar17);
        auVar186 = vpunpckhwd_avx(auVar17,auVar17);
        auVar202._16_16_ = auVar186;
        auVar202._0_16_ = auVar188;
        if ((((((((auVar202 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar202 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar202 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar202 >> 0x7f,0) == '\0') &&
              (auVar202 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar186 >> 0x3f,0) == '\0') &&
            (auVar202 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar186[0xf]) {
LAB_00f656b1:
          auVar246._8_8_ = uStack_5d8;
          auVar246._0_8_ = local_5e0;
          auVar246._16_8_ = uStack_5d0;
          auVar246._24_8_ = uStack_5c8;
          auVar205 = ZEXT3264(auVar202);
        }
        else {
          auVar48._4_4_ = fVar324 * fVar217;
          auVar48._0_4_ = fVar311 * fVar307;
          auVar48._8_4_ = fVar278 * fVar314;
          auVar48._12_4_ = fVar215 * fVar212;
          auVar48._16_4_ = fVar154 * fVar275;
          auVar48._20_4_ = fVar162 * fVar156;
          auVar48._24_4_ = fVar159 * fVar194;
          auVar48._28_4_ = auVar186._12_4_;
          auVar319._0_4_ = fVar218 * fVar163;
          auVar319._4_4_ = fVar276 * fVar288;
          auVar319._8_4_ = fVar268 * fVar164;
          auVar319._12_4_ = fVar271 * fVar176;
          auVar319._16_4_ = fVar272 * fVar177;
          auVar319._20_4_ = fVar273 * fVar178;
          auVar319._24_4_ = fVar277 * fVar179;
          auVar319._28_4_ = 0;
          auVar21 = vsubps_avx(auVar319,auVar48);
          auVar49._4_4_ = fVar181 * fVar288;
          auVar49._0_4_ = fVar180 * fVar163;
          auVar49._8_4_ = fVar182 * fVar164;
          auVar49._12_4_ = fVar253 * fVar176;
          auVar49._16_4_ = fVar260 * fVar177;
          auVar49._20_4_ = fVar261 * fVar178;
          auVar49._24_4_ = fVar262 * fVar179;
          auVar49._28_4_ = auVar284._28_4_;
          auVar50._4_4_ = fVar324 * fVar313;
          auVar50._0_4_ = fVar311 * fVar213;
          auVar50._8_4_ = fVar278 * fVar315;
          auVar50._12_4_ = fVar215 * fVar289;
          auVar50._16_4_ = fVar154 * fVar152;
          auVar50._20_4_ = fVar162 * fVar161;
          auVar50._24_4_ = fVar159 * fVar157;
          auVar50._28_4_ = auVar24._28_4_;
          auVar26 = vsubps_avx(auVar50,auVar49);
          auVar51._4_4_ = fVar276 * fVar313;
          auVar51._0_4_ = fVar218 * fVar213;
          auVar51._8_4_ = fVar268 * fVar315;
          auVar51._12_4_ = fVar271 * fVar289;
          auVar51._16_4_ = fVar272 * fVar152;
          auVar51._20_4_ = fVar273 * fVar161;
          auVar51._24_4_ = fVar277 * fVar157;
          auVar51._28_4_ = auVar169._28_4_;
          auVar52._4_4_ = fVar181 * fVar217;
          auVar52._0_4_ = fVar180 * fVar307;
          auVar52._8_4_ = fVar182 * fVar314;
          auVar52._12_4_ = fVar253 * fVar212;
          auVar52._16_4_ = fVar260 * fVar275;
          auVar52._20_4_ = fVar261 * fVar156;
          auVar52._24_4_ = fVar262 * fVar194;
          auVar52._28_4_ = auVar318._28_4_;
          auVar15 = vsubps_avx(auVar52,auVar51);
          auVar270._0_4_ = auVar21._0_4_ * 0.0 + auVar15._0_4_ + auVar26._0_4_ * 0.0;
          auVar270._4_4_ = auVar21._4_4_ * 0.0 + auVar15._4_4_ + auVar26._4_4_ * 0.0;
          auVar270._8_4_ = auVar21._8_4_ * 0.0 + auVar15._8_4_ + auVar26._8_4_ * 0.0;
          auVar270._12_4_ = auVar21._12_4_ * 0.0 + auVar15._12_4_ + auVar26._12_4_ * 0.0;
          auVar270._16_4_ = auVar21._16_4_ * 0.0 + auVar15._16_4_ + auVar26._16_4_ * 0.0;
          auVar270._20_4_ = auVar21._20_4_ * 0.0 + auVar15._20_4_ + auVar26._20_4_ * 0.0;
          auVar270._24_4_ = auVar21._24_4_ * 0.0 + auVar15._24_4_ + auVar26._24_4_ * 0.0;
          auVar270._28_4_ = auVar318._28_4_ + auVar15._28_4_ + auVar169._28_4_;
          auVar20 = vrcpps_avx(auVar270);
          fVar307 = auVar20._0_4_;
          fVar213 = auVar20._4_4_;
          auVar53._4_4_ = auVar270._4_4_ * fVar213;
          auVar53._0_4_ = auVar270._0_4_ * fVar307;
          fVar311 = auVar20._8_4_;
          auVar53._8_4_ = auVar270._8_4_ * fVar311;
          fVar217 = auVar20._12_4_;
          auVar53._12_4_ = auVar270._12_4_ * fVar217;
          fVar313 = auVar20._16_4_;
          auVar53._16_4_ = auVar270._16_4_ * fVar313;
          fVar324 = auVar20._20_4_;
          auVar53._20_4_ = auVar270._20_4_ * fVar324;
          fVar314 = auVar20._24_4_;
          auVar53._24_4_ = auVar270._24_4_ * fVar314;
          auVar53._28_4_ = auVar24._28_4_;
          auVar320._8_4_ = 0x3f800000;
          auVar320._0_8_ = &DAT_3f8000003f800000;
          auVar320._12_4_ = 0x3f800000;
          auVar320._16_4_ = 0x3f800000;
          auVar320._20_4_ = 0x3f800000;
          auVar320._24_4_ = 0x3f800000;
          auVar320._28_4_ = 0x3f800000;
          auVar226 = vsubps_avx(auVar320,auVar53);
          fVar307 = auVar226._0_4_ * fVar307 + fVar307;
          fVar213 = auVar226._4_4_ * fVar213 + fVar213;
          fVar311 = auVar226._8_4_ * fVar311 + fVar311;
          fVar217 = auVar226._12_4_ * fVar217 + fVar217;
          fVar313 = auVar226._16_4_ * fVar313 + fVar313;
          fVar324 = auVar226._20_4_ * fVar324 + fVar324;
          fVar314 = auVar226._24_4_ * fVar314 + fVar314;
          auVar54._4_4_ =
               (auVar21._4_4_ * fVar252 + auVar26._4_4_ * fVar312 + auVar15._4_4_ * fVar196) *
               fVar213;
          auVar54._0_4_ =
               (auVar21._0_4_ * fVar310 + auVar26._0_4_ * fVar208 + auVar15._0_4_ * fVar219) *
               fVar307;
          auVar54._8_4_ =
               (auVar21._8_4_ * fVar316 + auVar26._8_4_ * fVar210 + auVar15._8_4_ * fVar207) *
               fVar311;
          auVar54._12_4_ =
               (auVar21._12_4_ * fVar287 + auVar26._12_4_ * fVar274 + auVar15._12_4_ * fVar266) *
               fVar217;
          auVar54._16_4_ =
               (auVar21._16_4_ * fVar135 + auVar26._16_4_ * fVar290 + auVar15._16_4_ * fVar238) *
               fVar313;
          auVar54._20_4_ =
               (auVar21._20_4_ * fVar160 + auVar26._20_4_ * fVar158 + auVar15._20_4_ * fVar214) *
               fVar324;
          auVar54._24_4_ =
               (auVar21._24_4_ * fVar155 + auVar26._24_4_ * fVar153 + auVar15._24_4_ * fVar216) *
               fVar314;
          auVar54._28_4_ = auVar18._28_4_ + auVar201._28_4_ + auVar19._28_4_;
          auVar188 = vpermilps_avx(ZEXT416(uVar7),0);
          auVar203._16_16_ = auVar188;
          auVar203._0_16_ = auVar188;
          auVar18 = vcmpps_avx(auVar203,auVar54,2);
          uVar8 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar244._4_4_ = uVar8;
          auVar244._0_4_ = uVar8;
          auVar244._8_4_ = uVar8;
          auVar244._12_4_ = uVar8;
          auVar244._16_4_ = uVar8;
          auVar244._20_4_ = uVar8;
          auVar244._24_4_ = uVar8;
          auVar244._28_4_ = uVar8;
          auVar21 = vcmpps_avx(auVar54,auVar244,2);
          auVar18 = vandps_avx(auVar21,auVar18);
          auVar188 = vpackssdw_avx(auVar18._0_16_,auVar18._16_16_);
          auVar17 = vpand_avx(auVar17,auVar188);
          auVar188 = vpmovsxwd_avx(auVar17);
          auVar186 = vpshufd_avx(auVar17,0xee);
          auVar186 = vpmovsxwd_avx(auVar186);
          auVar202._16_16_ = auVar186;
          auVar202._0_16_ = auVar188;
          if ((((((((auVar202 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar202 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar202 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar202 >> 0x7f,0) == '\0') &&
                (auVar202 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar186 >> 0x3f,0) == '\0') &&
              (auVar202 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar186[0xf]) goto LAB_00f656b1;
          auVar18 = vcmpps_avx(ZEXT832(0) << 0x20,auVar270,4);
          auVar188 = vpackssdw_avx(auVar18._0_16_,auVar18._16_16_);
          auVar17 = vpand_avx(auVar17,auVar188);
          auVar188 = vpmovsxwd_avx(auVar17);
          auVar17 = vpunpckhwd_avx(auVar17,auVar17);
          auVar205 = ZEXT1664(auVar17);
          auVar258._16_16_ = auVar17;
          auVar258._0_16_ = auVar188;
          auVar246._8_8_ = uStack_5d8;
          auVar246._0_8_ = local_5e0;
          auVar246._16_8_ = uStack_5d0;
          auVar246._24_8_ = uStack_5c8;
          if ((((((((auVar258 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar258 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar258 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar258 >> 0x7f,0) != '\0') ||
                (auVar258 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar17 >> 0x3f,0) != '\0') ||
              (auVar258 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar17[0xf] < '\0') {
            auVar204._0_4_ = auVar169._0_4_ * fVar307;
            auVar204._4_4_ = auVar169._4_4_ * fVar213;
            auVar204._8_4_ = auVar169._8_4_ * fVar311;
            auVar204._12_4_ = auVar169._12_4_ * fVar217;
            auVar204._16_4_ = auVar169._16_4_ * fVar313;
            auVar204._20_4_ = auVar169._20_4_ * fVar324;
            auVar204._24_4_ = auVar169._24_4_ * fVar314;
            auVar204._28_4_ = 0;
            auVar55._4_4_ = auVar228._4_4_ * fVar213;
            auVar55._0_4_ = auVar228._0_4_ * fVar307;
            auVar55._8_4_ = auVar228._8_4_ * fVar311;
            auVar55._12_4_ = auVar228._12_4_ * fVar217;
            auVar55._16_4_ = auVar228._16_4_ * fVar313;
            auVar55._20_4_ = auVar228._20_4_ * fVar324;
            auVar55._24_4_ = auVar228._24_4_ * fVar314;
            auVar55._28_4_ = auVar226._28_4_ + auVar20._28_4_;
            auVar245._8_4_ = 0x3f800000;
            auVar245._0_8_ = &DAT_3f8000003f800000;
            auVar245._12_4_ = 0x3f800000;
            auVar245._16_4_ = 0x3f800000;
            auVar245._20_4_ = 0x3f800000;
            auVar245._24_4_ = 0x3f800000;
            auVar245._28_4_ = 0x3f800000;
            auVar18 = vsubps_avx(auVar245,auVar204);
            local_e0 = vblendvps_avx(auVar18,auVar204,auVar308);
            auVar18 = vsubps_avx(auVar245,auVar55);
            auVar205 = ZEXT3264(auVar18);
            _local_520 = vblendvps_avx(auVar18,auVar55,auVar308);
            local_2c0 = auVar54;
            auVar246 = auVar258;
          }
        }
        if ((((((((auVar246 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar246 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar246 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar246 >> 0x7f,0) != '\0') ||
              (auVar246 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar246 >> 0xbf,0) != '\0') ||
            (auVar246 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar246[0x1f] < '\0') {
          auVar18 = vsubps_avx(auVar293,_local_900);
          auVar205 = ZEXT3264(local_e0);
          local_900._0_4_ = (float)local_900._0_4_ + auVar18._0_4_ * local_e0._0_4_;
          local_900._4_4_ = (float)local_900._4_4_ + auVar18._4_4_ * local_e0._4_4_;
          fStack_8f8 = fStack_8f8 + auVar18._8_4_ * local_e0._8_4_;
          fStack_8f4 = fStack_8f4 + auVar18._12_4_ * local_e0._12_4_;
          fStack_8f0 = fStack_8f0 + auVar18._16_4_ * local_e0._16_4_;
          fStack_8ec = fStack_8ec + auVar18._20_4_ * local_e0._20_4_;
          fStack_8e8 = fStack_8e8 + auVar18._24_4_ * local_e0._24_4_;
          fStack_8e4 = fStack_8e4 + auVar18._28_4_;
          fVar307 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
          auVar56._4_4_ = ((float)local_900._4_4_ + (float)local_900._4_4_) * fVar307;
          auVar56._0_4_ = ((float)local_900._0_4_ + (float)local_900._0_4_) * fVar307;
          auVar56._8_4_ = (fStack_8f8 + fStack_8f8) * fVar307;
          auVar56._12_4_ = (fStack_8f4 + fStack_8f4) * fVar307;
          auVar56._16_4_ = (fStack_8f0 + fStack_8f0) * fVar307;
          auVar56._20_4_ = (fStack_8ec + fStack_8ec) * fVar307;
          auVar56._24_4_ = (fStack_8e8 + fStack_8e8) * fVar307;
          auVar56._28_4_ = fStack_8e4 + fStack_8e4;
          auVar18 = vcmpps_avx(local_2c0,auVar56,6);
          auVar21 = auVar246 & auVar18;
          if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar21 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar21 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar21 >> 0x7f,0) != '\0') ||
                (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar21 >> 0xbf,0) != '\0') ||
              (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar21[0x1f] < '\0') {
            local_380 = vandps_avx(auVar18,auVar246);
            local_420 = (float)local_520._0_4_ + (float)local_520._0_4_ + -1.0;
            fStack_41c = (float)local_520._4_4_ + (float)local_520._4_4_ + -1.0;
            fStack_418 = (float)uStack_518 + (float)uStack_518 + -1.0;
            fStack_414 = uStack_518._4_4_ + uStack_518._4_4_ + -1.0;
            fStack_410 = (float)uStack_510 + (float)uStack_510 + -1.0;
            fStack_40c = uStack_510._4_4_ + uStack_510._4_4_ + -1.0;
            fStack_408 = (float)uStack_508 + (float)uStack_508 + -1.0;
            fStack_404 = uStack_508._4_4_ + uStack_508._4_4_ + -1.0;
            local_440 = local_e0;
            local_400 = local_2c0;
            local_3e0 = 0;
            uStack_3b8 = uStack_7c8;
            uStack_3a8 = uStack_7d8;
            local_3a0 = local_600._0_8_;
            uStack_398 = local_600._8_8_;
            local_520._4_4_ = fStack_41c;
            local_520._0_4_ = local_420;
            uStack_518._0_4_ = fStack_418;
            uStack_518._4_4_ = fStack_414;
            uStack_510._0_4_ = fStack_410;
            uStack_510._4_4_ = fStack_40c;
            auVar121 = _local_520;
            uStack_508._0_4_ = fStack_408;
            uStack_508._4_4_ = fStack_404;
            auVar18 = _local_520;
            if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
              _local_520 = auVar18;
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (bVar131 = true, pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                auVar185._0_4_ = 1.0 / auVar199._0_4_;
                auVar185._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar17 = vshufps_avx(auVar185,auVar185,0);
                local_360[0] = auVar17._0_4_ * (local_e0._0_4_ + 0.0);
                local_360[1] = auVar17._4_4_ * (local_e0._4_4_ + 1.0);
                local_360[2] = auVar17._8_4_ * (local_e0._8_4_ + 2.0);
                local_360[3] = auVar17._12_4_ * (local_e0._12_4_ + 3.0);
                fStack_350 = auVar17._0_4_ * (local_e0._16_4_ + 4.0);
                fStack_34c = auVar17._4_4_ * (local_e0._20_4_ + 5.0);
                fStack_348 = auVar17._8_4_ * (local_e0._24_4_ + 6.0);
                fStack_344 = local_e0._28_4_ + 7.0;
                uStack_510 = auVar121._16_8_;
                uStack_508 = auVar18._24_8_;
                local_340 = local_520;
                uStack_338 = uStack_518;
                uStack_330 = uStack_510;
                uStack_328 = uStack_508;
                local_320 = local_2c0._0_8_;
                uStack_318 = local_2c0._8_8_;
                uStack_310 = local_2c0._16_8_;
                uStack_308 = local_2c0._24_8_;
                iVar127 = vmovmskps_avx(local_380);
                local_820 = CONCAT44((int)((ulong)context->args >> 0x20),iVar127);
                uVar130 = 0;
                if (local_820 != 0) {
                  for (; (local_820 >> uVar130 & 1) == 0; uVar130 = uVar130 + 1) {
                  }
                }
                bVar131 = iVar127 != 0;
                if (bVar131) {
                  auVar17 = vshufps_avx(ZEXT416(uVar126),ZEXT416(uVar126),0);
                  auVar188 = vshufps_avx(ZEXT416(uVar129),ZEXT416(uVar129),0);
                  local_640 = local_600._0_4_;
                  fStack_63c = local_600._4_4_;
                  fStack_638 = local_600._8_4_;
                  fStack_634 = local_600._12_4_;
                  local_620 = (undefined4)*(undefined8 *)*local_680;
                  uStack_61c = (undefined4)((ulong)*(undefined8 *)*local_680 >> 0x20);
                  uStack_618 = (undefined4)*(undefined8 *)(*local_680 + 8);
                  uStack_614 = (undefined4)((ulong)*(undefined8 *)(*local_680 + 8) >> 0x20);
                  fStack_610 = (float)*local_688;
                  fStack_60c = (float)((ulong)*local_688 >> 0x20);
                  fStack_608 = (float)local_688[1];
                  fStack_604 = (float)((ulong)local_688[1] >> 0x20);
                  local_3dc = uVar10;
                  local_3d0 = auVar16;
                  local_3c0 = local_7d0;
                  local_3b0 = local_7e0;
                  do {
                    uVar8 = *(undefined4 *)(ray + k * 4 + 0x100);
                    local_1e0 = local_360[uVar130];
                    local_1c0 = *(undefined4 *)((long)&local_340 + uVar130 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x100) =
                         *(undefined4 *)((long)&local_320 + uVar130 * 4);
                    fVar208 = 1.0 - local_1e0;
                    fVar307 = local_1e0 * 3.0;
                    auVar186 = ZEXT416((uint)((fVar208 * -2.0 * local_1e0 + local_1e0 * local_1e0) *
                                             0.5));
                    auVar186 = vshufps_avx(auVar186,auVar186,0);
                    auVar200 = ZEXT416((uint)(((fVar208 + fVar208) * (fVar307 + 2.0) +
                                              fVar208 * fVar208 * -3.0) * 0.5));
                    auVar200 = vshufps_avx(auVar200,auVar200,0);
                    auVar137 = ZEXT416((uint)(((local_1e0 + local_1e0) * (fVar307 + -5.0) +
                                              local_1e0 * fVar307) * 0.5));
                    auVar137 = vshufps_avx(auVar137,auVar137,0);
                    local_670.context = context->user;
                    auVar167 = ZEXT416((uint)((local_1e0 * (fVar208 + fVar208) - fVar208 * fVar208)
                                             * 0.5));
                    auVar167 = vshufps_avx(auVar167,auVar167,0);
                    auVar187._0_4_ =
                         local_920 * auVar167._0_4_ +
                         auVar137._0_4_ * (float)uVar6 +
                         auVar186._0_4_ * local_640 + auVar200._0_4_ * (float)uVar124;
                    auVar187._4_4_ =
                         fStack_91c * auVar167._4_4_ +
                         auVar137._4_4_ * (float)uVar123 +
                         auVar186._4_4_ * fStack_63c + auVar200._4_4_ * (float)uVar125;
                    auVar187._8_4_ =
                         fStack_918 * auVar167._8_4_ +
                         auVar137._8_4_ * fVar195 +
                         auVar186._8_4_ * fStack_638 + auVar200._8_4_ * fVar239;
                    auVar187._12_4_ =
                         fStack_914 * auVar167._12_4_ +
                         auVar137._12_4_ * fVar220 +
                         auVar186._12_4_ * fStack_634 + auVar200._12_4_ * fVar206;
                    local_230 = vshufps_avx(auVar187,auVar187,0);
                    local_240[0] = (RTCHitN)local_230[0];
                    local_240[1] = (RTCHitN)local_230[1];
                    local_240[2] = (RTCHitN)local_230[2];
                    local_240[3] = (RTCHitN)local_230[3];
                    local_240[4] = (RTCHitN)local_230[4];
                    local_240[5] = (RTCHitN)local_230[5];
                    local_240[6] = (RTCHitN)local_230[6];
                    local_240[7] = (RTCHitN)local_230[7];
                    local_240[8] = (RTCHitN)local_230[8];
                    local_240[9] = (RTCHitN)local_230[9];
                    local_240[10] = (RTCHitN)local_230[10];
                    local_240[0xb] = (RTCHitN)local_230[0xb];
                    local_240[0xc] = (RTCHitN)local_230[0xc];
                    local_240[0xd] = (RTCHitN)local_230[0xd];
                    local_240[0xe] = (RTCHitN)local_230[0xe];
                    local_240[0xf] = (RTCHitN)local_230[0xf];
                    local_210 = vshufps_avx(auVar187,auVar187,0x55);
                    auVar205 = ZEXT1664(local_210);
                    local_220 = local_210;
                    local_1f0 = vshufps_avx(auVar187,auVar187,0xaa);
                    local_200 = local_1f0;
                    fStack_1dc = local_1e0;
                    fStack_1d8 = local_1e0;
                    fStack_1d4 = local_1e0;
                    fStack_1d0 = local_1e0;
                    fStack_1cc = local_1e0;
                    fStack_1c8 = local_1e0;
                    fStack_1c4 = local_1e0;
                    uStack_1bc = local_1c0;
                    uStack_1b8 = local_1c0;
                    uStack_1b4 = local_1c0;
                    uStack_1b0 = local_1c0;
                    uStack_1ac = local_1c0;
                    uStack_1a8 = local_1c0;
                    uStack_1a4 = local_1c0;
                    local_700 = auVar188._0_8_;
                    uStack_6f8 = auVar188._8_8_;
                    local_1a0 = local_700;
                    uStack_198 = uStack_6f8;
                    uStack_190 = local_700;
                    uStack_188 = uStack_6f8;
                    local_840 = auVar17._0_8_;
                    uStack_838 = auVar17._8_8_;
                    local_180 = local_840;
                    uStack_178 = uStack_838;
                    uStack_170 = local_840;
                    uStack_168 = uStack_838;
                    auVar18 = vcmpps_avx(auVar231._0_32_,auVar231._0_32_,0xf);
                    local_678[1] = auVar18;
                    *local_678 = auVar18;
                    local_160 = (local_670.context)->instID[0];
                    uStack_15c = local_160;
                    uStack_158 = local_160;
                    uStack_154 = local_160;
                    uStack_150 = local_160;
                    uStack_14c = local_160;
                    uStack_148 = local_160;
                    uStack_144 = local_160;
                    local_140 = (local_670.context)->instPrimID[0];
                    uStack_13c = local_140;
                    uStack_138 = local_140;
                    uStack_134 = local_140;
                    uStack_130 = local_140;
                    uStack_12c = local_140;
                    uStack_128 = local_140;
                    uStack_124 = local_140;
                    local_6c0 = CONCAT44(uStack_61c,local_620);
                    uStack_6b8 = CONCAT44(uStack_614,uStack_618);
                    uStack_6b0 = CONCAT44(fStack_60c,fStack_610);
                    uStack_6a8 = CONCAT44(fStack_604,fStack_608);
                    local_670.valid = (int *)&local_6c0;
                    local_670.geometryUserPtr = pGVar11->userPtr;
                    local_670.hit = local_240;
                    local_670.N = 8;
                    local_670.ray = (RTCRayN *)ray;
                    if (pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar205 = ZEXT1664(local_210);
                      (*pGVar11->occlusionFilterN)(&local_670);
                      auVar231 = ZEXT1664(ZEXT816(0) << 0x40);
                    }
                    auVar105._8_8_ = uStack_6b8;
                    auVar105._0_8_ = local_6c0;
                    auVar186 = vpcmpeqd_avx(ZEXT816(0) << 0x40,auVar105);
                    auVar109._8_8_ = uStack_6a8;
                    auVar109._0_8_ = uStack_6b0;
                    auVar200 = vpcmpeqd_avx(ZEXT816(0) << 0x40,auVar109);
                    auVar144._16_16_ = auVar200;
                    auVar144._0_16_ = auVar186;
                    auVar21 = auVar18 & ~auVar144;
                    if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar21 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar21 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar21 >> 0x7f,0) == '\0') &&
                          (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar21 >> 0xbf,0) == '\0') &&
                        (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar21[0x1f]) {
                      auVar145._0_4_ = auVar186._0_4_ ^ auVar18._0_4_;
                      auVar145._4_4_ = auVar186._4_4_ ^ auVar18._4_4_;
                      auVar145._8_4_ = auVar186._8_4_ ^ auVar18._8_4_;
                      auVar145._12_4_ = auVar186._12_4_ ^ auVar18._12_4_;
                      auVar145._16_4_ = auVar200._0_4_ ^ auVar18._16_4_;
                      auVar145._20_4_ = auVar200._4_4_ ^ auVar18._20_4_;
                      auVar145._24_4_ = auVar200._8_4_ ^ auVar18._24_4_;
                      auVar145._28_4_ = auVar200._12_4_ ^ auVar18._28_4_;
                    }
                    else {
                      p_Var12 = context->args->filter;
                      if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar205 = ZEXT1664(auVar205._0_16_);
                        (*p_Var12)(&local_670);
                        auVar231 = ZEXT1664(ZEXT816(0) << 0x40);
                      }
                      auVar106._8_8_ = uStack_6b8;
                      auVar106._0_8_ = local_6c0;
                      auVar186 = vpcmpeqd_avx((undefined1  [16])0x0,auVar106);
                      auVar110._8_8_ = uStack_6a8;
                      auVar110._0_8_ = uStack_6b0;
                      auVar200 = vpcmpeqd_avx((undefined1  [16])0x0,auVar110);
                      auVar170._16_16_ = auVar200;
                      auVar170._0_16_ = auVar186;
                      auVar145._0_4_ = auVar186._0_4_ ^ auVar18._0_4_;
                      auVar145._4_4_ = auVar186._4_4_ ^ auVar18._4_4_;
                      auVar145._8_4_ = auVar186._8_4_ ^ auVar18._8_4_;
                      auVar145._12_4_ = auVar186._12_4_ ^ auVar18._12_4_;
                      auVar145._16_4_ = auVar200._0_4_ ^ auVar18._16_4_;
                      auVar145._20_4_ = auVar200._4_4_ ^ auVar18._20_4_;
                      auVar145._24_4_ = auVar200._8_4_ ^ auVar18._24_4_;
                      auVar145._28_4_ = auVar200._12_4_ ^ auVar18._28_4_;
                      auVar191._8_4_ = 0xff800000;
                      auVar191._0_8_ = 0xff800000ff800000;
                      auVar191._12_4_ = 0xff800000;
                      auVar191._16_4_ = 0xff800000;
                      auVar191._20_4_ = 0xff800000;
                      auVar191._24_4_ = 0xff800000;
                      auVar191._28_4_ = 0xff800000;
                      auVar18 = vblendvps_avx(auVar191,*(undefined1 (*) [32])(local_670.ray + 0x100)
                                              ,auVar170);
                      *(undefined1 (*) [32])(local_670.ray + 0x100) = auVar18;
                    }
                    if ((((((((auVar145 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar145 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar145 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar145 >> 0x7f,0) != '\0') ||
                          (auVar145 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar145 >> 0xbf,0) != '\0') ||
                        (auVar145 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar145[0x1f] < '\0') break;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar8;
                    local_820 = local_820 ^ 1L << (uVar130 & 0x3f);
                    uVar130 = 0;
                    if (local_820 != 0) {
                      for (; (local_820 >> uVar130 & 1) == 0; uVar130 = uVar130 + 1) {
                      }
                    }
                    bVar131 = local_820 != 0;
                  } while (bVar131);
                }
              }
              goto LAB_00f640bb;
            }
          }
        }
        bVar131 = false;
      }
LAB_00f640bb:
      auVar309 = ZEXT3264(auVar303);
      auVar231 = ZEXT3264(CONCAT1616(auVar138,auVar138));
      if (8 < (int)uVar10) {
        auVar17 = vpshufd_avx(ZEXT416(uVar10),0);
        local_620 = auVar17._0_4_;
        uStack_61c = auVar17._4_4_;
        uStack_618 = auVar17._8_4_;
        uStack_614 = auVar17._12_4_;
        auVar17 = vshufps_avx(auVar283,auVar283,0);
        local_500._16_16_ = auVar17;
        local_500._0_16_ = auVar17;
        auVar17 = vpermilps_avx(ZEXT416(uVar7),0);
        local_100._16_16_ = auVar17;
        local_100._0_16_ = auVar17;
        auVar140._0_4_ = 1.0 / (float)local_580._0_4_;
        auVar140._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar17 = vshufps_avx(auVar140,auVar140,0);
        register0x00001210 = auVar17;
        _local_120 = auVar17;
        auVar17 = vshufps_avx(ZEXT416(uVar126),ZEXT416(uVar126),0);
        local_580._16_16_ = auVar17;
        local_580._0_16_ = auVar17;
        auVar17 = vshufps_avx(ZEXT416((uint)local_5a0._0_4_),ZEXT416((uint)local_5a0._0_4_),0);
        local_5a0._16_16_ = auVar17;
        local_5a0._0_16_ = auVar17;
        auVar151 = ZEXT3264(local_5a0);
        lVar132 = 8;
        do {
          auVar283 = local_600;
          pauVar1 = (undefined1 (*) [28])(catmullrom_basis0 + lVar132 * 4 + lVar13);
          fVar307 = *(float *)*pauVar1;
          fVar208 = *(float *)(*pauVar1 + 4);
          fVar310 = *(float *)(*pauVar1 + 8);
          fVar213 = *(float *)(*pauVar1 + 0xc);
          fVar311 = *(float *)(*pauVar1 + 0x10);
          fVar217 = *(float *)(*pauVar1 + 0x14);
          fVar312 = *(float *)(*pauVar1 + 0x18);
          auVar120 = *pauVar1;
          fVar252 = *(float *)pauVar1[1];
          pauVar1 = (undefined1 (*) [28])(lVar13 + 0x22307f0 + lVar132 * 4);
          fVar313 = *(float *)*pauVar1;
          fVar324 = *(float *)(*pauVar1 + 4);
          fVar314 = *(float *)(*pauVar1 + 8);
          fVar210 = *(float *)(*pauVar1 + 0xc);
          fVar316 = *(float *)(*pauVar1 + 0x10);
          fVar315 = *(float *)(*pauVar1 + 0x14);
          fVar278 = *(float *)(*pauVar1 + 0x18);
          auVar119 = *pauVar1;
          pauVar1 = (undefined1 (*) [28])(lVar13 + 0x2230c74 + lVar132 * 4);
          fVar212 = *(float *)*pauVar1;
          fVar274 = *(float *)(*pauVar1 + 4);
          fVar287 = *(float *)(*pauVar1 + 8);
          fVar289 = *(float *)(*pauVar1 + 0xc);
          fVar215 = *(float *)(*pauVar1 + 0x10);
          fVar275 = *(float *)(*pauVar1 + 0x14);
          fVar290 = *(float *)(*pauVar1 + 0x18);
          auVar118 = *pauVar1;
          pauVar1 = (undefined1 (*) [28])(lVar13 + 0x22310f8 + lVar132 * 4);
          fVar135 = *(float *)*pauVar1;
          fVar152 = *(float *)(*pauVar1 + 4);
          fVar154 = *(float *)(*pauVar1 + 8);
          fVar156 = *(float *)(*pauVar1 + 0xc);
          fVar158 = *(float *)(*pauVar1 + 0x10);
          fVar160 = *(float *)(*pauVar1 + 0x14);
          fVar161 = *(float *)(*pauVar1 + 0x18);
          auVar117 = *pauVar1;
          fVar214 = auVar309._0_4_;
          fVar216 = auVar309._4_4_;
          fVar218 = auVar309._8_4_;
          fVar268 = auVar309._12_4_;
          fVar272 = auVar309._16_4_;
          fVar277 = auVar309._20_4_;
          fVar288 = auVar309._24_4_;
          fVar266 = auVar205._28_4_;
          fVar194 = fVar266 + *(float *)pauVar1[1];
          fVar162 = fVar266 + fVar266 + auVar151._28_4_;
          fVar238 = fVar266 + fVar194;
          auVar205 = ZEXT3264(local_4c0);
          fVar153 = local_4c0._0_4_;
          fVar155 = local_4c0._4_4_;
          fVar157 = local_4c0._8_4_;
          fVar159 = local_4c0._12_4_;
          fVar219 = local_4c0._16_4_;
          fVar196 = local_4c0._20_4_;
          fVar207 = local_4c0._24_4_;
          auVar285._0_4_ =
               fVar153 * fVar307 +
               (float)local_2a0._0_4_ * fVar313 +
               fVar214 * fVar212 + (float)local_560._0_4_ * fVar135;
          auVar285._4_4_ =
               fVar155 * fVar208 +
               (float)local_2a0._4_4_ * fVar324 +
               fVar216 * fVar274 + (float)local_560._4_4_ * fVar152;
          auVar285._8_4_ =
               fVar157 * fVar310 + fStack_298 * fVar314 + fVar218 * fVar287 + fStack_558 * fVar154;
          auVar285._12_4_ =
               fVar159 * fVar213 + fStack_294 * fVar210 + fVar268 * fVar289 + fStack_554 * fVar156;
          auVar285._16_4_ =
               fVar219 * fVar311 + fStack_290 * fVar316 + fVar272 * fVar215 + fStack_550 * fVar158;
          auVar285._20_4_ =
               fVar196 * fVar217 + fStack_28c * fVar315 + fVar277 * fVar275 + fStack_54c * fVar160;
          auVar285._24_4_ =
               fVar207 * fVar312 + fStack_288 * fVar278 + fVar288 * fVar290 + fStack_548 * fVar161;
          auVar285._28_4_ = fVar194 + fVar162;
          auVar192._0_4_ =
               (float)local_4e0._0_4_ * fVar307 +
               (float)local_80._0_4_ * fVar313 + fVar221 * fVar212 + fVar335 * fVar135;
          auVar192._4_4_ =
               (float)local_4e0._4_4_ * fVar208 +
               (float)local_80._4_4_ * fVar324 + fVar233 * fVar274 + fVar338 * fVar152;
          auVar192._8_4_ =
               fStack_4d8 * fVar310 + fStack_78 * fVar314 + fVar235 * fVar287 + fVar339 * fVar154;
          auVar192._12_4_ =
               fStack_4d4 * fVar213 + fStack_74 * fVar210 + fVar237 * fVar289 + fVar340 * fVar156;
          auVar192._16_4_ =
               fStack_4d0 * fVar311 + fStack_70 * fVar316 + fVar221 * fVar215 + fVar335 * fVar158;
          auVar192._20_4_ =
               fStack_4cc * fVar217 + fStack_6c * fVar315 + fVar233 * fVar275 + fVar338 * fVar160;
          auVar192._24_4_ =
               fStack_4c8 * fVar312 + fStack_68 * fVar278 + fVar235 * fVar290 + fVar339 * fVar161;
          auVar192._28_4_ = fVar162 + fVar266 + fVar266 + auVar231._28_4_;
          fVar135 = fVar307 * (float)local_280._0_4_ +
                    (float)local_a0._0_4_ * fVar313 +
                    fVar212 * (float)local_480._0_4_ + fVar135 * (float)local_260._0_4_;
          fVar152 = fVar208 * (float)local_280._4_4_ +
                    (float)local_a0._4_4_ * fVar324 +
                    fVar274 * (float)local_480._4_4_ + fVar152 * (float)local_260._4_4_;
          fVar154 = fVar310 * fStack_278 +
                    fStack_98 * fVar314 + fVar287 * fStack_478 + fVar154 * fStack_258;
          fVar156 = fVar213 * fStack_274 +
                    fStack_94 * fVar210 + fVar289 * fStack_474 + fVar156 * fStack_254;
          fVar158 = fVar311 * fStack_270 +
                    fStack_90 * fVar316 + fVar215 * fStack_470 + fVar158 * fStack_250;
          fVar160 = fVar217 * fStack_26c +
                    fStack_8c * fVar315 + fVar275 * fStack_46c + fVar160 * fStack_24c;
          fVar161 = fVar312 * fStack_268 +
                    fStack_88 * fVar278 + fVar290 * fStack_468 + fVar161 * fStack_248;
          fVar162 = fVar162 + fVar238;
          auVar121 = *(undefined1 (*) [24])(catmullrom_basis1 + lVar132 * 4 + lVar13);
          pauVar1 = (undefined1 (*) [28])(lVar13 + 0x2232c10 + lVar132 * 4);
          fVar208 = *(float *)*pauVar1;
          fVar213 = *(float *)(*pauVar1 + 4);
          fVar217 = *(float *)(*pauVar1 + 8);
          fVar324 = *(float *)(*pauVar1 + 0xc);
          fVar210 = *(float *)(*pauVar1 + 0x10);
          fVar315 = *(float *)(*pauVar1 + 0x14);
          fVar278 = *(float *)(*pauVar1 + 0x18);
          auVar122 = *pauVar1;
          auVar18 = *(undefined1 (*) [32])(lVar13 + 0x2233094 + lVar132 * 4);
          auVar151 = ZEXT3264(auVar18);
          pfVar2 = (float *)(lVar13 + 0x2233518 + lVar132 * 4);
          fVar212 = *pfVar2;
          fVar274 = pfVar2[1];
          fVar287 = pfVar2[2];
          fVar289 = pfVar2[3];
          fVar215 = pfVar2[4];
          fVar275 = pfVar2[5];
          fVar290 = pfVar2[6];
          fVar307 = auVar18._0_4_;
          fVar310 = auVar18._4_4_;
          fVar311 = auVar18._8_4_;
          fVar312 = auVar18._12_4_;
          fVar313 = auVar18._16_4_;
          fVar314 = auVar18._20_4_;
          fVar316 = auVar18._24_4_;
          fVar266 = fVar252 + pfVar2[7];
          fVar194 = fVar252 + fVar252 + fVar238;
          local_900._0_4_ = auVar121._0_4_;
          local_900._4_4_ = auVar121._4_4_;
          fStack_8f8 = auVar121._8_4_;
          fStack_8f4 = auVar121._12_4_;
          fStack_8f0 = auVar121._16_4_;
          fStack_8ec = auVar121._20_4_;
          fStack_8e8 = (float)*(undefined8 *)
                               ((undefined1 (*) [24])(catmullrom_basis1 + lVar132 * 4 + lVar13))[1];
          auVar171._0_4_ =
               fVar153 * (float)local_900._0_4_ +
               (float)local_2a0._0_4_ * fVar208 +
               fVar214 * fVar307 + (float)local_560._0_4_ * fVar212;
          auVar171._4_4_ =
               fVar155 * (float)local_900._4_4_ +
               (float)local_2a0._4_4_ * fVar213 +
               fVar216 * fVar310 + (float)local_560._4_4_ * fVar274;
          auVar171._8_4_ =
               fVar157 * fStack_8f8 +
               fStack_298 * fVar217 + fVar218 * fVar311 + fStack_558 * fVar287;
          auVar171._12_4_ =
               fVar159 * fStack_8f4 +
               fStack_294 * fVar324 + fVar268 * fVar312 + fStack_554 * fVar289;
          auVar171._16_4_ =
               fVar219 * fStack_8f0 +
               fStack_290 * fVar210 + fVar272 * fVar313 + fStack_550 * fVar215;
          auVar171._20_4_ =
               fVar196 * fStack_8ec +
               fStack_28c * fVar315 + fVar277 * fVar314 + fStack_54c * fVar275;
          auVar171._24_4_ =
               fVar207 * fStack_8e8 +
               fStack_288 * fVar278 + fVar288 * fVar316 + fStack_548 * fVar290;
          auVar171._28_4_ = fVar266 + fVar194;
          auVar247._0_4_ =
               (float)local_4e0._0_4_ * (float)local_900._0_4_ +
               (float)local_80._0_4_ * fVar208 + fVar221 * fVar307 + fVar335 * fVar212;
          auVar247._4_4_ =
               (float)local_4e0._4_4_ * (float)local_900._4_4_ +
               (float)local_80._4_4_ * fVar213 + fVar233 * fVar310 + fVar338 * fVar274;
          auVar247._8_4_ =
               fStack_4d8 * fStack_8f8 + fStack_78 * fVar217 + fVar235 * fVar311 + fVar339 * fVar287
          ;
          auVar247._12_4_ =
               fStack_4d4 * fStack_8f4 + fStack_74 * fVar324 + fVar237 * fVar312 + fVar340 * fVar289
          ;
          auVar247._16_4_ =
               fStack_4d0 * fStack_8f0 + fStack_70 * fVar210 + fVar221 * fVar313 + fVar335 * fVar215
          ;
          auVar247._20_4_ =
               fStack_4cc * fStack_8ec + fStack_6c * fVar315 + fVar233 * fVar314 + fVar338 * fVar275
          ;
          auVar247._24_4_ =
               fStack_4c8 * fStack_8e8 + fStack_68 * fVar278 + fVar235 * fVar316 + fVar339 * fVar290
          ;
          auVar247._28_4_ = fVar194 + fVar252 + fVar252 + fVar340;
          auVar296._0_4_ =
               (float)local_a0._0_4_ * fVar208 +
               fVar307 * (float)local_480._0_4_ + fVar212 * (float)local_260._0_4_ +
               (float)local_900._0_4_ * (float)local_280._0_4_;
          auVar296._4_4_ =
               (float)local_a0._4_4_ * fVar213 +
               fVar310 * (float)local_480._4_4_ + fVar274 * (float)local_260._4_4_ +
               (float)local_900._4_4_ * (float)local_280._4_4_;
          auVar296._8_4_ =
               fStack_98 * fVar217 + fVar311 * fStack_478 + fVar287 * fStack_258 +
               fStack_8f8 * fStack_278;
          auVar296._12_4_ =
               fStack_94 * fVar324 + fVar312 * fStack_474 + fVar289 * fStack_254 +
               fStack_8f4 * fStack_274;
          auVar296._16_4_ =
               fStack_90 * fVar210 + fVar313 * fStack_470 + fVar215 * fStack_250 +
               fStack_8f0 * fStack_270;
          auVar296._20_4_ =
               fStack_8c * fVar315 + fVar314 * fStack_46c + fVar275 * fStack_24c +
               fStack_8ec * fStack_26c;
          auVar296._24_4_ =
               fStack_88 * fVar278 + fVar316 * fStack_468 + fVar290 * fStack_248 +
               fStack_8e8 * fStack_268;
          auVar296._28_4_ = fVar252 + fVar266 + fVar194;
          auVar19 = vsubps_avx(auVar171,auVar285);
          auVar20 = vsubps_avx(auVar247,auVar192);
          fVar278 = auVar19._0_4_;
          fVar238 = auVar19._4_4_;
          auVar57._4_4_ = fVar238 * auVar192._4_4_;
          auVar57._0_4_ = fVar278 * auVar192._0_4_;
          fVar276 = auVar19._8_4_;
          auVar57._8_4_ = fVar276 * auVar192._8_4_;
          fVar271 = auVar19._12_4_;
          auVar57._12_4_ = fVar271 * auVar192._12_4_;
          fVar273 = auVar19._16_4_;
          auVar57._16_4_ = fVar273 * auVar192._16_4_;
          fVar163 = auVar19._20_4_;
          auVar57._20_4_ = fVar163 * auVar192._20_4_;
          fVar164 = auVar19._24_4_;
          auVar57._24_4_ = fVar164 * auVar192._24_4_;
          auVar57._28_4_ = fVar194;
          fVar208 = auVar20._0_4_;
          fVar213 = auVar20._4_4_;
          auVar58._4_4_ = auVar285._4_4_ * fVar213;
          auVar58._0_4_ = auVar285._0_4_ * fVar208;
          fVar217 = auVar20._8_4_;
          auVar58._8_4_ = auVar285._8_4_ * fVar217;
          fVar252 = auVar20._12_4_;
          auVar58._12_4_ = auVar285._12_4_ * fVar252;
          fVar324 = auVar20._16_4_;
          auVar58._16_4_ = auVar285._16_4_ * fVar324;
          fVar210 = auVar20._20_4_;
          auVar58._20_4_ = auVar285._20_4_ * fVar210;
          fVar315 = auVar20._24_4_;
          auVar58._24_4_ = auVar285._24_4_ * fVar315;
          auVar58._28_4_ = auVar247._28_4_;
          auVar26 = vsubps_avx(auVar57,auVar58);
          auVar104._4_4_ = fVar152;
          auVar104._0_4_ = fVar135;
          auVar104._8_4_ = fVar154;
          auVar104._12_4_ = fVar156;
          auVar104._16_4_ = fVar158;
          auVar104._20_4_ = fVar160;
          auVar104._24_4_ = fVar161;
          auVar104._28_4_ = fVar162;
          auVar21 = vmaxps_avx(auVar104,auVar296);
          auVar59._4_4_ = auVar21._4_4_ * auVar21._4_4_ * (fVar238 * fVar238 + fVar213 * fVar213);
          auVar59._0_4_ = auVar21._0_4_ * auVar21._0_4_ * (fVar278 * fVar278 + fVar208 * fVar208);
          auVar59._8_4_ = auVar21._8_4_ * auVar21._8_4_ * (fVar276 * fVar276 + fVar217 * fVar217);
          auVar59._12_4_ = auVar21._12_4_ * auVar21._12_4_ * (fVar271 * fVar271 + fVar252 * fVar252)
          ;
          auVar59._16_4_ = auVar21._16_4_ * auVar21._16_4_ * (fVar273 * fVar273 + fVar324 * fVar324)
          ;
          auVar59._20_4_ = auVar21._20_4_ * auVar21._20_4_ * (fVar163 * fVar163 + fVar210 * fVar210)
          ;
          auVar59._24_4_ = auVar21._24_4_ * auVar21._24_4_ * (fVar164 * fVar164 + fVar315 * fVar315)
          ;
          auVar59._28_4_ = fVar266 + auVar247._28_4_;
          auVar60._4_4_ = auVar26._4_4_ * auVar26._4_4_;
          auVar60._0_4_ = auVar26._0_4_ * auVar26._0_4_;
          auVar60._8_4_ = auVar26._8_4_ * auVar26._8_4_;
          auVar60._12_4_ = auVar26._12_4_ * auVar26._12_4_;
          auVar60._16_4_ = auVar26._16_4_ * auVar26._16_4_;
          auVar60._20_4_ = auVar26._20_4_ * auVar26._20_4_;
          auVar60._24_4_ = auVar26._24_4_ * auVar26._24_4_;
          auVar60._28_4_ = auVar26._28_4_;
          auVar231 = ZEXT3264(auVar60);
          auVar21 = vcmpps_avx(auVar60,auVar59,2);
          local_3e0 = (uint)lVar132;
          auVar188 = vpshufd_avx(ZEXT416(local_3e0),0);
          auVar17 = vpor_avx(auVar188,_DAT_01ff0cf0);
          auVar188 = vpor_avx(auVar188,_DAT_02020ea0);
          auVar115._4_4_ = uStack_61c;
          auVar115._0_4_ = local_620;
          auVar115._8_4_ = uStack_618;
          auVar115._12_4_ = uStack_614;
          auVar17 = vpcmpgtd_avx(auVar115,auVar17);
          auVar188 = vpcmpgtd_avx(auVar115,auVar188);
          register0x00001250 = auVar188;
          _local_5c0 = auVar17;
          auVar26 = _local_5c0 & auVar21;
          if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar26 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar26 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar26 >> 0x7f,0) == '\0') &&
                (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar26 >> 0xbf,0) == '\0') &&
              (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar26[0x1f]) {
            auVar309 = ZEXT3264(auVar309._0_32_);
          }
          else {
            local_740._0_4_ = auVar122._0_4_;
            local_740._4_4_ = auVar122._4_4_;
            uStack_738._0_4_ = auVar122._8_4_;
            uStack_738._4_4_ = auVar122._12_4_;
            fStack_730 = auVar122._16_4_;
            fStack_72c = auVar122._20_4_;
            fStack_728 = auVar122._24_4_;
            local_640 = (float)local_900._0_4_ * fVar250 +
                        (float)local_4a0._0_4_ * (float)local_740._0_4_ +
                        (float)local_c0._0_4_ * fVar307 + fVar232 * fVar212;
            fStack_63c = (float)local_900._4_4_ * fVar211 +
                         (float)local_4a0._4_4_ * (float)local_740._4_4_ +
                         (float)local_c0._4_4_ * fVar310 + fVar249 * fVar274;
            fStack_638 = fStack_8f8 * fVar236 +
                         fStack_498 * (float)uStack_738 + fStack_b8 * fVar311 + fVar209 * fVar287;
            fStack_634 = fStack_8f4 * fVar251 +
                         fStack_494 * uStack_738._4_4_ + fStack_b4 * fVar312 + fVar234 * fVar289;
            fStack_630 = fStack_8f0 * fVar250 +
                         fStack_490 * fStack_730 + fStack_b0 * fVar313 + fVar232 * fVar215;
            fStack_62c = fStack_8ec * fVar211 +
                         fStack_48c * fStack_72c + fStack_ac * fVar314 + fVar249 * fVar275;
            fStack_628 = fStack_8e8 * fVar236 +
                         fStack_488 * fStack_728 + fStack_a8 * fVar316 + fVar209 * fVar290;
            fStack_624 = auVar296._28_4_ + auVar18._28_4_ + auVar188._12_4_ + 0.0;
            local_840._0_4_ = auVar119._0_4_;
            local_840._4_4_ = auVar119._4_4_;
            uStack_838._0_4_ = auVar119._8_4_;
            uStack_838._4_4_ = auVar119._12_4_;
            fStack_830 = auVar119._16_4_;
            fStack_82c = auVar119._20_4_;
            fStack_828 = auVar119._24_4_;
            local_700._0_4_ = auVar118._0_4_;
            local_700._4_4_ = auVar118._4_4_;
            uStack_6f8._0_4_ = auVar118._8_4_;
            uStack_6f8._4_4_ = auVar118._12_4_;
            fStack_6f0 = auVar118._16_4_;
            fStack_6ec = auVar118._20_4_;
            fStack_6e8 = auVar118._24_4_;
            fVar164 = (float)local_c0._0_4_ * (float)local_700._0_4_;
            fVar176 = (float)local_c0._4_4_ * (float)local_700._4_4_;
            fVar177 = fStack_b8 * (float)uStack_6f8;
            fVar178 = fStack_b4 * uStack_6f8._4_4_;
            fVar179 = fStack_b0 * fStack_6f0;
            fVar180 = fStack_ac * fStack_6ec;
            fVar181 = fStack_a8 * fStack_6e8;
            local_720._0_4_ = auVar117._0_4_;
            local_720._4_4_ = auVar117._4_4_;
            fStack_718 = auVar117._8_4_;
            fStack_714 = auVar117._12_4_;
            fStack_710 = auVar117._16_4_;
            fStack_70c = auVar117._20_4_;
            fStack_708 = auVar117._24_4_;
            fVar253 = fVar232 * (float)local_720._0_4_;
            fVar260 = fVar249 * (float)local_720._4_4_;
            fVar261 = fVar209 * fStack_718;
            fVar262 = fVar234 * fStack_714;
            fVar263 = fVar232 * fStack_710;
            fVar264 = fVar249 * fStack_70c;
            fVar265 = fVar209 * fStack_708;
            pfVar2 = (float *)(lVar13 + 0x2231e84 + lVar132 * 4);
            fVar307 = *pfVar2;
            fVar208 = pfVar2[1];
            fVar310 = pfVar2[2];
            fVar213 = pfVar2[3];
            fVar311 = pfVar2[4];
            fVar217 = pfVar2[5];
            fVar312 = pfVar2[6];
            pfVar3 = (float *)(lVar13 + 0x2232308 + lVar132 * 4);
            fVar252 = *pfVar3;
            fVar313 = pfVar3[1];
            fVar324 = pfVar3[2];
            fVar314 = pfVar3[3];
            fVar210 = pfVar3[4];
            fVar316 = pfVar3[5];
            fVar315 = pfVar3[6];
            pfVar4 = (float *)(lVar13 + 0x2231a00 + lVar132 * 4);
            fVar278 = *pfVar4;
            fVar212 = pfVar4[1];
            fVar274 = pfVar4[2];
            fVar287 = pfVar4[3];
            fVar289 = pfVar4[4];
            fVar215 = pfVar4[5];
            fVar275 = pfVar4[6];
            fVar163 = pfVar2[7] + pfVar3[7];
            fVar182 = pfVar3[7] + fStack_4c4 + 0.0;
            fVar267 = fStack_4c4 + local_4c0._28_4_ + fStack_4c4 + 0.0;
            pfVar2 = (float *)(lVar13 + 0x223157c + lVar132 * 4);
            fVar290 = *pfVar2;
            fVar194 = pfVar2[1];
            fVar266 = pfVar2[2];
            fVar238 = pfVar2[3];
            fVar276 = pfVar2[4];
            fVar271 = pfVar2[5];
            fVar273 = pfVar2[6];
            local_700._4_4_ =
                 fVar155 * fVar194 +
                 (float)local_2a0._4_4_ * fVar212 +
                 fVar216 * fVar208 + (float)local_560._4_4_ * fVar313;
            local_700._0_4_ =
                 fVar153 * fVar290 +
                 (float)local_2a0._0_4_ * fVar278 +
                 fVar214 * fVar307 + (float)local_560._0_4_ * fVar252;
            uStack_6f8._0_4_ =
                 fVar157 * fVar266 + fStack_298 * fVar274 + fVar218 * fVar310 + fStack_558 * fVar324
            ;
            uStack_6f8._4_4_ =
                 fVar159 * fVar238 + fStack_294 * fVar287 + fVar268 * fVar213 + fStack_554 * fVar314
            ;
            fStack_6f0 = fVar219 * fVar276 +
                         fStack_290 * fVar289 + fVar272 * fVar311 + fStack_550 * fVar210;
            fStack_6ec = fVar196 * fVar271 +
                         fStack_28c * fVar215 + fVar277 * fVar217 + fStack_54c * fVar316;
            fStack_6e8 = fVar207 * fVar273 +
                         fStack_288 * fVar275 + fVar288 * fVar312 + fStack_548 * fVar315;
            fStack_6e4 = fVar163 + fVar182;
            local_720._4_4_ =
                 fVar194 * (float)local_4e0._4_4_ +
                 fVar233 * fVar208 + fVar338 * fVar313 + (float)local_80._4_4_ * fVar212;
            local_720._0_4_ =
                 fVar290 * (float)local_4e0._0_4_ +
                 fVar221 * fVar307 + fVar335 * fVar252 + (float)local_80._0_4_ * fVar278;
            fStack_718 = fVar266 * fStack_4d8 +
                         fVar235 * fVar310 + fVar339 * fVar324 + fStack_78 * fVar274;
            fStack_714 = fVar238 * fStack_4d4 +
                         fVar237 * fVar213 + fVar340 * fVar314 + fStack_74 * fVar287;
            fStack_710 = fVar276 * fStack_4d0 +
                         fVar221 * fVar311 + fVar335 * fVar210 + fStack_70 * fVar289;
            fStack_70c = fVar271 * fStack_4cc +
                         fVar233 * fVar217 + fVar338 * fVar316 + fStack_6c * fVar215;
            fStack_708 = fVar273 * fStack_4c8 +
                         fVar235 * fVar312 + fVar339 * fVar315 + fStack_68 * fVar275;
            fStack_704 = fVar182 + fVar267;
            auVar326._0_4_ =
                 fVar278 * (float)local_4a0._0_4_ +
                 (float)local_c0._0_4_ * fVar307 + fVar232 * fVar252 + fVar290 * fVar250;
            auVar326._4_4_ =
                 fVar212 * (float)local_4a0._4_4_ +
                 (float)local_c0._4_4_ * fVar208 + fVar249 * fVar313 + fVar194 * fVar211;
            auVar326._8_4_ =
                 fVar274 * fStack_498 + fStack_b8 * fVar310 + fVar209 * fVar324 + fVar266 * fVar236;
            auVar326._12_4_ =
                 fVar287 * fStack_494 + fStack_b4 * fVar213 + fVar234 * fVar314 + fVar238 * fVar251;
            auVar326._16_4_ =
                 fVar289 * fStack_490 + fStack_b0 * fVar311 + fVar232 * fVar210 + fVar276 * fVar250;
            auVar326._20_4_ =
                 fVar215 * fStack_48c + fStack_ac * fVar217 + fVar249 * fVar316 + fVar271 * fVar211;
            auVar326._24_4_ =
                 fVar275 * fStack_488 + fStack_a8 * fVar312 + fVar209 * fVar315 + fVar273 * fVar236;
            auVar326._28_4_ = pfVar4[7] + fVar163 + fVar267;
            pfVar2 = (float *)(lVar13 + 0x22342a4 + lVar132 * 4);
            fVar208 = *pfVar2;
            fVar310 = pfVar2[1];
            fVar213 = pfVar2[2];
            fVar311 = pfVar2[3];
            fVar217 = pfVar2[4];
            fVar312 = pfVar2[5];
            fVar252 = pfVar2[6];
            pfVar3 = (float *)(lVar13 + 0x2234728 + lVar132 * 4);
            fVar313 = *pfVar3;
            fVar324 = pfVar3[1];
            fVar314 = pfVar3[2];
            fVar210 = pfVar3[3];
            fVar316 = pfVar3[4];
            fVar315 = pfVar3[5];
            fVar278 = pfVar3[6];
            fVar307 = auVar309._28_4_;
            pfVar4 = (float *)(lVar13 + 0x2233e20 + lVar132 * 4);
            fVar212 = *pfVar4;
            fVar274 = pfVar4[1];
            fVar287 = pfVar4[2];
            fVar289 = pfVar4[3];
            fVar215 = pfVar4[4];
            fVar275 = pfVar4[5];
            fVar290 = pfVar4[6];
            pfVar5 = (float *)(lVar13 + 0x223399c + lVar132 * 4);
            fVar194 = *pfVar5;
            fVar266 = pfVar5[1];
            fVar238 = pfVar5[2];
            fVar276 = pfVar5[3];
            fVar271 = pfVar5[4];
            fVar273 = pfVar5[5];
            fVar163 = pfVar5[6];
            auVar297._0_4_ =
                 fVar194 * fVar153 +
                 (float)local_2a0._0_4_ * fVar212 +
                 fVar214 * fVar208 + fVar313 * (float)local_560._0_4_;
            auVar297._4_4_ =
                 fVar266 * fVar155 +
                 (float)local_2a0._4_4_ * fVar274 +
                 fVar216 * fVar310 + fVar324 * (float)local_560._4_4_;
            auVar297._8_4_ =
                 fVar238 * fVar157 + fStack_298 * fVar287 + fVar218 * fVar213 + fVar314 * fStack_558
            ;
            auVar297._12_4_ =
                 fVar276 * fVar159 + fStack_294 * fVar289 + fVar268 * fVar311 + fVar210 * fStack_554
            ;
            auVar297._16_4_ =
                 fVar271 * fVar219 + fStack_290 * fVar215 + fVar272 * fVar217 + fVar316 * fStack_550
            ;
            auVar297._20_4_ =
                 fVar273 * fVar196 + fStack_28c * fVar275 + fVar277 * fVar312 + fVar315 * fStack_54c
            ;
            auVar297._24_4_ =
                 fVar163 * fVar207 + fStack_288 * fVar290 + fVar288 * fVar252 + fVar278 * fStack_548
            ;
            auVar297._28_4_ = fVar307 + fVar307 + local_4c0._28_4_ + fStack_544;
            auVar321._0_4_ =
                 fVar194 * (float)local_4e0._0_4_ +
                 fVar212 * (float)local_80._0_4_ + fVar221 * fVar208 + fVar313 * fVar335;
            auVar321._4_4_ =
                 fVar266 * (float)local_4e0._4_4_ +
                 fVar274 * (float)local_80._4_4_ + fVar233 * fVar310 + fVar324 * fVar338;
            auVar321._8_4_ =
                 fVar238 * fStack_4d8 + fVar287 * fStack_78 + fVar235 * fVar213 + fVar314 * fVar339;
            auVar321._12_4_ =
                 fVar276 * fStack_4d4 + fVar289 * fStack_74 + fVar237 * fVar311 + fVar210 * fVar340;
            auVar321._16_4_ =
                 fVar271 * fStack_4d0 + fVar215 * fStack_70 + fVar221 * fVar217 + fVar316 * fVar335;
            auVar321._20_4_ =
                 fVar273 * fStack_4cc + fVar275 * fStack_6c + fVar233 * fVar312 + fVar315 * fVar338;
            auVar321._24_4_ =
                 fVar163 * fStack_4c8 + fVar290 * fStack_68 + fVar235 * fVar252 + fVar278 * fVar339;
            auVar321._28_4_ = fVar307 + fVar307 + fStack_64 + fVar307;
            auVar248._8_4_ = 0x7fffffff;
            auVar248._0_8_ = 0x7fffffff7fffffff;
            auVar248._12_4_ = 0x7fffffff;
            auVar248._16_4_ = 0x7fffffff;
            auVar248._20_4_ = 0x7fffffff;
            auVar248._24_4_ = 0x7fffffff;
            auVar248._28_4_ = 0x7fffffff;
            auVar18 = vandps_avx(_local_700,auVar248);
            auVar26 = vandps_avx(_local_720,auVar248);
            auVar26 = vmaxps_avx(auVar18,auVar26);
            auVar18 = vandps_avx(auVar326,auVar248);
            auVar26 = vmaxps_avx(auVar26,auVar18);
            auVar26 = vcmpps_avx(auVar26,local_500,1);
            auVar15 = vblendvps_avx(_local_700,auVar19,auVar26);
            auVar146._0_4_ =
                 fVar194 * fVar250 +
                 fVar212 * (float)local_4a0._0_4_ +
                 fVar313 * fVar232 + (float)local_c0._0_4_ * fVar208;
            auVar146._4_4_ =
                 fVar266 * fVar211 +
                 fVar274 * (float)local_4a0._4_4_ +
                 fVar324 * fVar249 + (float)local_c0._4_4_ * fVar310;
            auVar146._8_4_ =
                 fVar238 * fVar236 + fVar287 * fStack_498 + fVar314 * fVar209 + fStack_b8 * fVar213;
            auVar146._12_4_ =
                 fVar276 * fVar251 + fVar289 * fStack_494 + fVar210 * fVar234 + fStack_b4 * fVar311;
            auVar146._16_4_ =
                 fVar271 * fVar250 + fVar215 * fStack_490 + fVar316 * fVar232 + fStack_b0 * fVar217;
            auVar146._20_4_ =
                 fVar273 * fVar211 + fVar275 * fStack_48c + fVar315 * fVar249 + fStack_ac * fVar312;
            auVar146._24_4_ =
                 fVar163 * fVar236 + fVar290 * fStack_488 + fVar278 * fVar209 + fStack_a8 * fVar252;
            auVar146._28_4_ = auVar18._28_4_ + pfVar4[7] + pfVar3[7] + pfVar2[7];
            auVar201 = vblendvps_avx(_local_720,auVar20,auVar26);
            auVar18 = vandps_avx(auVar297,auVar248);
            auVar26 = vandps_avx(auVar321,auVar248);
            auVar226 = vmaxps_avx(auVar18,auVar26);
            auVar18 = vandps_avx(auVar146,auVar248);
            auVar18 = vmaxps_avx(auVar226,auVar18);
            local_860._0_4_ = auVar120._0_4_;
            local_860._4_4_ = auVar120._4_4_;
            fStack_858 = auVar120._8_4_;
            fStack_854 = auVar120._12_4_;
            fStack_850 = auVar120._16_4_;
            fStack_84c = auVar120._20_4_;
            fStack_848 = auVar120._24_4_;
            auVar26 = vcmpps_avx(auVar18,local_500,1);
            auVar18 = vblendvps_avx(auVar297,auVar19,auVar26);
            auVar147._0_4_ =
                 fVar250 * (float)local_860._0_4_ +
                 (float)local_4a0._0_4_ * (float)local_840._0_4_ + fVar164 + fVar253;
            auVar147._4_4_ =
                 fVar211 * (float)local_860._4_4_ +
                 (float)local_4a0._4_4_ * (float)local_840._4_4_ + fVar176 + fVar260;
            auVar147._8_4_ =
                 fVar236 * fStack_858 + fStack_498 * (float)uStack_838 + fVar177 + fVar261;
            auVar147._12_4_ =
                 fVar251 * fStack_854 + fStack_494 * uStack_838._4_4_ + fVar178 + fVar262;
            auVar147._16_4_ = fVar250 * fStack_850 + fStack_490 * fStack_830 + fVar179 + fVar263;
            auVar147._20_4_ = fVar211 * fStack_84c + fStack_48c * fStack_82c + fVar180 + fVar264;
            auVar147._24_4_ = fVar236 * fStack_848 + fStack_488 * fStack_828 + fVar181 + fVar265;
            auVar147._28_4_ = auVar226._28_4_ + fStack_624 + auVar188._12_4_ + 0.0;
            auVar26 = vblendvps_avx(auVar321,auVar20,auVar26);
            fVar276 = auVar15._0_4_;
            fVar268 = auVar15._4_4_;
            fVar271 = auVar15._8_4_;
            fVar272 = auVar15._12_4_;
            fVar273 = auVar15._16_4_;
            fVar277 = auVar15._20_4_;
            fVar163 = auVar15._24_4_;
            fVar288 = auVar15._28_4_;
            fVar278 = auVar18._0_4_;
            fVar274 = auVar18._4_4_;
            fVar289 = auVar18._8_4_;
            fVar275 = auVar18._12_4_;
            fVar194 = auVar18._16_4_;
            fVar155 = auVar18._20_4_;
            fVar159 = auVar18._24_4_;
            fVar307 = auVar201._0_4_;
            fVar310 = auVar201._4_4_;
            fVar311 = auVar201._8_4_;
            fVar312 = auVar201._12_4_;
            fVar313 = auVar201._16_4_;
            fVar314 = auVar201._20_4_;
            fVar316 = auVar201._24_4_;
            auVar305._0_4_ = fVar307 * fVar307 + fVar276 * fVar276;
            auVar305._4_4_ = fVar310 * fVar310 + fVar268 * fVar268;
            auVar305._8_4_ = fVar311 * fVar311 + fVar271 * fVar271;
            auVar305._12_4_ = fVar312 * fVar312 + fVar272 * fVar272;
            auVar305._16_4_ = fVar313 * fVar313 + fVar273 * fVar273;
            auVar305._20_4_ = fVar314 * fVar314 + fVar277 * fVar277;
            auVar305._24_4_ = fVar316 * fVar316 + fVar163 * fVar163;
            auVar305._28_4_ = auVar19._28_4_ + auVar20._28_4_;
            auVar19 = vrsqrtps_avx(auVar305);
            fVar208 = auVar19._0_4_;
            fVar213 = auVar19._4_4_;
            auVar61._4_4_ = fVar213 * 1.5;
            auVar61._0_4_ = fVar208 * 1.5;
            fVar217 = auVar19._8_4_;
            auVar61._8_4_ = fVar217 * 1.5;
            fVar252 = auVar19._12_4_;
            auVar61._12_4_ = fVar252 * 1.5;
            fVar324 = auVar19._16_4_;
            auVar61._16_4_ = fVar324 * 1.5;
            fVar210 = auVar19._20_4_;
            auVar61._20_4_ = fVar210 * 1.5;
            fVar315 = auVar19._24_4_;
            auVar61._24_4_ = fVar315 * 1.5;
            auVar61._28_4_ = auVar321._28_4_;
            auVar62._4_4_ = fVar213 * fVar213 * fVar213 * auVar305._4_4_ * 0.5;
            auVar62._0_4_ = fVar208 * fVar208 * fVar208 * auVar305._0_4_ * 0.5;
            auVar62._8_4_ = fVar217 * fVar217 * fVar217 * auVar305._8_4_ * 0.5;
            auVar62._12_4_ = fVar252 * fVar252 * fVar252 * auVar305._12_4_ * 0.5;
            auVar62._16_4_ = fVar324 * fVar324 * fVar324 * auVar305._16_4_ * 0.5;
            auVar62._20_4_ = fVar210 * fVar210 * fVar210 * auVar305._20_4_ * 0.5;
            auVar62._24_4_ = fVar315 * fVar315 * fVar315 * auVar305._24_4_ * 0.5;
            auVar62._28_4_ = auVar305._28_4_;
            auVar20 = vsubps_avx(auVar61,auVar62);
            fVar196 = auVar20._0_4_;
            fVar207 = auVar20._4_4_;
            fVar266 = auVar20._8_4_;
            fVar238 = auVar20._12_4_;
            fVar214 = auVar20._16_4_;
            fVar216 = auVar20._20_4_;
            fVar218 = auVar20._24_4_;
            fVar208 = auVar26._0_4_;
            fVar213 = auVar26._4_4_;
            fVar217 = auVar26._8_4_;
            fVar252 = auVar26._12_4_;
            fVar324 = auVar26._16_4_;
            fVar210 = auVar26._20_4_;
            fVar315 = auVar26._24_4_;
            auVar286._0_4_ = fVar208 * fVar208 + fVar278 * fVar278;
            auVar286._4_4_ = fVar213 * fVar213 + fVar274 * fVar274;
            auVar286._8_4_ = fVar217 * fVar217 + fVar289 * fVar289;
            auVar286._12_4_ = fVar252 * fVar252 + fVar275 * fVar275;
            auVar286._16_4_ = fVar324 * fVar324 + fVar194 * fVar194;
            auVar286._20_4_ = fVar210 * fVar210 + fVar155 * fVar155;
            auVar286._24_4_ = fVar315 * fVar315 + fVar159 * fVar159;
            auVar286._28_4_ = auVar19._28_4_ + auVar18._28_4_;
            auVar18 = vrsqrtps_avx(auVar286);
            fVar212 = auVar18._0_4_;
            fVar287 = auVar18._4_4_;
            auVar63._4_4_ = fVar287 * 1.5;
            auVar63._0_4_ = fVar212 * 1.5;
            fVar215 = auVar18._8_4_;
            auVar63._8_4_ = fVar215 * 1.5;
            fVar290 = auVar18._12_4_;
            auVar63._12_4_ = fVar290 * 1.5;
            fVar153 = auVar18._16_4_;
            auVar63._16_4_ = fVar153 * 1.5;
            fVar157 = auVar18._20_4_;
            auVar63._20_4_ = fVar157 * 1.5;
            fVar219 = auVar18._24_4_;
            auVar63._24_4_ = fVar219 * 1.5;
            auVar63._28_4_ = auVar321._28_4_;
            auVar64._4_4_ = fVar287 * fVar287 * fVar287 * auVar286._4_4_ * 0.5;
            auVar64._0_4_ = fVar212 * fVar212 * fVar212 * auVar286._0_4_ * 0.5;
            auVar64._8_4_ = fVar215 * fVar215 * fVar215 * auVar286._8_4_ * 0.5;
            auVar64._12_4_ = fVar290 * fVar290 * fVar290 * auVar286._12_4_ * 0.5;
            auVar64._16_4_ = fVar153 * fVar153 * fVar153 * auVar286._16_4_ * 0.5;
            auVar64._20_4_ = fVar157 * fVar157 * fVar157 * auVar286._20_4_ * 0.5;
            auVar64._24_4_ = fVar219 * fVar219 * fVar219 * auVar286._24_4_ * 0.5;
            auVar64._28_4_ = auVar286._28_4_;
            auVar19 = vsubps_avx(auVar63,auVar64);
            fVar212 = auVar19._0_4_;
            fVar287 = auVar19._4_4_;
            fVar215 = auVar19._8_4_;
            fVar290 = auVar19._12_4_;
            fVar153 = auVar19._16_4_;
            fVar157 = auVar19._20_4_;
            fVar219 = auVar19._24_4_;
            fVar307 = fVar135 * fVar196 * fVar307;
            fVar310 = fVar152 * fVar207 * fVar310;
            auVar65._4_4_ = fVar310;
            auVar65._0_4_ = fVar307;
            fVar311 = fVar154 * fVar266 * fVar311;
            auVar65._8_4_ = fVar311;
            fVar312 = fVar156 * fVar238 * fVar312;
            auVar65._12_4_ = fVar312;
            fVar313 = fVar158 * fVar214 * fVar313;
            auVar65._16_4_ = fVar313;
            fVar314 = fVar160 * fVar216 * fVar314;
            auVar65._20_4_ = fVar314;
            fVar316 = fVar161 * fVar218 * fVar316;
            auVar65._24_4_ = fVar316;
            auVar65._28_4_ = auVar18._28_4_;
            local_860._4_4_ = fVar310 + auVar285._4_4_;
            local_860._0_4_ = fVar307 + auVar285._0_4_;
            fStack_858 = fVar311 + auVar285._8_4_;
            fStack_854 = fVar312 + auVar285._12_4_;
            fStack_850 = fVar313 + auVar285._16_4_;
            fStack_84c = fVar314 + auVar285._20_4_;
            fStack_848 = fVar316 + auVar285._24_4_;
            fStack_844 = auVar18._28_4_ + auVar285._28_4_;
            fVar307 = fVar135 * fVar196 * -fVar276;
            fVar310 = fVar152 * fVar207 * -fVar268;
            auVar66._4_4_ = fVar310;
            auVar66._0_4_ = fVar307;
            fVar311 = fVar154 * fVar266 * -fVar271;
            auVar66._8_4_ = fVar311;
            fVar312 = fVar156 * fVar238 * -fVar272;
            auVar66._12_4_ = fVar312;
            fVar313 = fVar158 * fVar214 * -fVar273;
            auVar66._16_4_ = fVar313;
            fVar314 = fVar160 * fVar216 * -fVar277;
            auVar66._20_4_ = fVar314;
            fVar316 = fVar161 * fVar218 * -fVar163;
            auVar66._24_4_ = fVar316;
            auVar66._28_4_ = -fVar288;
            local_840._4_4_ = auVar192._4_4_ + fVar310;
            local_840._0_4_ = auVar192._0_4_ + fVar307;
            uStack_838._0_4_ = auVar192._8_4_ + fVar311;
            uStack_838._4_4_ = auVar192._12_4_ + fVar312;
            fStack_830 = auVar192._16_4_ + fVar313;
            fStack_82c = auVar192._20_4_ + fVar314;
            fStack_828 = auVar192._24_4_ + fVar316;
            fStack_824 = auVar192._28_4_ + -fVar288;
            fVar307 = fVar196 * 0.0 * fVar135;
            fVar310 = fVar207 * 0.0 * fVar152;
            auVar67._4_4_ = fVar310;
            auVar67._0_4_ = fVar307;
            fVar311 = fVar266 * 0.0 * fVar154;
            auVar67._8_4_ = fVar311;
            fVar312 = fVar238 * 0.0 * fVar156;
            auVar67._12_4_ = fVar312;
            fVar313 = fVar214 * 0.0 * fVar158;
            auVar67._16_4_ = fVar313;
            fVar314 = fVar216 * 0.0 * fVar160;
            auVar67._20_4_ = fVar314;
            fVar316 = fVar218 * 0.0 * fVar161;
            auVar67._24_4_ = fVar316;
            auVar67._28_4_ = fVar288;
            auVar18 = vsubps_avx(auVar285,auVar65);
            auVar337._0_4_ = fVar307 + auVar147._0_4_;
            auVar337._4_4_ = fVar310 + auVar147._4_4_;
            auVar337._8_4_ = fVar311 + auVar147._8_4_;
            auVar337._12_4_ = fVar312 + auVar147._12_4_;
            auVar337._16_4_ = fVar313 + auVar147._16_4_;
            auVar337._20_4_ = fVar314 + auVar147._20_4_;
            auVar337._24_4_ = fVar316 + auVar147._24_4_;
            auVar337._28_4_ = fVar288 + auVar147._28_4_;
            fVar307 = auVar296._0_4_ * fVar212 * fVar208;
            fVar208 = auVar296._4_4_ * fVar287 * fVar213;
            auVar68._4_4_ = fVar208;
            auVar68._0_4_ = fVar307;
            fVar310 = auVar296._8_4_ * fVar215 * fVar217;
            auVar68._8_4_ = fVar310;
            fVar213 = auVar296._12_4_ * fVar290 * fVar252;
            auVar68._12_4_ = fVar213;
            fVar311 = auVar296._16_4_ * fVar153 * fVar324;
            auVar68._16_4_ = fVar311;
            fVar217 = auVar296._20_4_ * fVar157 * fVar210;
            auVar68._20_4_ = fVar217;
            fVar312 = auVar296._24_4_ * fVar219 * fVar315;
            auVar68._24_4_ = fVar312;
            auVar68._28_4_ = fVar162;
            auVar22 = vsubps_avx(auVar192,auVar66);
            auVar327._0_4_ = auVar171._0_4_ + fVar307;
            auVar327._4_4_ = auVar171._4_4_ + fVar208;
            auVar327._8_4_ = auVar171._8_4_ + fVar310;
            auVar327._12_4_ = auVar171._12_4_ + fVar213;
            auVar327._16_4_ = auVar171._16_4_ + fVar311;
            auVar327._20_4_ = auVar171._20_4_ + fVar217;
            auVar327._24_4_ = auVar171._24_4_ + fVar312;
            auVar327._28_4_ = auVar171._28_4_ + fVar162;
            fVar307 = fVar212 * -fVar278 * auVar296._0_4_;
            fVar208 = fVar287 * -fVar274 * auVar296._4_4_;
            auVar69._4_4_ = fVar208;
            auVar69._0_4_ = fVar307;
            fVar310 = fVar215 * -fVar289 * auVar296._8_4_;
            auVar69._8_4_ = fVar310;
            fVar213 = fVar290 * -fVar275 * auVar296._12_4_;
            auVar69._12_4_ = fVar213;
            fVar311 = fVar153 * -fVar194 * auVar296._16_4_;
            auVar69._16_4_ = fVar311;
            fVar217 = fVar157 * -fVar155 * auVar296._20_4_;
            auVar69._20_4_ = fVar217;
            fVar312 = fVar219 * -fVar159 * auVar296._24_4_;
            auVar69._24_4_ = fVar312;
            auVar69._28_4_ = auVar285._28_4_;
            auVar23 = vsubps_avx(auVar147,auVar67);
            auVar229._0_4_ = auVar247._0_4_ + fVar307;
            auVar229._4_4_ = auVar247._4_4_ + fVar208;
            auVar229._8_4_ = auVar247._8_4_ + fVar310;
            auVar229._12_4_ = auVar247._12_4_ + fVar213;
            auVar229._16_4_ = auVar247._16_4_ + fVar311;
            auVar229._20_4_ = auVar247._20_4_ + fVar217;
            auVar229._24_4_ = auVar247._24_4_ + fVar312;
            auVar229._28_4_ = auVar247._28_4_ + auVar285._28_4_;
            fVar307 = fVar212 * 0.0 * auVar296._0_4_;
            fVar208 = fVar287 * 0.0 * auVar296._4_4_;
            auVar70._4_4_ = fVar208;
            auVar70._0_4_ = fVar307;
            fVar310 = fVar215 * 0.0 * auVar296._8_4_;
            auVar70._8_4_ = fVar310;
            fVar213 = fVar290 * 0.0 * auVar296._12_4_;
            auVar70._12_4_ = fVar213;
            fVar311 = fVar153 * 0.0 * auVar296._16_4_;
            auVar70._16_4_ = fVar311;
            fVar217 = fVar157 * 0.0 * auVar296._20_4_;
            auVar70._20_4_ = fVar217;
            fVar312 = fVar219 * 0.0 * auVar296._24_4_;
            auVar70._24_4_ = fVar312;
            auVar70._28_4_ = auVar147._28_4_;
            auVar20 = vsubps_avx(auVar171,auVar68);
            auVar114._4_4_ = fStack_63c;
            auVar114._0_4_ = local_640;
            auVar114._8_4_ = fStack_638;
            auVar114._12_4_ = fStack_634;
            auVar114._16_4_ = fStack_630;
            auVar114._20_4_ = fStack_62c;
            auVar114._24_4_ = fStack_628;
            auVar114._28_4_ = fStack_624;
            auVar298._0_4_ = local_640 + fVar307;
            auVar298._4_4_ = fStack_63c + fVar208;
            auVar298._8_4_ = fStack_638 + fVar310;
            auVar298._12_4_ = fStack_634 + fVar213;
            auVar298._16_4_ = fStack_630 + fVar311;
            auVar298._20_4_ = fStack_62c + fVar217;
            auVar298._24_4_ = fStack_628 + fVar312;
            auVar298._28_4_ = fStack_624 + auVar147._28_4_;
            auVar26 = vsubps_avx(auVar247,auVar69);
            auVar15 = vsubps_avx(auVar114,auVar70);
            auVar201 = vsubps_avx(auVar229,auVar22);
            auVar226 = vsubps_avx(auVar298,auVar23);
            auVar71._4_4_ = auVar23._4_4_ * auVar201._4_4_;
            auVar71._0_4_ = auVar23._0_4_ * auVar201._0_4_;
            auVar71._8_4_ = auVar23._8_4_ * auVar201._8_4_;
            auVar71._12_4_ = auVar23._12_4_ * auVar201._12_4_;
            auVar71._16_4_ = auVar23._16_4_ * auVar201._16_4_;
            auVar71._20_4_ = auVar23._20_4_ * auVar201._20_4_;
            auVar71._24_4_ = auVar23._24_4_ * auVar201._24_4_;
            auVar71._28_4_ = auVar321._28_4_;
            auVar72._4_4_ = auVar22._4_4_ * auVar226._4_4_;
            auVar72._0_4_ = auVar22._0_4_ * auVar226._0_4_;
            auVar72._8_4_ = auVar22._8_4_ * auVar226._8_4_;
            auVar72._12_4_ = auVar22._12_4_ * auVar226._12_4_;
            auVar72._16_4_ = auVar22._16_4_ * auVar226._16_4_;
            auVar72._20_4_ = auVar22._20_4_ * auVar226._20_4_;
            auVar72._24_4_ = auVar22._24_4_ * auVar226._24_4_;
            auVar72._28_4_ = auVar247._28_4_;
            auVar284 = vsubps_avx(auVar72,auVar71);
            auVar73._4_4_ = auVar18._4_4_ * auVar226._4_4_;
            auVar73._0_4_ = auVar18._0_4_ * auVar226._0_4_;
            auVar73._8_4_ = auVar18._8_4_ * auVar226._8_4_;
            auVar73._12_4_ = auVar18._12_4_ * auVar226._12_4_;
            auVar73._16_4_ = auVar18._16_4_ * auVar226._16_4_;
            auVar73._20_4_ = auVar18._20_4_ * auVar226._20_4_;
            auVar73._24_4_ = auVar18._24_4_ * auVar226._24_4_;
            auVar73._28_4_ = auVar226._28_4_;
            auVar226 = vsubps_avx(auVar327,auVar18);
            auVar74._4_4_ = auVar23._4_4_ * auVar226._4_4_;
            auVar74._0_4_ = auVar23._0_4_ * auVar226._0_4_;
            auVar74._8_4_ = auVar23._8_4_ * auVar226._8_4_;
            auVar74._12_4_ = auVar23._12_4_ * auVar226._12_4_;
            auVar74._16_4_ = auVar23._16_4_ * auVar226._16_4_;
            auVar74._20_4_ = auVar23._20_4_ * auVar226._20_4_;
            auVar74._24_4_ = auVar23._24_4_ * auVar226._24_4_;
            auVar74._28_4_ = auVar19._28_4_;
            auVar293 = vsubps_avx(auVar74,auVar73);
            auVar75._4_4_ = auVar22._4_4_ * auVar226._4_4_;
            auVar75._0_4_ = auVar22._0_4_ * auVar226._0_4_;
            auVar75._8_4_ = auVar22._8_4_ * auVar226._8_4_;
            auVar75._12_4_ = auVar22._12_4_ * auVar226._12_4_;
            auVar75._16_4_ = auVar22._16_4_ * auVar226._16_4_;
            auVar75._20_4_ = auVar22._20_4_ * auVar226._20_4_;
            auVar75._24_4_ = auVar22._24_4_ * auVar226._24_4_;
            auVar75._28_4_ = auVar19._28_4_;
            auVar76._4_4_ = auVar18._4_4_ * auVar201._4_4_;
            auVar76._0_4_ = auVar18._0_4_ * auVar201._0_4_;
            auVar76._8_4_ = auVar18._8_4_ * auVar201._8_4_;
            auVar76._12_4_ = auVar18._12_4_ * auVar201._12_4_;
            auVar76._16_4_ = auVar18._16_4_ * auVar201._16_4_;
            auVar76._20_4_ = auVar18._20_4_ * auVar201._20_4_;
            auVar76._24_4_ = auVar18._24_4_ * auVar201._24_4_;
            auVar76._28_4_ = auVar201._28_4_;
            auVar19 = vsubps_avx(auVar76,auVar75);
            auVar172._0_4_ = auVar284._0_4_ * 0.0 + auVar19._0_4_ + auVar293._0_4_ * 0.0;
            auVar172._4_4_ = auVar284._4_4_ * 0.0 + auVar19._4_4_ + auVar293._4_4_ * 0.0;
            auVar172._8_4_ = auVar284._8_4_ * 0.0 + auVar19._8_4_ + auVar293._8_4_ * 0.0;
            auVar172._12_4_ = auVar284._12_4_ * 0.0 + auVar19._12_4_ + auVar293._12_4_ * 0.0;
            auVar172._16_4_ = auVar284._16_4_ * 0.0 + auVar19._16_4_ + auVar293._16_4_ * 0.0;
            auVar172._20_4_ = auVar284._20_4_ * 0.0 + auVar19._20_4_ + auVar293._20_4_ * 0.0;
            auVar172._24_4_ = auVar284._24_4_ * 0.0 + auVar19._24_4_ + auVar293._24_4_ * 0.0;
            auVar172._28_4_ = auVar284._28_4_ + auVar19._28_4_ + auVar293._28_4_;
            auVar318 = vcmpps_avx(auVar172,ZEXT832(0) << 0x20,2);
            auVar19 = vblendvps_avx(auVar20,_local_860,auVar318);
            auVar205 = ZEXT3264(auVar19);
            auVar20 = vblendvps_avx(auVar26,_local_840,auVar318);
            auVar26 = vblendvps_avx(auVar15,auVar337,auVar318);
            auVar15 = vblendvps_avx(auVar18,auVar327,auVar318);
            auVar201 = vblendvps_avx(auVar22,auVar229,auVar318);
            auVar226 = vblendvps_avx(auVar23,auVar298,auVar318);
            auVar284 = vblendvps_avx(auVar327,auVar18,auVar318);
            auVar293 = vblendvps_avx(auVar229,auVar22,auVar318);
            auVar308 = vblendvps_avx(auVar298,auVar23,auVar318);
            auVar18 = vandps_avx(_local_5c0,auVar21);
            auVar284 = vsubps_avx(auVar284,auVar19);
            auVar24 = vsubps_avx(auVar293,auVar20);
            auVar308 = vsubps_avx(auVar308,auVar26);
            auVar21 = vsubps_avx(auVar20,auVar201);
            fVar307 = auVar24._0_4_;
            fVar181 = auVar26._0_4_;
            fVar252 = auVar24._4_4_;
            fVar182 = auVar26._4_4_;
            auVar77._4_4_ = fVar182 * fVar252;
            auVar77._0_4_ = fVar181 * fVar307;
            fVar278 = auVar24._8_4_;
            fVar253 = auVar26._8_4_;
            auVar77._8_4_ = fVar253 * fVar278;
            fVar290 = auVar24._12_4_;
            fVar260 = auVar26._12_4_;
            auVar77._12_4_ = fVar260 * fVar290;
            fVar196 = auVar24._16_4_;
            fVar261 = auVar26._16_4_;
            auVar77._16_4_ = fVar261 * fVar196;
            fVar276 = auVar24._20_4_;
            fVar262 = auVar26._20_4_;
            auVar77._20_4_ = fVar262 * fVar276;
            fVar288 = auVar24._24_4_;
            fVar263 = auVar26._24_4_;
            auVar77._24_4_ = fVar263 * fVar288;
            auVar77._28_4_ = auVar293._28_4_;
            fVar208 = auVar20._0_4_;
            fVar264 = auVar308._0_4_;
            fVar313 = auVar20._4_4_;
            fVar265 = auVar308._4_4_;
            auVar78._4_4_ = fVar265 * fVar313;
            auVar78._0_4_ = fVar264 * fVar208;
            fVar212 = auVar20._8_4_;
            fVar267 = auVar308._8_4_;
            auVar78._8_4_ = fVar267 * fVar212;
            fVar194 = auVar20._12_4_;
            fVar299 = auVar308._12_4_;
            auVar78._12_4_ = fVar299 * fVar194;
            fVar207 = auVar20._16_4_;
            fVar300 = auVar308._16_4_;
            auVar78._16_4_ = fVar300 * fVar207;
            fVar268 = auVar20._20_4_;
            fVar301 = auVar308._20_4_;
            auVar78._20_4_ = fVar301 * fVar268;
            fVar164 = auVar20._24_4_;
            fVar302 = auVar308._24_4_;
            uVar8 = auVar22._28_4_;
            auVar78._24_4_ = fVar302 * fVar164;
            auVar78._28_4_ = uVar8;
            auVar293 = vsubps_avx(auVar78,auVar77);
            fVar310 = auVar19._0_4_;
            fVar324 = auVar19._4_4_;
            auVar79._4_4_ = fVar265 * fVar324;
            auVar79._0_4_ = fVar264 * fVar310;
            fVar274 = auVar19._8_4_;
            auVar79._8_4_ = fVar267 * fVar274;
            fVar153 = auVar19._12_4_;
            auVar79._12_4_ = fVar299 * fVar153;
            fVar266 = auVar19._16_4_;
            auVar79._16_4_ = fVar300 * fVar266;
            fVar271 = auVar19._20_4_;
            auVar79._20_4_ = fVar301 * fVar271;
            fVar176 = auVar19._24_4_;
            auVar79._24_4_ = fVar302 * fVar176;
            auVar79._28_4_ = uVar8;
            fVar213 = auVar284._0_4_;
            fVar314 = auVar284._4_4_;
            auVar80._4_4_ = fVar182 * fVar314;
            auVar80._0_4_ = fVar181 * fVar213;
            fVar287 = auVar284._8_4_;
            auVar80._8_4_ = fVar253 * fVar287;
            fVar155 = auVar284._12_4_;
            auVar80._12_4_ = fVar260 * fVar155;
            fVar238 = auVar284._16_4_;
            auVar80._16_4_ = fVar261 * fVar238;
            fVar272 = auVar284._20_4_;
            auVar80._20_4_ = fVar262 * fVar272;
            fVar177 = auVar284._24_4_;
            auVar80._24_4_ = fVar263 * fVar177;
            auVar80._28_4_ = auVar327._28_4_;
            auVar22 = vsubps_avx(auVar80,auVar79);
            auVar81._4_4_ = fVar313 * fVar314;
            auVar81._0_4_ = fVar208 * fVar213;
            auVar81._8_4_ = fVar212 * fVar287;
            auVar81._12_4_ = fVar194 * fVar155;
            auVar81._16_4_ = fVar207 * fVar238;
            auVar81._20_4_ = fVar268 * fVar272;
            auVar81._24_4_ = fVar164 * fVar177;
            auVar81._28_4_ = uVar8;
            auVar82._4_4_ = fVar324 * fVar252;
            auVar82._0_4_ = fVar310 * fVar307;
            auVar82._8_4_ = fVar274 * fVar278;
            auVar82._12_4_ = fVar153 * fVar290;
            auVar82._16_4_ = fVar266 * fVar196;
            auVar82._20_4_ = fVar271 * fVar276;
            auVar82._24_4_ = fVar176 * fVar288;
            auVar82._28_4_ = auVar23._28_4_;
            auVar23 = vsubps_avx(auVar82,auVar81);
            auVar25 = vsubps_avx(auVar26,auVar226);
            fVar217 = auVar23._28_4_ + auVar22._28_4_;
            auVar306._0_4_ = auVar23._0_4_ + auVar22._0_4_ * 0.0 + auVar293._0_4_ * 0.0;
            auVar306._4_4_ = auVar23._4_4_ + auVar22._4_4_ * 0.0 + auVar293._4_4_ * 0.0;
            auVar306._8_4_ = auVar23._8_4_ + auVar22._8_4_ * 0.0 + auVar293._8_4_ * 0.0;
            auVar306._12_4_ = auVar23._12_4_ + auVar22._12_4_ * 0.0 + auVar293._12_4_ * 0.0;
            auVar306._16_4_ = auVar23._16_4_ + auVar22._16_4_ * 0.0 + auVar293._16_4_ * 0.0;
            auVar306._20_4_ = auVar23._20_4_ + auVar22._20_4_ * 0.0 + auVar293._20_4_ * 0.0;
            auVar306._24_4_ = auVar23._24_4_ + auVar22._24_4_ * 0.0 + auVar293._24_4_ * 0.0;
            auVar306._28_4_ = fVar217 + auVar293._28_4_;
            fVar311 = auVar21._0_4_;
            fVar210 = auVar21._4_4_;
            auVar83._4_4_ = auVar226._4_4_ * fVar210;
            auVar83._0_4_ = auVar226._0_4_ * fVar311;
            fVar289 = auVar21._8_4_;
            auVar83._8_4_ = auVar226._8_4_ * fVar289;
            fVar157 = auVar21._12_4_;
            auVar83._12_4_ = auVar226._12_4_ * fVar157;
            fVar214 = auVar21._16_4_;
            auVar83._16_4_ = auVar226._16_4_ * fVar214;
            fVar273 = auVar21._20_4_;
            auVar83._20_4_ = auVar226._20_4_ * fVar273;
            fVar178 = auVar21._24_4_;
            auVar83._24_4_ = auVar226._24_4_ * fVar178;
            auVar83._28_4_ = fVar217;
            fVar217 = auVar25._0_4_;
            fVar316 = auVar25._4_4_;
            auVar84._4_4_ = auVar201._4_4_ * fVar316;
            auVar84._0_4_ = auVar201._0_4_ * fVar217;
            fVar215 = auVar25._8_4_;
            auVar84._8_4_ = auVar201._8_4_ * fVar215;
            fVar159 = auVar25._12_4_;
            auVar84._12_4_ = auVar201._12_4_ * fVar159;
            fVar216 = auVar25._16_4_;
            auVar84._16_4_ = auVar201._16_4_ * fVar216;
            fVar277 = auVar25._20_4_;
            auVar84._20_4_ = auVar201._20_4_ * fVar277;
            fVar179 = auVar25._24_4_;
            auVar84._24_4_ = auVar201._24_4_ * fVar179;
            auVar84._28_4_ = auVar23._28_4_;
            auVar21 = vsubps_avx(auVar84,auVar83);
            auVar22 = vsubps_avx(auVar19,auVar15);
            fVar312 = auVar22._0_4_;
            fVar315 = auVar22._4_4_;
            auVar85._4_4_ = auVar226._4_4_ * fVar315;
            auVar85._0_4_ = auVar226._0_4_ * fVar312;
            fVar275 = auVar22._8_4_;
            auVar85._8_4_ = auVar226._8_4_ * fVar275;
            fVar219 = auVar22._12_4_;
            auVar85._12_4_ = auVar226._12_4_ * fVar219;
            fVar218 = auVar22._16_4_;
            auVar85._16_4_ = auVar226._16_4_ * fVar218;
            fVar163 = auVar22._20_4_;
            auVar85._20_4_ = auVar226._20_4_ * fVar163;
            fVar180 = auVar22._24_4_;
            auVar85._24_4_ = auVar226._24_4_ * fVar180;
            auVar85._28_4_ = auVar226._28_4_;
            auVar86._4_4_ = fVar316 * auVar15._4_4_;
            auVar86._0_4_ = fVar217 * auVar15._0_4_;
            auVar86._8_4_ = fVar215 * auVar15._8_4_;
            auVar86._12_4_ = fVar159 * auVar15._12_4_;
            auVar86._16_4_ = fVar216 * auVar15._16_4_;
            auVar86._20_4_ = fVar277 * auVar15._20_4_;
            auVar86._24_4_ = fVar179 * auVar15._24_4_;
            auVar86._28_4_ = auVar293._28_4_;
            auVar226 = vsubps_avx(auVar85,auVar86);
            auVar87._4_4_ = auVar201._4_4_ * fVar315;
            auVar87._0_4_ = auVar201._0_4_ * fVar312;
            auVar87._8_4_ = auVar201._8_4_ * fVar275;
            auVar87._12_4_ = auVar201._12_4_ * fVar219;
            auVar87._16_4_ = auVar201._16_4_ * fVar218;
            auVar87._20_4_ = auVar201._20_4_ * fVar163;
            auVar87._24_4_ = auVar201._24_4_ * fVar180;
            auVar87._28_4_ = auVar201._28_4_;
            auVar88._4_4_ = fVar210 * auVar15._4_4_;
            auVar88._0_4_ = fVar311 * auVar15._0_4_;
            auVar88._8_4_ = fVar289 * auVar15._8_4_;
            auVar88._12_4_ = fVar157 * auVar15._12_4_;
            auVar88._16_4_ = fVar214 * auVar15._16_4_;
            auVar88._20_4_ = fVar273 * auVar15._20_4_;
            auVar88._24_4_ = fVar178 * auVar15._24_4_;
            auVar88._28_4_ = auVar15._28_4_;
            auVar15 = vsubps_avx(auVar88,auVar87);
            auVar148._0_4_ = auVar21._0_4_ * 0.0 + auVar15._0_4_ + auVar226._0_4_ * 0.0;
            auVar148._4_4_ = auVar21._4_4_ * 0.0 + auVar15._4_4_ + auVar226._4_4_ * 0.0;
            auVar148._8_4_ = auVar21._8_4_ * 0.0 + auVar15._8_4_ + auVar226._8_4_ * 0.0;
            auVar148._12_4_ = auVar21._12_4_ * 0.0 + auVar15._12_4_ + auVar226._12_4_ * 0.0;
            auVar148._16_4_ = auVar21._16_4_ * 0.0 + auVar15._16_4_ + auVar226._16_4_ * 0.0;
            auVar148._20_4_ = auVar21._20_4_ * 0.0 + auVar15._20_4_ + auVar226._20_4_ * 0.0;
            auVar148._24_4_ = auVar21._24_4_ * 0.0 + auVar15._24_4_ + auVar226._24_4_ * 0.0;
            auVar148._28_4_ = auVar226._28_4_ + auVar15._28_4_ + auVar226._28_4_;
            auVar151 = ZEXT3264(auVar148);
            auVar21 = vmaxps_avx(auVar306,auVar148);
            auVar21 = vcmpps_avx(auVar21,ZEXT1232(ZEXT412(0)) << 0x20,2);
            auVar231 = ZEXT3264(auVar18);
            auVar15 = auVar18 & auVar21;
            if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar15 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar15 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar15 >> 0x7f,0) == '\0') &&
                  (auVar15 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar15 >> 0xbf,0) == '\0') &&
                (auVar15 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar15[0x1f]) {
LAB_00f6562c:
              auVar174._8_8_ = uStack_5d8;
              auVar174._0_8_ = local_5e0;
              auVar174._16_8_ = uStack_5d0;
              auVar174._24_8_ = uStack_5c8;
              auVar323._4_4_ = fVar152;
              auVar323._0_4_ = fVar135;
              auVar323._8_4_ = fVar154;
              auVar323._12_4_ = fVar156;
              auVar323._16_4_ = fVar158;
              auVar323._20_4_ = fVar160;
              auVar323._24_4_ = fVar161;
              auVar323._28_4_ = fVar162;
            }
            else {
              auVar15 = vandps_avx(auVar21,auVar18);
              auVar89._4_4_ = fVar316 * fVar252;
              auVar89._0_4_ = fVar217 * fVar307;
              auVar89._8_4_ = fVar215 * fVar278;
              auVar89._12_4_ = fVar159 * fVar290;
              auVar89._16_4_ = fVar216 * fVar196;
              auVar89._20_4_ = fVar277 * fVar276;
              auVar89._24_4_ = fVar179 * fVar288;
              auVar89._28_4_ = auVar18._28_4_;
              auVar90._4_4_ = fVar210 * fVar265;
              auVar90._0_4_ = fVar311 * fVar264;
              auVar90._8_4_ = fVar289 * fVar267;
              auVar90._12_4_ = fVar157 * fVar299;
              auVar90._16_4_ = fVar214 * fVar300;
              auVar90._20_4_ = fVar273 * fVar301;
              auVar90._24_4_ = fVar178 * fVar302;
              auVar90._28_4_ = auVar21._28_4_;
              auVar21 = vsubps_avx(auVar90,auVar89);
              auVar91._4_4_ = fVar315 * fVar265;
              auVar91._0_4_ = fVar312 * fVar264;
              auVar91._8_4_ = fVar275 * fVar267;
              auVar91._12_4_ = fVar219 * fVar299;
              auVar91._16_4_ = fVar218 * fVar300;
              auVar91._20_4_ = fVar163 * fVar301;
              auVar91._24_4_ = fVar180 * fVar302;
              auVar91._28_4_ = auVar308._28_4_;
              auVar92._4_4_ = fVar316 * fVar314;
              auVar92._0_4_ = fVar217 * fVar213;
              auVar92._8_4_ = fVar215 * fVar287;
              auVar92._12_4_ = fVar159 * fVar155;
              auVar92._16_4_ = fVar216 * fVar238;
              auVar92._20_4_ = fVar277 * fVar272;
              auVar92._24_4_ = fVar179 * fVar177;
              auVar92._28_4_ = auVar25._28_4_;
              auVar201 = vsubps_avx(auVar92,auVar91);
              auVar93._4_4_ = fVar210 * fVar314;
              auVar93._0_4_ = fVar311 * fVar213;
              auVar93._8_4_ = fVar289 * fVar287;
              auVar93._12_4_ = fVar157 * fVar155;
              auVar93._16_4_ = fVar214 * fVar238;
              auVar93._20_4_ = fVar273 * fVar272;
              auVar93._24_4_ = fVar178 * fVar177;
              auVar93._28_4_ = auVar284._28_4_;
              auVar94._4_4_ = fVar315 * fVar252;
              auVar94._0_4_ = fVar312 * fVar307;
              auVar94._8_4_ = fVar275 * fVar278;
              auVar94._12_4_ = fVar219 * fVar290;
              auVar94._16_4_ = fVar218 * fVar196;
              auVar94._20_4_ = fVar163 * fVar276;
              auVar94._24_4_ = fVar180 * fVar288;
              auVar94._28_4_ = auVar24._28_4_;
              auVar226 = vsubps_avx(auVar94,auVar93);
              auVar173._0_4_ = auVar21._0_4_ * 0.0 + auVar226._0_4_ + auVar201._0_4_ * 0.0;
              auVar173._4_4_ = auVar21._4_4_ * 0.0 + auVar226._4_4_ + auVar201._4_4_ * 0.0;
              auVar173._8_4_ = auVar21._8_4_ * 0.0 + auVar226._8_4_ + auVar201._8_4_ * 0.0;
              auVar173._12_4_ = auVar21._12_4_ * 0.0 + auVar226._12_4_ + auVar201._12_4_ * 0.0;
              auVar173._16_4_ = auVar21._16_4_ * 0.0 + auVar226._16_4_ + auVar201._16_4_ * 0.0;
              auVar173._20_4_ = auVar21._20_4_ * 0.0 + auVar226._20_4_ + auVar201._20_4_ * 0.0;
              auVar173._24_4_ = auVar21._24_4_ * 0.0 + auVar226._24_4_ + auVar201._24_4_ * 0.0;
              auVar173._28_4_ = auVar24._28_4_ + auVar226._28_4_ + auVar284._28_4_;
              auVar18 = vrcpps_avx(auVar173);
              fVar307 = auVar18._0_4_;
              fVar213 = auVar18._4_4_;
              auVar95._4_4_ = auVar173._4_4_ * fVar213;
              auVar95._0_4_ = auVar173._0_4_ * fVar307;
              fVar311 = auVar18._8_4_;
              auVar95._8_4_ = auVar173._8_4_ * fVar311;
              fVar217 = auVar18._12_4_;
              auVar95._12_4_ = auVar173._12_4_ * fVar217;
              fVar312 = auVar18._16_4_;
              auVar95._16_4_ = auVar173._16_4_ * fVar312;
              fVar252 = auVar18._20_4_;
              auVar95._20_4_ = auVar173._20_4_ * fVar252;
              fVar314 = auVar18._24_4_;
              auVar95._24_4_ = auVar173._24_4_ * fVar314;
              auVar95._28_4_ = auVar25._28_4_;
              auVar322._8_4_ = 0x3f800000;
              auVar322._0_8_ = &DAT_3f8000003f800000;
              auVar322._12_4_ = 0x3f800000;
              auVar322._16_4_ = 0x3f800000;
              auVar322._20_4_ = 0x3f800000;
              auVar322._24_4_ = 0x3f800000;
              auVar322._28_4_ = 0x3f800000;
              auVar18 = vsubps_avx(auVar322,auVar95);
              fVar307 = auVar18._0_4_ * fVar307 + fVar307;
              fVar213 = auVar18._4_4_ * fVar213 + fVar213;
              fVar311 = auVar18._8_4_ * fVar311 + fVar311;
              fVar217 = auVar18._12_4_ * fVar217 + fVar217;
              fVar312 = auVar18._16_4_ * fVar312 + fVar312;
              fVar252 = auVar18._20_4_ * fVar252 + fVar252;
              fVar314 = auVar18._24_4_ * fVar314 + fVar314;
              auVar96._4_4_ =
                   (fVar324 * auVar21._4_4_ + auVar201._4_4_ * fVar313 + auVar226._4_4_ * fVar182) *
                   fVar213;
              auVar96._0_4_ =
                   (fVar310 * auVar21._0_4_ + auVar201._0_4_ * fVar208 + auVar226._0_4_ * fVar181) *
                   fVar307;
              auVar96._8_4_ =
                   (fVar274 * auVar21._8_4_ + auVar201._8_4_ * fVar212 + auVar226._8_4_ * fVar253) *
                   fVar311;
              auVar96._12_4_ =
                   (fVar153 * auVar21._12_4_ + auVar201._12_4_ * fVar194 + auVar226._12_4_ * fVar260
                   ) * fVar217;
              auVar96._16_4_ =
                   (fVar266 * auVar21._16_4_ + auVar201._16_4_ * fVar207 + auVar226._16_4_ * fVar261
                   ) * fVar312;
              auVar96._20_4_ =
                   (fVar271 * auVar21._20_4_ + auVar201._20_4_ * fVar268 + auVar226._20_4_ * fVar262
                   ) * fVar252;
              auVar96._24_4_ =
                   (fVar176 * auVar21._24_4_ + auVar201._24_4_ * fVar164 + auVar226._24_4_ * fVar263
                   ) * fVar314;
              auVar96._28_4_ = auVar19._28_4_ + auVar20._28_4_ + auVar26._28_4_;
              auVar205 = ZEXT3264(auVar96);
              uVar8 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar230._4_4_ = uVar8;
              auVar230._0_4_ = uVar8;
              auVar230._8_4_ = uVar8;
              auVar230._12_4_ = uVar8;
              auVar230._16_4_ = uVar8;
              auVar230._20_4_ = uVar8;
              auVar230._24_4_ = uVar8;
              auVar230._28_4_ = uVar8;
              auVar18 = vcmpps_avx(local_100,auVar96,2);
              auVar21 = vcmpps_avx(auVar96,auVar230,2);
              auVar231 = ZEXT3264(auVar21);
              auVar18 = vandps_avx(auVar18,auVar21);
              auVar19 = auVar15 & auVar18;
              if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar19 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar19 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar19 >> 0x7f,0) == '\0') &&
                    (auVar19 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar19 >> 0xbf,0) == '\0') &&
                  (auVar19 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar19[0x1f]) goto LAB_00f6562c;
              auVar18 = vandps_avx(auVar15,auVar18);
              auVar19 = vcmpps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar173,4);
              auVar20 = auVar18 & auVar19;
              auVar174._8_8_ = uStack_5d8;
              auVar174._0_8_ = local_5e0;
              auVar174._16_8_ = uStack_5d0;
              auVar174._24_8_ = uStack_5c8;
              auVar323._4_4_ = fVar152;
              auVar323._0_4_ = fVar135;
              auVar323._8_4_ = fVar154;
              auVar323._12_4_ = fVar156;
              auVar323._16_4_ = fVar158;
              auVar323._20_4_ = fVar160;
              auVar323._24_4_ = fVar161;
              auVar323._28_4_ = fVar162;
              if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar20 >> 0x7f,0) != '\0') ||
                    (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar20 >> 0xbf,0) != '\0') ||
                  (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar20[0x1f] < '\0') {
                auVar174 = vandps_avx(auVar19,auVar18);
                auVar97._4_4_ = fVar213 * auVar306._4_4_;
                auVar97._0_4_ = fVar307 * auVar306._0_4_;
                auVar97._8_4_ = fVar311 * auVar306._8_4_;
                auVar97._12_4_ = fVar217 * auVar306._12_4_;
                auVar97._16_4_ = fVar312 * auVar306._16_4_;
                auVar97._20_4_ = fVar252 * auVar306._20_4_;
                auVar97._24_4_ = fVar314 * auVar306._24_4_;
                auVar97._28_4_ = auVar21._28_4_;
                auVar98._4_4_ = auVar148._4_4_ * fVar213;
                auVar98._0_4_ = auVar148._0_4_ * fVar307;
                auVar98._8_4_ = auVar148._8_4_ * fVar311;
                auVar98._12_4_ = auVar148._12_4_ * fVar217;
                auVar98._16_4_ = auVar148._16_4_ * fVar312;
                auVar98._20_4_ = auVar148._20_4_ * fVar252;
                auVar98._24_4_ = auVar148._24_4_ * fVar314;
                auVar98._28_4_ = auVar148._28_4_;
                auVar259._8_4_ = 0x3f800000;
                auVar259._0_8_ = &DAT_3f8000003f800000;
                auVar259._12_4_ = 0x3f800000;
                auVar259._16_4_ = 0x3f800000;
                auVar259._20_4_ = 0x3f800000;
                auVar259._24_4_ = 0x3f800000;
                auVar259._28_4_ = 0x3f800000;
                auVar18 = vsubps_avx(auVar259,auVar97);
                local_2e0 = vblendvps_avx(auVar18,auVar97,auVar318);
                auVar18 = vsubps_avx(auVar259,auVar98);
                auVar231 = ZEXT3264(auVar18);
                _local_540 = vblendvps_avx(auVar18,auVar98,auVar318);
                auVar151 = ZEXT3264(_local_540);
                local_300 = auVar96;
              }
            }
            auVar309 = ZEXT3264(auVar303);
            if ((((((((auVar174 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar174 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar174 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar174 >> 0x7f,0) != '\0') ||
                  (auVar174 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar174 >> 0xbf,0) != '\0') ||
                (auVar174 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar174[0x1f] < '\0') {
              auVar18 = vsubps_avx(auVar296,auVar323);
              auVar205 = ZEXT3264(local_2e0);
              fVar208 = auVar323._0_4_ + auVar18._0_4_ * local_2e0._0_4_;
              fVar310 = auVar323._4_4_ + auVar18._4_4_ * local_2e0._4_4_;
              fVar213 = auVar323._8_4_ + auVar18._8_4_ * local_2e0._8_4_;
              fVar311 = auVar323._12_4_ + auVar18._12_4_ * local_2e0._12_4_;
              fVar217 = auVar323._16_4_ + auVar18._16_4_ * local_2e0._16_4_;
              fVar312 = auVar323._20_4_ + auVar18._20_4_ * local_2e0._20_4_;
              fVar252 = auVar323._24_4_ + auVar18._24_4_ * local_2e0._24_4_;
              fVar313 = auVar323._28_4_ + auVar18._28_4_;
              fVar307 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
              auVar99._4_4_ = (fVar310 + fVar310) * fVar307;
              auVar99._0_4_ = (fVar208 + fVar208) * fVar307;
              auVar99._8_4_ = (fVar213 + fVar213) * fVar307;
              auVar99._12_4_ = (fVar311 + fVar311) * fVar307;
              auVar99._16_4_ = (fVar217 + fVar217) * fVar307;
              auVar99._20_4_ = (fVar312 + fVar312) * fVar307;
              auVar99._24_4_ = (fVar252 + fVar252) * fVar307;
              auVar99._28_4_ = fVar313 + fVar313;
              auVar231 = ZEXT3264(local_300);
              auVar18 = vcmpps_avx(local_300,auVar99,6);
              auVar151 = ZEXT3264(auVar18);
              auVar21 = auVar174 & auVar18;
              if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar21 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar21 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar21 >> 0x7f,0) != '\0') ||
                    (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar21 >> 0xbf,0) != '\0') ||
                  (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar21[0x1f] < '\0') {
                local_380 = vandps_avx(auVar18,auVar174);
                auVar151 = ZEXT3264(local_380);
                local_420 = (float)local_540._0_4_ + (float)local_540._0_4_ + -1.0;
                fStack_41c = (float)local_540._4_4_ + (float)local_540._4_4_ + -1.0;
                fStack_418 = (float)uStack_538 + (float)uStack_538 + -1.0;
                fStack_414 = uStack_538._4_4_ + uStack_538._4_4_ + -1.0;
                fStack_410 = (float)uStack_530 + (float)uStack_530 + -1.0;
                fStack_40c = uStack_530._4_4_ + uStack_530._4_4_ + -1.0;
                fStack_408 = (float)uStack_528 + (float)uStack_528 + -1.0;
                fStack_404 = uStack_528._4_4_ + uStack_528._4_4_ + -1.0;
                local_440 = local_2e0;
                local_400 = local_300;
                local_3c0 = local_7d0;
                uStack_3b8 = uStack_7c8;
                local_3b0 = local_7e0;
                uStack_3a8 = uStack_7d8;
                local_3a0 = local_600._0_8_;
                uStack_398 = local_600._8_8_;
                pGVar11 = (context->scene->geometries).items[uVar126].ptr;
                local_540._4_4_ = fStack_41c;
                local_540._0_4_ = local_420;
                uStack_538._0_4_ = fStack_418;
                uStack_538._4_4_ = fStack_414;
                uStack_530._0_4_ = fStack_410;
                uStack_530._4_4_ = fStack_40c;
                auVar121 = _local_540;
                uStack_528._0_4_ = fStack_408;
                uStack_528._4_4_ = fStack_404;
                auVar18 = _local_540;
                if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                  pRVar128 = (RTCIntersectArguments *)0x0;
                }
                else {
                  pRVar128 = context->args;
                  if ((pRVar128->filter != (RTCFilterFunctionN)0x0) ||
                     (pRVar128 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar128 >> 8),1),
                     pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar17 = vshufps_avx(ZEXT416((uint)(float)(int)local_3e0),
                                          ZEXT416((uint)(float)(int)local_3e0),0);
                    local_360[0] = (auVar17._0_4_ + local_2e0._0_4_ + 0.0) * (float)local_120._0_4_;
                    local_360[1] = (auVar17._4_4_ + local_2e0._4_4_ + 1.0) * (float)local_120._4_4_;
                    local_360[2] = (auVar17._8_4_ + local_2e0._8_4_ + 2.0) * fStack_118;
                    local_360[3] = (auVar17._12_4_ + local_2e0._12_4_ + 3.0) * fStack_114;
                    fStack_350 = (auVar17._0_4_ + local_2e0._16_4_ + 4.0) * fStack_110;
                    fStack_34c = (auVar17._4_4_ + local_2e0._20_4_ + 5.0) * fStack_10c;
                    fStack_348 = (auVar17._8_4_ + local_2e0._24_4_ + 6.0) * fStack_108;
                    fStack_344 = auVar17._12_4_ + (float)local_2e0._28_4_ + 7.0;
                    uStack_530 = auVar121._16_8_;
                    uStack_528 = auVar18._24_8_;
                    local_340 = local_540;
                    uStack_338 = uStack_538;
                    uStack_330 = uStack_530;
                    uStack_328 = uStack_528;
                    local_320 = local_300._0_8_;
                    uStack_318 = local_300._8_8_;
                    uStack_310 = local_300._16_8_;
                    uStack_308 = local_300._24_8_;
                    iVar127 = vmovmskps_avx(local_380);
                    local_800 = CONCAT44((int)((ulong)pRVar128 >> 0x20),iVar127);
                    lVar14 = 0;
                    if (local_800 != 0) {
                      for (; (local_800 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
                      }
                    }
                    local_8a0 = (uint)lVar14;
                    uStack_89c = (undefined4)((ulong)lVar14 >> 0x20);
                    bVar134 = iVar127 != 0;
                    _local_540 = auVar18;
                    if (bVar134) {
                      auVar17 = *local_680;
                      uVar100 = *local_688;
                      uVar101 = local_688[1];
                      local_3dc = uVar10;
                      local_3d0 = auVar16;
                      do {
                        uVar129 = *(uint *)(ray + k * 4 + 0x100);
                        lVar14 = CONCAT44(uStack_89c,local_8a0);
                        local_1e0 = local_360[lVar14];
                        local_1c0 = *(undefined4 *)((long)&local_340 + lVar14 * 4);
                        *(undefined4 *)(ray + k * 4 + 0x100) =
                             *(undefined4 *)((long)&local_320 + lVar14 * 4);
                        fVar208 = 1.0 - local_1e0;
                        fVar310 = local_1e0 * (fVar208 + fVar208) - fVar208 * fVar208;
                        auVar231 = ZEXT464((uint)fVar310);
                        fVar307 = local_1e0 * 3.0;
                        auVar188 = ZEXT416((uint)((fVar208 * -2.0 * local_1e0 +
                                                  local_1e0 * local_1e0) * 0.5));
                        auVar188 = vshufps_avx(auVar188,auVar188,0);
                        local_720._0_4_ = auVar283._0_4_;
                        local_720._4_4_ = auVar283._4_4_;
                        fStack_718 = auVar283._8_4_;
                        fStack_714 = auVar283._12_4_;
                        auVar186 = ZEXT416((uint)(((fVar208 + fVar208) * (fVar307 + 2.0) +
                                                  fVar208 * fVar208 * -3.0) * 0.5));
                        auVar186 = vshufps_avx(auVar186,auVar186,0);
                        auVar200 = ZEXT416((uint)(((local_1e0 + local_1e0) * (fVar307 + -5.0) +
                                                  local_1e0 * fVar307) * 0.5));
                        auVar200 = vshufps_avx(auVar200,auVar200,0);
                        local_670.context = context->user;
                        auVar137 = vshufps_avx(ZEXT416((uint)(fVar310 * 0.5)),
                                               ZEXT416((uint)(fVar310 * 0.5)),0);
                        auVar189._0_4_ =
                             auVar137._0_4_ * local_920 +
                             auVar200._0_4_ * (float)uVar6 +
                             auVar188._0_4_ * (float)local_720._0_4_ +
                             auVar186._0_4_ * (float)uVar124;
                        auVar189._4_4_ =
                             auVar137._4_4_ * fStack_91c +
                             auVar200._4_4_ * (float)uVar123 +
                             auVar188._4_4_ * (float)local_720._4_4_ +
                             auVar186._4_4_ * (float)uVar125;
                        auVar189._8_4_ =
                             auVar137._8_4_ * fStack_918 +
                             auVar200._8_4_ * fVar195 +
                             auVar188._8_4_ * fStack_718 + auVar186._8_4_ * fVar239;
                        auVar189._12_4_ =
                             auVar137._12_4_ * fStack_914 +
                             auVar200._12_4_ * fVar220 +
                             auVar188._12_4_ * fStack_714 + auVar186._12_4_ * fVar206;
                        local_230 = vshufps_avx(auVar189,auVar189,0);
                        local_240[0] = (RTCHitN)local_230[0];
                        local_240[1] = (RTCHitN)local_230[1];
                        local_240[2] = (RTCHitN)local_230[2];
                        local_240[3] = (RTCHitN)local_230[3];
                        local_240[4] = (RTCHitN)local_230[4];
                        local_240[5] = (RTCHitN)local_230[5];
                        local_240[6] = (RTCHitN)local_230[6];
                        local_240[7] = (RTCHitN)local_230[7];
                        local_240[8] = (RTCHitN)local_230[8];
                        local_240[9] = (RTCHitN)local_230[9];
                        local_240[10] = (RTCHitN)local_230[10];
                        local_240[0xb] = (RTCHitN)local_230[0xb];
                        local_240[0xc] = (RTCHitN)local_230[0xc];
                        local_240[0xd] = (RTCHitN)local_230[0xd];
                        local_240[0xe] = (RTCHitN)local_230[0xe];
                        local_240[0xf] = (RTCHitN)local_230[0xf];
                        local_210 = vshufps_avx(auVar189,auVar189,0x55);
                        auVar205 = ZEXT1664(local_210);
                        local_220 = local_210;
                        local_1f0 = vshufps_avx(auVar189,auVar189,0xaa);
                        local_200 = local_1f0;
                        fStack_1dc = local_1e0;
                        fStack_1d8 = local_1e0;
                        fStack_1d4 = local_1e0;
                        fStack_1d0 = local_1e0;
                        fStack_1cc = local_1e0;
                        fStack_1c8 = local_1e0;
                        fStack_1c4 = local_1e0;
                        uStack_1bc = local_1c0;
                        uStack_1b8 = local_1c0;
                        uStack_1b4 = local_1c0;
                        uStack_1b0 = local_1c0;
                        uStack_1ac = local_1c0;
                        uStack_1a8 = local_1c0;
                        uStack_1a4 = local_1c0;
                        local_1a0 = local_5a0._0_8_;
                        uStack_198 = local_5a0._8_8_;
                        uStack_190 = local_5a0._16_8_;
                        uStack_188 = local_5a0._24_8_;
                        local_180 = local_580._0_8_;
                        uStack_178 = local_580._8_8_;
                        uStack_170 = local_580._16_8_;
                        uStack_168 = local_580._24_8_;
                        auVar18 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                        local_678[1] = auVar18;
                        *local_678 = auVar18;
                        local_160 = (local_670.context)->instID[0];
                        uStack_15c = local_160;
                        uStack_158 = local_160;
                        uStack_154 = local_160;
                        uStack_150 = local_160;
                        uStack_14c = local_160;
                        uStack_148 = local_160;
                        uStack_144 = local_160;
                        local_140 = (local_670.context)->instPrimID[0];
                        uStack_13c = local_140;
                        uStack_138 = local_140;
                        uStack_134 = local_140;
                        uStack_130 = local_140;
                        uStack_12c = local_140;
                        uStack_128 = local_140;
                        uStack_124 = local_140;
                        local_740 = auVar17._0_8_;
                        uStack_738 = auVar17._8_8_;
                        local_6c0 = local_740;
                        uStack_6b8 = uStack_738;
                        local_670.valid = (int *)&local_6c0;
                        local_670.geometryUserPtr = pGVar11->userPtr;
                        local_670.hit = local_240;
                        local_670.N = 8;
                        uStack_6b0 = uVar100;
                        uStack_6a8 = uVar101;
                        local_670.ray = (RTCRayN *)ray;
                        if (pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar205 = ZEXT1664(local_210);
                          auVar231 = ZEXT464((uint)fVar310);
                          (*pGVar11->occlusionFilterN)(&local_670);
                        }
                        auVar107._8_8_ = uStack_6b8;
                        auVar107._0_8_ = local_6c0;
                        auVar188 = vpcmpeqd_avx(ZEXT816(0) << 0x40,auVar107);
                        auVar111._8_8_ = uStack_6a8;
                        auVar111._0_8_ = uStack_6b0;
                        auVar186 = vpcmpeqd_avx(ZEXT816(0) << 0x40,auVar111);
                        auVar149._16_16_ = auVar186;
                        auVar149._0_16_ = auVar188;
                        auVar21 = auVar18 & ~auVar149;
                        local_900._0_4_ = auVar18._0_4_;
                        local_900._4_4_ = auVar18._4_4_;
                        fStack_8f8 = auVar18._8_4_;
                        fStack_8f4 = auVar18._12_4_;
                        fStack_8f0 = auVar18._16_4_;
                        fStack_8ec = auVar18._20_4_;
                        fStack_8e8 = auVar18._24_4_;
                        fStack_8e4 = auVar18._28_4_;
                        if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 && (auVar21 >> 0x3f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                (auVar21 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && SUB321(auVar21 >> 0x7f,0) == '\0') &&
                              (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                             SUB321(auVar21 >> 0xbf,0) == '\0') &&
                            (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar21[0x1f]) {
                          auVar150._0_4_ = auVar188._0_4_ ^ local_900._0_4_;
                          auVar150._4_4_ = auVar188._4_4_ ^ local_900._4_4_;
                          auVar150._8_4_ = auVar188._8_4_ ^ (uint)fStack_8f8;
                          auVar150._12_4_ = auVar188._12_4_ ^ (uint)fStack_8f4;
                          auVar150._16_4_ = auVar186._0_4_ ^ (uint)fStack_8f0;
                          auVar150._20_4_ = auVar186._4_4_ ^ (uint)fStack_8ec;
                          auVar150._24_4_ = auVar186._8_4_ ^ (uint)fStack_8e8;
                          auVar150._28_4_ = auVar186._12_4_ ^ (uint)fStack_8e4;
                        }
                        else {
                          p_Var12 = context->args->filter;
                          if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar205 = ZEXT1664(auVar205._0_16_);
                            auVar231 = ZEXT1664(auVar231._0_16_);
                            (*p_Var12)(&local_670);
                          }
                          auVar108._8_8_ = uStack_6b8;
                          auVar108._0_8_ = local_6c0;
                          auVar188 = vpcmpeqd_avx((undefined1  [16])0x0,auVar108);
                          auVar112._8_8_ = uStack_6a8;
                          auVar112._0_8_ = uStack_6b0;
                          auVar186 = vpcmpeqd_avx((undefined1  [16])0x0,auVar112);
                          auVar175._16_16_ = auVar186;
                          auVar175._0_16_ = auVar188;
                          auVar150._0_4_ = auVar188._0_4_ ^ local_900._0_4_;
                          auVar150._4_4_ = auVar188._4_4_ ^ local_900._4_4_;
                          auVar150._8_4_ = auVar188._8_4_ ^ (uint)fStack_8f8;
                          auVar150._12_4_ = auVar188._12_4_ ^ (uint)fStack_8f4;
                          auVar150._16_4_ = auVar186._0_4_ ^ (uint)fStack_8f0;
                          auVar150._20_4_ = auVar186._4_4_ ^ (uint)fStack_8ec;
                          auVar150._24_4_ = auVar186._8_4_ ^ (uint)fStack_8e8;
                          auVar150._28_4_ = auVar186._12_4_ ^ (uint)fStack_8e4;
                          auVar193._8_4_ = 0xff800000;
                          auVar193._0_8_ = 0xff800000ff800000;
                          auVar193._12_4_ = 0xff800000;
                          auVar193._16_4_ = 0xff800000;
                          auVar193._20_4_ = 0xff800000;
                          auVar193._24_4_ = 0xff800000;
                          auVar193._28_4_ = 0xff800000;
                          auVar18 = vblendvps_avx(auVar193,*(undefined1 (*) [32])
                                                            (local_670.ray + 0x100),auVar175);
                          *(undefined1 (*) [32])(local_670.ray + 0x100) = auVar18;
                        }
                        auVar151 = ZEXT3264(auVar150);
                        if ((((((((auVar150 >> 0x1f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0 ||
                                 (auVar150 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (auVar150 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar150 >> 0x7f,0) != '\0')
                              || (auVar150 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                              ) || SUB321(auVar150 >> 0xbf,0) != '\0') ||
                            (auVar150 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar150[0x1f] < '\0') break;
                        auVar151 = ZEXT464(uVar129);
                        *(uint *)(ray + k * 4 + 0x100) = uVar129;
                        local_800 = local_800 ^ 1L << ((ulong)local_8a0 & 0x3f);
                        lVar14 = 0;
                        if (local_800 != 0) {
                          for (; (local_800 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
                          }
                        }
                        local_8a0 = (uint)lVar14;
                        uStack_89c = (undefined4)((ulong)lVar14 >> 0x20);
                        bVar134 = local_800 != 0;
                      } while (bVar134);
                    }
                    pRVar128 = (RTCIntersectArguments *)(ulong)bVar134;
                  }
                }
                auVar309 = ZEXT3264(auVar303);
                bVar131 = (bool)(bVar131 | (byte)pRVar128);
              }
            }
          }
          lVar132 = lVar132 + 8;
        } while ((int)lVar132 < (int)uVar10);
      }
      if (bVar131 != false) {
        return local_92d;
      }
      uVar6 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar139._4_4_ = uVar6;
      auVar139._0_4_ = uVar6;
      auVar139._8_4_ = uVar6;
      auVar139._12_4_ = uVar6;
      auVar16 = vcmpps_avx(local_450,auVar139,2);
      uVar126 = vmovmskps_avx(auVar16);
      uVar126 = (uint)uVar133 & uVar126;
      local_92d = uVar126 != 0;
    } while (local_92d);
  }
  return local_92d;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }